

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [32];
  undefined4 uVar11;
  undefined8 uVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  Primitive PVar33;
  uint uVar34;
  __int_type_conflict _Var35;
  RTCFilterFunctionN p_Var36;
  uint uVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [28];
  undefined1 auVar138 [28];
  undefined1 auVar139 [28];
  undefined1 auVar140 [28];
  undefined1 auVar141 [28];
  uint uVar142;
  uint uVar143;
  uint uVar144;
  ulong uVar145;
  uint uVar146;
  RayHit *pRVar147;
  long lVar148;
  long lVar149;
  Geometry *pGVar150;
  long lVar151;
  ulong uVar152;
  long lVar153;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar154;
  float fVar155;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar177;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  float fVar178;
  float fVar193;
  float fVar194;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar196;
  float fVar198;
  float fVar199;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar201;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar195;
  undefined1 auVar188 [32];
  float fVar197;
  float fVar200;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar202;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar216;
  float fVar217;
  undefined1 auVar212 [32];
  float fVar219;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar218;
  undefined1 auVar215 [32];
  float fVar220;
  float fVar238;
  undefined1 auVar222 [16];
  float fVar221;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar235;
  float fVar237;
  float fVar240;
  float fVar242;
  float fVar244;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar236;
  float fVar239;
  float fVar241;
  float fVar243;
  float fVar245;
  float fVar246;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  float fVar247;
  float fVar258;
  float fVar260;
  float fVar261;
  undefined1 auVar249 [16];
  float fVar248;
  float fVar259;
  undefined1 auVar251 [16];
  undefined1 auVar253 [16];
  undefined1 auVar252 [16];
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar265;
  float fVar266;
  undefined1 auVar257 [32];
  float fVar267;
  float fVar274;
  float fVar276;
  undefined1 auVar269 [16];
  float fVar278;
  undefined1 auVar270 [16];
  float fVar268;
  undefined1 auVar271 [16];
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar272 [32];
  float fVar275;
  float fVar277;
  undefined1 auVar273 [32];
  float fVar282;
  undefined1 auVar283 [16];
  float fVar291;
  float fVar292;
  float fVar293;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  float fVar290;
  float fVar294;
  float fVar295;
  undefined1 auVar289 [32];
  float fVar304;
  float fVar305;
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  float fVar315;
  float fVar316;
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  float fVar332;
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [64];
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  float fVar353;
  float fVar365;
  float fVar367;
  float in_register_0000151c;
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  float fVar366;
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  float fVar368;
  float fVar369;
  float fVar374;
  float fVar376;
  float fVar378;
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  float fVar375;
  float fVar377;
  float fVar379;
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  float fVar380;
  float fVar381;
  float fVar385;
  float fVar387;
  float fVar388;
  float in_register_0000159c;
  undefined1 auVar383 [32];
  float fVar386;
  undefined1 auVar384 [32];
  float fVar389;
  float fVar390;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  float in_register_000015dc;
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_7dc;
  RayHit *local_7d8;
  ulong local_7d0;
  ulong local_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  undefined8 uStack_798;
  Precalculations *local_788;
  RTCFilterFunctionNArguments local_780;
  undefined1 local_750 [8];
  undefined8 uStack_748;
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined1 local_730 [8];
  undefined8 uStack_728;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined8 local_690;
  undefined4 local_688;
  float local_684;
  undefined4 local_680;
  undefined4 local_67c;
  undefined4 local_678;
  uint local_674;
  uint local_670;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 auStack_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 auStack_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  Primitive *local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  uint local_260;
  uint local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined1 local_220 [16];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  undefined1 auVar250 [16];
  undefined1 auVar354 [16];
  undefined1 auVar382 [16];
  undefined1 auVar391 [16];
  
  local_788 = pre;
  PVar33 = prim[1];
  uVar145 = (ulong)(byte)PVar33;
  lVar151 = uVar145 * 0x25;
  fVar220 = *(float *)(prim + lVar151 + 0x12);
  auVar208 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar151 + 6));
  auVar269._0_4_ = fVar220 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar269._4_4_ = fVar220 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar269._8_4_ = fVar220 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar269._12_4_ = fVar220 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 4 + 6)));
  auVar179._0_4_ = fVar220 * auVar208._0_4_;
  auVar179._4_4_ = fVar220 * auVar208._4_4_;
  auVar179._8_4_ = fVar220 * auVar208._8_4_;
  auVar179._12_4_ = fVar220 * auVar208._12_4_;
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 4 + 10)));
  auVar164._16_16_ = auVar208;
  auVar164._0_16_ = auVar271;
  auVar164 = vcvtdq2ps_avx(auVar164);
  lVar153 = uVar145 * 5;
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar153 + 6)));
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar153 + 10)));
  auVar212._16_16_ = auVar208;
  auVar212._0_16_ = auVar271;
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 6 + 6)));
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 6 + 10)));
  auVar39 = vcvtdq2ps_avx(auVar212);
  auVar225._16_16_ = auVar208;
  auVar225._0_16_ = auVar271;
  auVar40 = vcvtdq2ps_avx(auVar225);
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 0xf + 6)));
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 0xf + 10)));
  auVar226._16_16_ = auVar208;
  auVar226._0_16_ = auVar271;
  auVar41 = vcvtdq2ps_avx(auVar226);
  lVar148 = (ulong)(byte)PVar33 * 0x10;
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar148 + 6)));
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar148 + 10)));
  auVar284._16_16_ = auVar208;
  auVar284._0_16_ = auVar271;
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar148 + uVar145 + 6)));
  auVar42 = vcvtdq2ps_avx(auVar284);
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar148 + uVar145 + 10)));
  auVar296._16_16_ = auVar208;
  auVar296._0_16_ = auVar271;
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 0x1a + 6)));
  auVar302 = vcvtdq2ps_avx(auVar296);
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 0x1a + 10)));
  auVar297._16_16_ = auVar208;
  auVar297._0_16_ = auVar271;
  auVar43 = vcvtdq2ps_avx(auVar297);
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 0x1b + 6)));
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 0x1b + 10)));
  auVar317._16_16_ = auVar208;
  auVar317._0_16_ = auVar271;
  auVar271 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 0x1c + 6)));
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 * 0x1c + 10)));
  auVar44 = vcvtdq2ps_avx(auVar317);
  auVar333._16_16_ = auVar208;
  auVar333._0_16_ = auVar271;
  auVar45 = vcvtdq2ps_avx(auVar333);
  auVar271 = vshufps_avx(auVar269,auVar269,0);
  auVar208 = vshufps_avx(auVar269,auVar269,0x55);
  auVar253 = vshufps_avx(auVar269,auVar269,0xaa);
  fVar220 = auVar253._0_4_;
  fVar282 = auVar253._4_4_;
  fVar235 = auVar253._8_4_;
  fVar366 = auVar253._12_4_;
  fVar219 = auVar208._0_4_;
  fVar304 = auVar208._4_4_;
  fVar238 = auVar208._8_4_;
  fVar305 = auVar208._12_4_;
  fVar240 = auVar271._0_4_;
  fVar242 = auVar271._4_4_;
  fVar244 = auVar271._8_4_;
  fVar247 = auVar271._12_4_;
  auVar355._0_4_ = fVar240 * auVar164._0_4_ + fVar219 * auVar39._0_4_ + fVar220 * auVar40._0_4_;
  auVar355._4_4_ = fVar242 * auVar164._4_4_ + fVar304 * auVar39._4_4_ + fVar282 * auVar40._4_4_;
  auVar355._8_4_ = fVar244 * auVar164._8_4_ + fVar238 * auVar39._8_4_ + fVar235 * auVar40._8_4_;
  auVar355._12_4_ = fVar247 * auVar164._12_4_ + fVar305 * auVar39._12_4_ + fVar366 * auVar40._12_4_;
  auVar355._16_4_ = fVar240 * auVar164._16_4_ + fVar219 * auVar39._16_4_ + fVar220 * auVar40._16_4_;
  auVar355._20_4_ = fVar242 * auVar164._20_4_ + fVar304 * auVar39._20_4_ + fVar282 * auVar40._20_4_;
  auVar355._24_4_ = fVar244 * auVar164._24_4_ + fVar238 * auVar39._24_4_ + fVar235 * auVar40._24_4_;
  auVar355._28_4_ = fVar305 + in_register_000015dc + in_register_0000151c;
  auVar341._0_4_ = fVar240 * auVar41._0_4_ + fVar219 * auVar42._0_4_ + auVar302._0_4_ * fVar220;
  auVar341._4_4_ = fVar242 * auVar41._4_4_ + fVar304 * auVar42._4_4_ + auVar302._4_4_ * fVar282;
  auVar341._8_4_ = fVar244 * auVar41._8_4_ + fVar238 * auVar42._8_4_ + auVar302._8_4_ * fVar235;
  auVar341._12_4_ = fVar247 * auVar41._12_4_ + fVar305 * auVar42._12_4_ + auVar302._12_4_ * fVar366;
  auVar341._16_4_ = fVar240 * auVar41._16_4_ + fVar219 * auVar42._16_4_ + auVar302._16_4_ * fVar220;
  auVar341._20_4_ = fVar242 * auVar41._20_4_ + fVar304 * auVar42._20_4_ + auVar302._20_4_ * fVar282;
  auVar341._24_4_ = fVar244 * auVar41._24_4_ + fVar238 * auVar42._24_4_ + auVar302._24_4_ * fVar235;
  auVar341._28_4_ = fVar305 + in_register_000015dc + in_register_0000159c;
  auVar272._0_4_ = fVar240 * auVar43._0_4_ + fVar219 * auVar44._0_4_ + auVar45._0_4_ * fVar220;
  auVar272._4_4_ = fVar242 * auVar43._4_4_ + fVar304 * auVar44._4_4_ + auVar45._4_4_ * fVar282;
  auVar272._8_4_ = fVar244 * auVar43._8_4_ + fVar238 * auVar44._8_4_ + auVar45._8_4_ * fVar235;
  auVar272._12_4_ = fVar247 * auVar43._12_4_ + fVar305 * auVar44._12_4_ + auVar45._12_4_ * fVar366;
  auVar272._16_4_ = fVar240 * auVar43._16_4_ + fVar219 * auVar44._16_4_ + auVar45._16_4_ * fVar220;
  auVar272._20_4_ = fVar242 * auVar43._20_4_ + fVar304 * auVar44._20_4_ + auVar45._20_4_ * fVar282;
  auVar272._24_4_ = fVar244 * auVar43._24_4_ + fVar238 * auVar44._24_4_ + auVar45._24_4_ * fVar235;
  auVar272._28_4_ = fVar247 + fVar305 + fVar366;
  auVar271 = vshufps_avx(auVar179,auVar179,0);
  auVar208 = vshufps_avx(auVar179,auVar179,0x55);
  auVar253 = vshufps_avx(auVar179,auVar179,0xaa);
  fVar220 = auVar253._0_4_;
  fVar282 = auVar253._4_4_;
  fVar235 = auVar253._8_4_;
  fVar366 = auVar253._12_4_;
  fVar242 = auVar208._0_4_;
  fVar244 = auVar208._4_4_;
  fVar247 = auVar208._8_4_;
  fVar258 = auVar208._12_4_;
  fVar219 = auVar39._28_4_ + auVar40._28_4_;
  fVar304 = auVar271._0_4_;
  fVar238 = auVar271._4_4_;
  fVar305 = auVar271._8_4_;
  fVar240 = auVar271._12_4_;
  auVar182._0_4_ = fVar304 * auVar164._0_4_ + fVar242 * auVar39._0_4_ + fVar220 * auVar40._0_4_;
  auVar182._4_4_ = fVar238 * auVar164._4_4_ + fVar244 * auVar39._4_4_ + fVar282 * auVar40._4_4_;
  auVar182._8_4_ = fVar305 * auVar164._8_4_ + fVar247 * auVar39._8_4_ + fVar235 * auVar40._8_4_;
  auVar182._12_4_ = fVar240 * auVar164._12_4_ + fVar258 * auVar39._12_4_ + fVar366 * auVar40._12_4_;
  auVar182._16_4_ = fVar304 * auVar164._16_4_ + fVar242 * auVar39._16_4_ + fVar220 * auVar40._16_4_;
  auVar182._20_4_ = fVar238 * auVar164._20_4_ + fVar244 * auVar39._20_4_ + fVar282 * auVar40._20_4_;
  auVar182._24_4_ = fVar305 * auVar164._24_4_ + fVar247 * auVar39._24_4_ + fVar235 * auVar40._24_4_;
  auVar182._28_4_ = auVar164._28_4_ + fVar219;
  auVar158._0_4_ = fVar304 * auVar41._0_4_ + auVar302._0_4_ * fVar220 + fVar242 * auVar42._0_4_;
  auVar158._4_4_ = fVar238 * auVar41._4_4_ + auVar302._4_4_ * fVar282 + fVar244 * auVar42._4_4_;
  auVar158._8_4_ = fVar305 * auVar41._8_4_ + auVar302._8_4_ * fVar235 + fVar247 * auVar42._8_4_;
  auVar158._12_4_ = fVar240 * auVar41._12_4_ + auVar302._12_4_ * fVar366 + fVar258 * auVar42._12_4_;
  auVar158._16_4_ = fVar304 * auVar41._16_4_ + auVar302._16_4_ * fVar220 + fVar242 * auVar42._16_4_;
  auVar158._20_4_ = fVar238 * auVar41._20_4_ + auVar302._20_4_ * fVar282 + fVar244 * auVar42._20_4_;
  auVar158._24_4_ = fVar305 * auVar41._24_4_ + auVar302._24_4_ * fVar235 + fVar247 * auVar42._24_4_;
  auVar158._28_4_ = auVar164._28_4_ + auVar302._28_4_ + auVar40._28_4_;
  auVar306._8_4_ = 0x7fffffff;
  auVar306._0_8_ = 0x7fffffff7fffffff;
  auVar306._12_4_ = 0x7fffffff;
  auVar306._16_4_ = 0x7fffffff;
  auVar306._20_4_ = 0x7fffffff;
  auVar306._24_4_ = 0x7fffffff;
  auVar306._28_4_ = 0x7fffffff;
  auVar227._8_4_ = 0x219392ef;
  auVar227._0_8_ = 0x219392ef219392ef;
  auVar227._12_4_ = 0x219392ef;
  auVar227._16_4_ = 0x219392ef;
  auVar227._20_4_ = 0x219392ef;
  auVar227._24_4_ = 0x219392ef;
  auVar227._28_4_ = 0x219392ef;
  auVar164 = vandps_avx(auVar355,auVar306);
  auVar164 = vcmpps_avx(auVar164,auVar227,1);
  auVar39 = vblendvps_avx(auVar355,auVar227,auVar164);
  auVar164 = vandps_avx(auVar341,auVar306);
  auVar164 = vcmpps_avx(auVar164,auVar227,1);
  auVar40 = vblendvps_avx(auVar341,auVar227,auVar164);
  auVar164 = vandps_avx(auVar306,auVar272);
  auVar164 = vcmpps_avx(auVar164,auVar227,1);
  auVar164 = vblendvps_avx(auVar272,auVar227,auVar164);
  auVar213._0_4_ = fVar304 * auVar43._0_4_ + fVar242 * auVar44._0_4_ + auVar45._0_4_ * fVar220;
  auVar213._4_4_ = fVar238 * auVar43._4_4_ + fVar244 * auVar44._4_4_ + auVar45._4_4_ * fVar282;
  auVar213._8_4_ = fVar305 * auVar43._8_4_ + fVar247 * auVar44._8_4_ + auVar45._8_4_ * fVar235;
  auVar213._12_4_ = fVar240 * auVar43._12_4_ + fVar258 * auVar44._12_4_ + auVar45._12_4_ * fVar366;
  auVar213._16_4_ = fVar304 * auVar43._16_4_ + fVar242 * auVar44._16_4_ + auVar45._16_4_ * fVar220;
  auVar213._20_4_ = fVar238 * auVar43._20_4_ + fVar244 * auVar44._20_4_ + auVar45._20_4_ * fVar282;
  auVar213._24_4_ = fVar305 * auVar43._24_4_ + fVar247 * auVar44._24_4_ + auVar45._24_4_ * fVar235;
  auVar213._28_4_ = fVar219 + auVar42._28_4_ + fVar366;
  auVar41 = vrcpps_avx(auVar39);
  fVar220 = auVar41._0_4_;
  fVar235 = auVar41._4_4_;
  auVar42._4_4_ = auVar39._4_4_ * fVar235;
  auVar42._0_4_ = auVar39._0_4_ * fVar220;
  fVar219 = auVar41._8_4_;
  auVar42._8_4_ = auVar39._8_4_ * fVar219;
  fVar238 = auVar41._12_4_;
  auVar42._12_4_ = auVar39._12_4_ * fVar238;
  fVar240 = auVar41._16_4_;
  auVar42._16_4_ = auVar39._16_4_ * fVar240;
  fVar242 = auVar41._20_4_;
  auVar42._20_4_ = auVar39._20_4_ * fVar242;
  fVar244 = auVar41._24_4_;
  auVar42._24_4_ = auVar39._24_4_ * fVar244;
  auVar42._28_4_ = auVar39._28_4_;
  auVar307._8_4_ = 0x3f800000;
  auVar307._0_8_ = 0x3f8000003f800000;
  auVar307._12_4_ = 0x3f800000;
  auVar307._16_4_ = 0x3f800000;
  auVar307._20_4_ = 0x3f800000;
  auVar307._24_4_ = 0x3f800000;
  auVar307._28_4_ = 0x3f800000;
  auVar302 = vsubps_avx(auVar307,auVar42);
  auVar42 = vrcpps_avx(auVar40);
  fVar220 = fVar220 + fVar220 * auVar302._0_4_;
  fVar235 = fVar235 + fVar235 * auVar302._4_4_;
  fVar219 = fVar219 + fVar219 * auVar302._8_4_;
  fVar238 = fVar238 + fVar238 * auVar302._12_4_;
  fVar240 = fVar240 + fVar240 * auVar302._16_4_;
  fVar242 = fVar242 + fVar242 * auVar302._20_4_;
  fVar244 = fVar244 + fVar244 * auVar302._24_4_;
  fVar247 = auVar42._0_4_;
  fVar258 = auVar42._4_4_;
  auVar39._4_4_ = fVar258 * auVar40._4_4_;
  auVar39._0_4_ = fVar247 * auVar40._0_4_;
  fVar260 = auVar42._8_4_;
  auVar39._8_4_ = fVar260 * auVar40._8_4_;
  fVar261 = auVar42._12_4_;
  auVar39._12_4_ = fVar261 * auVar40._12_4_;
  fVar262 = auVar42._16_4_;
  auVar39._16_4_ = fVar262 * auVar40._16_4_;
  fVar263 = auVar42._20_4_;
  auVar39._20_4_ = fVar263 * auVar40._20_4_;
  fVar264 = auVar42._24_4_;
  auVar39._24_4_ = fVar264 * auVar40._24_4_;
  auVar39._28_4_ = auVar302._28_4_;
  auVar40 = vsubps_avx(auVar307,auVar39);
  fVar247 = fVar247 + fVar247 * auVar40._0_4_;
  fVar258 = fVar258 + fVar258 * auVar40._4_4_;
  fVar260 = fVar260 + fVar260 * auVar40._8_4_;
  fVar261 = fVar261 + fVar261 * auVar40._12_4_;
  fVar262 = fVar262 + fVar262 * auVar40._16_4_;
  fVar263 = fVar263 + fVar263 * auVar40._20_4_;
  fVar264 = fVar264 + fVar264 * auVar40._24_4_;
  auVar39 = vrcpps_avx(auVar164);
  fVar267 = auVar39._0_4_;
  fVar274 = auVar39._4_4_;
  auVar43._4_4_ = fVar274 * auVar164._4_4_;
  auVar43._0_4_ = fVar267 * auVar164._0_4_;
  fVar276 = auVar39._8_4_;
  auVar43._8_4_ = fVar276 * auVar164._8_4_;
  fVar278 = auVar39._12_4_;
  auVar43._12_4_ = fVar278 * auVar164._12_4_;
  fVar279 = auVar39._16_4_;
  auVar43._16_4_ = fVar279 * auVar164._16_4_;
  fVar280 = auVar39._20_4_;
  auVar43._20_4_ = fVar280 * auVar164._20_4_;
  fVar281 = auVar39._24_4_;
  auVar43._24_4_ = fVar281 * auVar164._24_4_;
  auVar43._28_4_ = auVar164._28_4_;
  auVar164 = vsubps_avx(auVar307,auVar43);
  fVar267 = fVar267 + fVar267 * auVar164._0_4_;
  fVar274 = fVar274 + fVar274 * auVar164._4_4_;
  fVar276 = fVar276 + fVar276 * auVar164._8_4_;
  fVar278 = fVar278 + fVar278 * auVar164._12_4_;
  fVar279 = fVar279 + fVar279 * auVar164._16_4_;
  fVar280 = fVar280 + fVar280 * auVar164._20_4_;
  fVar281 = fVar281 + fVar281 * auVar164._24_4_;
  auVar271 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar151 + 0x16)) * *(float *)(prim + lVar151 + 0x1a)))
  ;
  auVar46 = vshufps_avx(auVar271,auVar271,0);
  auVar271._8_8_ = 0;
  auVar271._0_8_ = *(ulong *)(prim + uVar145 * 7 + 6);
  auVar271 = vpmovsxwd_avx(auVar271);
  auVar208._8_8_ = 0;
  auVar208._0_8_ = *(ulong *)(prim + uVar145 * 7 + 0xe);
  auVar208 = vpmovsxwd_avx(auVar208);
  auVar298._16_16_ = auVar208;
  auVar298._0_16_ = auVar271;
  auVar164 = vcvtdq2ps_avx(auVar298);
  auVar253._8_8_ = 0;
  auVar253._0_8_ = *(ulong *)(prim + uVar145 * 0xb + 6);
  auVar271 = vpmovsxwd_avx(auVar253);
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar145 * 0xb + 0xe);
  auVar208 = vpmovsxwd_avx(auVar223);
  auVar308._16_16_ = auVar208;
  auVar308._0_16_ = auVar271;
  auVar39 = vcvtdq2ps_avx(auVar308);
  auVar39 = vsubps_avx(auVar39,auVar164);
  fVar282 = auVar46._0_4_;
  fVar366 = auVar46._4_4_;
  fVar304 = auVar46._8_4_;
  fVar305 = auVar46._12_4_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar145 * 9 + 6);
  auVar271 = vpmovsxwd_avx(auVar46);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar145 * 9 + 0xe);
  auVar208 = vpmovsxwd_avx(auVar14);
  auVar299._0_4_ = auVar39._0_4_ * fVar282 + auVar164._0_4_;
  auVar299._4_4_ = auVar39._4_4_ * fVar366 + auVar164._4_4_;
  auVar299._8_4_ = auVar39._8_4_ * fVar304 + auVar164._8_4_;
  auVar299._12_4_ = auVar39._12_4_ * fVar305 + auVar164._12_4_;
  auVar299._16_4_ = auVar39._16_4_ * fVar282 + auVar164._16_4_;
  auVar299._20_4_ = auVar39._20_4_ * fVar366 + auVar164._20_4_;
  auVar299._24_4_ = auVar39._24_4_ * fVar304 + auVar164._24_4_;
  auVar299._28_4_ = auVar39._28_4_ + auVar164._28_4_;
  auVar309._16_16_ = auVar208;
  auVar309._0_16_ = auVar271;
  auVar164 = vcvtdq2ps_avx(auVar309);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar145 * 0xd + 6);
  auVar271 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar145 * 0xd + 0xe);
  auVar208 = vpmovsxwd_avx(auVar16);
  auVar318._16_16_ = auVar208;
  auVar318._0_16_ = auVar271;
  auVar39 = vcvtdq2ps_avx(auVar318);
  auVar39 = vsubps_avx(auVar39,auVar164);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar145 * 0x12 + 6);
  auVar271 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar145 * 0x12 + 0xe);
  auVar208 = vpmovsxwd_avx(auVar18);
  auVar310._0_4_ = auVar164._0_4_ + auVar39._0_4_ * fVar282;
  auVar310._4_4_ = auVar164._4_4_ + auVar39._4_4_ * fVar366;
  auVar310._8_4_ = auVar164._8_4_ + auVar39._8_4_ * fVar304;
  auVar310._12_4_ = auVar164._12_4_ + auVar39._12_4_ * fVar305;
  auVar310._16_4_ = auVar164._16_4_ + auVar39._16_4_ * fVar282;
  auVar310._20_4_ = auVar164._20_4_ + auVar39._20_4_ * fVar366;
  auVar310._24_4_ = auVar164._24_4_ + auVar39._24_4_ * fVar304;
  auVar310._28_4_ = auVar164._28_4_ + auVar39._28_4_;
  auVar319._16_16_ = auVar208;
  auVar319._0_16_ = auVar271;
  auVar164 = vcvtdq2ps_avx(auVar319);
  uVar152 = (ulong)(uint)((int)lVar153 << 2);
  lVar151 = uVar145 * 2 + uVar152;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar151 + 6);
  auVar271 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar151 + 0xe);
  auVar208 = vpmovsxwd_avx(auVar20);
  auVar334._16_16_ = auVar208;
  auVar334._0_16_ = auVar271;
  auVar39 = vcvtdq2ps_avx(auVar334);
  auVar39 = vsubps_avx(auVar39,auVar164);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar152 + 6);
  auVar271 = vpmovsxwd_avx(auVar21);
  auVar320._0_4_ = auVar164._0_4_ + auVar39._0_4_ * fVar282;
  auVar320._4_4_ = auVar164._4_4_ + auVar39._4_4_ * fVar366;
  auVar320._8_4_ = auVar164._8_4_ + auVar39._8_4_ * fVar304;
  auVar320._12_4_ = auVar164._12_4_ + auVar39._12_4_ * fVar305;
  auVar320._16_4_ = auVar164._16_4_ + auVar39._16_4_ * fVar282;
  auVar320._20_4_ = auVar164._20_4_ + auVar39._20_4_ * fVar366;
  auVar320._24_4_ = auVar164._24_4_ + auVar39._24_4_ * fVar304;
  auVar320._28_4_ = auVar164._28_4_ + auVar39._28_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar152 + 0xe);
  auVar208 = vpmovsxwd_avx(auVar22);
  auVar335._16_16_ = auVar208;
  auVar335._0_16_ = auVar271;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar145 * 0x18 + 6);
  auVar271 = vpmovsxwd_avx(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar145 * 0x18 + 0xe);
  auVar208 = vpmovsxwd_avx(auVar24);
  auVar164 = vcvtdq2ps_avx(auVar335);
  auVar342._16_16_ = auVar208;
  auVar342._0_16_ = auVar271;
  auVar39 = vcvtdq2ps_avx(auVar342);
  auVar39 = vsubps_avx(auVar39,auVar164);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar145 * 0x1d + 6);
  auVar271 = vpmovsxwd_avx(auVar25);
  auVar336._0_4_ = auVar164._0_4_ + auVar39._0_4_ * fVar282;
  auVar336._4_4_ = auVar164._4_4_ + auVar39._4_4_ * fVar366;
  auVar336._8_4_ = auVar164._8_4_ + auVar39._8_4_ * fVar304;
  auVar336._12_4_ = auVar164._12_4_ + auVar39._12_4_ * fVar305;
  auVar336._16_4_ = auVar164._16_4_ + auVar39._16_4_ * fVar282;
  auVar336._20_4_ = auVar164._20_4_ + auVar39._20_4_ * fVar366;
  auVar336._24_4_ = auVar164._24_4_ + auVar39._24_4_ * fVar304;
  auVar336._28_4_ = auVar164._28_4_ + auVar39._28_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar145 * 0x1d + 0xe);
  auVar208 = vpmovsxwd_avx(auVar26);
  auVar343._16_16_ = auVar208;
  auVar343._0_16_ = auVar271;
  auVar164 = vcvtdq2ps_avx(auVar343);
  lVar151 = uVar145 + (ulong)(byte)PVar33 * 0x20;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar151 + 6);
  auVar271 = vpmovsxwd_avx(auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + lVar151 + 0xe);
  auVar208 = vpmovsxwd_avx(auVar28);
  auVar356._16_16_ = auVar208;
  auVar356._0_16_ = auVar271;
  auVar39 = vcvtdq2ps_avx(auVar356);
  auVar39 = vsubps_avx(auVar39,auVar164);
  auVar344._0_4_ = auVar164._0_4_ + auVar39._0_4_ * fVar282;
  auVar344._4_4_ = auVar164._4_4_ + auVar39._4_4_ * fVar366;
  auVar344._8_4_ = auVar164._8_4_ + auVar39._8_4_ * fVar304;
  auVar344._12_4_ = auVar164._12_4_ + auVar39._12_4_ * fVar305;
  auVar344._16_4_ = auVar164._16_4_ + auVar39._16_4_ * fVar282;
  auVar344._20_4_ = auVar164._20_4_ + auVar39._20_4_ * fVar366;
  auVar344._24_4_ = auVar164._24_4_ + auVar39._24_4_ * fVar304;
  auVar344._28_4_ = auVar164._28_4_ + auVar39._28_4_;
  lVar151 = (ulong)(byte)PVar33 * 0x20 - uVar145;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + lVar151 + 6);
  auVar271 = vpmovsxwd_avx(auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + lVar151 + 0xe);
  auVar208 = vpmovsxwd_avx(auVar30);
  auVar357._16_16_ = auVar208;
  auVar357._0_16_ = auVar271;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar145 * 0x23 + 6);
  auVar271 = vpmovsxwd_avx(auVar31);
  local_488 = prim;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar145 * 0x23 + 0xe);
  auVar208 = vpmovsxwd_avx(auVar32);
  auVar370._16_16_ = auVar208;
  auVar370._0_16_ = auVar271;
  auVar164 = vcvtdq2ps_avx(auVar357);
  auVar39 = vcvtdq2ps_avx(auVar370);
  auVar39 = vsubps_avx(auVar39,auVar164);
  auVar358._0_4_ = auVar164._0_4_ + auVar39._0_4_ * fVar282;
  auVar358._4_4_ = auVar164._4_4_ + auVar39._4_4_ * fVar366;
  auVar358._8_4_ = auVar164._8_4_ + auVar39._8_4_ * fVar304;
  auVar358._12_4_ = auVar164._12_4_ + auVar39._12_4_ * fVar305;
  auVar358._16_4_ = auVar164._16_4_ + auVar39._16_4_ * fVar282;
  auVar358._20_4_ = auVar164._20_4_ + auVar39._20_4_ * fVar366;
  auVar358._24_4_ = auVar164._24_4_ + auVar39._24_4_ * fVar304;
  auVar358._28_4_ = auVar164._28_4_ + fVar305;
  auVar164 = vsubps_avx(auVar299,auVar182);
  auVar283._0_4_ = fVar220 * auVar164._0_4_;
  auVar283._4_4_ = fVar235 * auVar164._4_4_;
  auVar283._8_4_ = fVar219 * auVar164._8_4_;
  auVar283._12_4_ = fVar238 * auVar164._12_4_;
  auVar44._16_4_ = fVar240 * auVar164._16_4_;
  auVar44._0_16_ = auVar283;
  auVar44._20_4_ = fVar242 * auVar164._20_4_;
  auVar44._24_4_ = fVar244 * auVar164._24_4_;
  auVar44._28_4_ = auVar164._28_4_;
  auVar164 = vsubps_avx(auVar310,auVar182);
  auVar222._0_4_ = fVar220 * auVar164._0_4_;
  auVar222._4_4_ = fVar235 * auVar164._4_4_;
  auVar222._8_4_ = fVar219 * auVar164._8_4_;
  auVar222._12_4_ = fVar238 * auVar164._12_4_;
  auVar45._16_4_ = fVar240 * auVar164._16_4_;
  auVar45._0_16_ = auVar222;
  auVar45._20_4_ = fVar242 * auVar164._20_4_;
  auVar45._24_4_ = fVar244 * auVar164._24_4_;
  auVar45._28_4_ = auVar41._28_4_ + auVar302._28_4_;
  auVar164 = vsubps_avx(auVar320,auVar158);
  auVar180._0_4_ = fVar247 * auVar164._0_4_;
  auVar180._4_4_ = fVar258 * auVar164._4_4_;
  auVar180._8_4_ = fVar260 * auVar164._8_4_;
  auVar180._12_4_ = fVar261 * auVar164._12_4_;
  auVar41._16_4_ = fVar262 * auVar164._16_4_;
  auVar41._0_16_ = auVar180;
  auVar41._20_4_ = fVar263 * auVar164._20_4_;
  auVar41._24_4_ = fVar264 * auVar164._24_4_;
  auVar41._28_4_ = auVar164._28_4_;
  auVar164 = vsubps_avx(auVar336,auVar158);
  auVar249._0_4_ = fVar247 * auVar164._0_4_;
  auVar249._4_4_ = fVar258 * auVar164._4_4_;
  auVar249._8_4_ = fVar260 * auVar164._8_4_;
  auVar249._12_4_ = fVar261 * auVar164._12_4_;
  auVar302._16_4_ = fVar262 * auVar164._16_4_;
  auVar302._0_16_ = auVar249;
  auVar302._20_4_ = fVar263 * auVar164._20_4_;
  auVar302._24_4_ = fVar264 * auVar164._24_4_;
  auVar302._28_4_ = auVar42._28_4_ + auVar40._28_4_;
  auVar164 = vsubps_avx(auVar344,auVar213);
  auVar156._0_4_ = fVar267 * auVar164._0_4_;
  auVar156._4_4_ = fVar274 * auVar164._4_4_;
  auVar156._8_4_ = fVar276 * auVar164._8_4_;
  auVar156._12_4_ = fVar278 * auVar164._12_4_;
  auVar40._16_4_ = fVar279 * auVar164._16_4_;
  auVar40._0_16_ = auVar156;
  auVar40._20_4_ = fVar280 * auVar164._20_4_;
  auVar40._24_4_ = fVar281 * auVar164._24_4_;
  auVar40._28_4_ = auVar164._28_4_;
  auVar164 = vsubps_avx(auVar358,auVar213);
  auVar203._0_4_ = fVar267 * auVar164._0_4_;
  auVar203._4_4_ = fVar274 * auVar164._4_4_;
  auVar203._8_4_ = fVar276 * auVar164._8_4_;
  auVar203._12_4_ = fVar278 * auVar164._12_4_;
  auVar47._16_4_ = fVar279 * auVar164._16_4_;
  auVar47._0_16_ = auVar203;
  auVar47._20_4_ = fVar280 * auVar164._20_4_;
  auVar47._24_4_ = fVar281 * auVar164._24_4_;
  auVar47._28_4_ = auVar164._28_4_;
  auVar271 = vpminsd_avx(auVar44._16_16_,auVar45._16_16_);
  auVar208 = vpminsd_avx(auVar283,auVar222);
  auVar311._16_16_ = auVar271;
  auVar311._0_16_ = auVar208;
  auVar271 = vpminsd_avx(auVar41._16_16_,auVar302._16_16_);
  auVar208 = vpminsd_avx(auVar180,auVar249);
  auVar345._16_16_ = auVar271;
  auVar345._0_16_ = auVar208;
  auVar164 = vmaxps_avx(auVar311,auVar345);
  auVar271 = vpminsd_avx(auVar40._16_16_,auVar47._16_16_);
  auVar208 = vpminsd_avx(auVar156,auVar203);
  auVar371._16_16_ = auVar271;
  auVar371._0_16_ = auVar208;
  uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar383._4_4_ = uVar11;
  auVar383._0_4_ = uVar11;
  auVar383._8_4_ = uVar11;
  auVar383._12_4_ = uVar11;
  auVar383._16_4_ = uVar11;
  auVar383._20_4_ = uVar11;
  auVar383._24_4_ = uVar11;
  auVar383._28_4_ = uVar11;
  auVar39 = vmaxps_avx(auVar371,auVar383);
  auVar164 = vmaxps_avx(auVar164,auVar39);
  local_80._4_4_ = auVar164._4_4_ * 0.99999964;
  local_80._0_4_ = auVar164._0_4_ * 0.99999964;
  local_80._8_4_ = auVar164._8_4_ * 0.99999964;
  local_80._12_4_ = auVar164._12_4_ * 0.99999964;
  local_80._16_4_ = auVar164._16_4_ * 0.99999964;
  local_80._20_4_ = auVar164._20_4_ * 0.99999964;
  local_80._24_4_ = auVar164._24_4_ * 0.99999964;
  local_80._28_4_ = auVar164._28_4_;
  auVar271 = vpmaxsd_avx(auVar44._16_16_,auVar45._16_16_);
  auVar208 = vpmaxsd_avx(auVar283,auVar222);
  auVar228._16_16_ = auVar271;
  auVar228._0_16_ = auVar208;
  auVar271 = vpmaxsd_avx(auVar41._16_16_,auVar302._16_16_);
  auVar208 = vpmaxsd_avx(auVar180,auVar249);
  auVar183._16_16_ = auVar271;
  auVar183._0_16_ = auVar208;
  auVar164 = vminps_avx(auVar228,auVar183);
  auVar271 = vpmaxsd_avx(auVar40._16_16_,auVar47._16_16_);
  auVar208 = vpmaxsd_avx(auVar156,auVar203);
  fVar220 = (ray->super_RayK<1>).tfar;
  auVar214._4_4_ = fVar220;
  auVar214._0_4_ = fVar220;
  auVar214._8_4_ = fVar220;
  auVar214._12_4_ = fVar220;
  auVar214._16_4_ = fVar220;
  auVar214._20_4_ = fVar220;
  auVar214._24_4_ = fVar220;
  auVar214._28_4_ = fVar220;
  auVar159._16_16_ = auVar271;
  auVar159._0_16_ = auVar208;
  auVar39 = vminps_avx(auVar159,auVar214);
  auVar164 = vminps_avx(auVar164,auVar39);
  auVar38._4_4_ = auVar164._4_4_ * 1.0000004;
  auVar38._0_4_ = auVar164._0_4_ * 1.0000004;
  auVar38._8_4_ = auVar164._8_4_ * 1.0000004;
  auVar38._12_4_ = auVar164._12_4_ * 1.0000004;
  auVar38._16_4_ = auVar164._16_4_ * 1.0000004;
  auVar38._20_4_ = auVar164._20_4_ * 1.0000004;
  auVar38._24_4_ = auVar164._24_4_ * 1.0000004;
  auVar38._28_4_ = auVar164._28_4_;
  auVar164 = vcmpps_avx(local_80,auVar38,2);
  auVar271 = vpshufd_avx(ZEXT116((byte)PVar33),0);
  auVar184._16_16_ = auVar271;
  auVar184._0_16_ = auVar271;
  auVar39 = vcvtdq2ps_avx(auVar184);
  auVar39 = vcmpps_avx(_DAT_01faff40,auVar39,1);
  auVar164 = vandps_avx(auVar164,auVar39);
  uVar142 = vmovmskps_avx(auVar164);
  if (uVar142 != 0) {
    uVar142 = uVar142 & 0xff;
    local_480 = mm_lookupmask_ps._16_8_;
    uStack_478 = mm_lookupmask_ps._24_8_;
    uStack_470 = mm_lookupmask_ps._16_8_;
    uStack_468 = mm_lookupmask_ps._24_8_;
    local_7d8 = ray;
    do {
      lVar151 = 0;
      if (uVar142 != 0) {
        for (; (uVar142 >> lVar151 & 1) == 0; lVar151 = lVar151 + 1) {
        }
      }
      uVar146 = *(uint *)(local_488 + 2);
      uVar144 = *(uint *)(local_488 + lVar151 * 4 + 6);
      local_7d0 = (ulong)uVar146;
      pGVar150 = (context->scene->geometries).items[uVar146].ptr;
      local_7c8 = (ulong)uVar144;
      uVar145 = (ulong)*(uint *)(*(long *)&pGVar150->field_0x58 +
                                (ulong)uVar144 *
                                pGVar150[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar220 = (pGVar150->time_range).lower;
      fVar220 = pGVar150->fnumTimeSegments *
                (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar220) /
                ((pGVar150->time_range).upper - fVar220));
      auVar271 = vroundss_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar220),9);
      auVar271 = vminss_avx(auVar271,ZEXT416((uint)(pGVar150->fnumTimeSegments + -1.0)));
      auVar271 = vmaxss_avx(ZEXT816(0) << 0x20,auVar271);
      fVar220 = fVar220 - auVar271._0_4_;
      _Var35 = pGVar150[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar149 = (long)(int)auVar271._0_4_ * 0x38;
      lVar151 = *(long *)(_Var35 + 0x10 + lVar149);
      lVar153 = *(long *)(_Var35 + 0x38 + lVar149);
      lVar148 = *(long *)(_Var35 + 0x48 + lVar149);
      auVar271 = vshufps_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar220),0);
      pfVar1 = (float *)(lVar153 + uVar145 * lVar148);
      fVar282 = auVar271._0_4_;
      fVar235 = auVar271._4_4_;
      fVar366 = auVar271._8_4_;
      fVar219 = auVar271._12_4_;
      pfVar2 = (float *)(lVar153 + (uVar145 + 1) * lVar148);
      pfVar3 = (float *)(lVar153 + (uVar145 + 2) * lVar148);
      pfVar4 = (float *)(lVar153 + lVar148 * (uVar145 + 3));
      lVar153 = *(long *)(_Var35 + lVar149);
      auVar271 = vshufps_avx(ZEXT416((uint)(1.0 - fVar220)),ZEXT416((uint)(1.0 - fVar220)),0);
      pfVar5 = (float *)(lVar153 + lVar151 * uVar145);
      fVar220 = auVar271._0_4_;
      fVar304 = auVar271._4_4_;
      fVar238 = auVar271._8_4_;
      fVar305 = auVar271._12_4_;
      pfVar6 = (float *)(lVar153 + lVar151 * (uVar145 + 1));
      pfVar7 = (float *)(lVar153 + lVar151 * (uVar145 + 2));
      pfVar8 = (float *)(lVar153 + lVar151 * (uVar145 + 3));
      uVar34 = (uint)pGVar150[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar151 = (long)(int)uVar34 * 0x44;
      fVar248 = fVar282 * *pfVar1 + fVar220 * *pfVar5;
      fVar259 = fVar235 * pfVar1[1] + fVar304 * pfVar5[1];
      auVar250._0_8_ = CONCAT44(fVar259,fVar248);
      auVar250._8_4_ = fVar366 * pfVar1[2] + fVar238 * pfVar5[2];
      auVar250._12_4_ = fVar219 * pfVar1[3] + fVar305 * pfVar5[3];
      fVar353 = fVar220 * *pfVar6 + fVar282 * *pfVar2;
      fVar365 = fVar304 * pfVar6[1] + fVar235 * pfVar2[1];
      auVar354._0_8_ = CONCAT44(fVar365,fVar353);
      auVar354._8_4_ = fVar238 * pfVar6[2] + fVar366 * pfVar2[2];
      auVar354._12_4_ = fVar305 * pfVar6[3] + fVar219 * pfVar2[3];
      fVar380 = fVar220 * *pfVar7 + fVar282 * *pfVar3;
      fVar385 = fVar304 * pfVar7[1] + fVar235 * pfVar3[1];
      auVar382._0_8_ = CONCAT44(fVar385,fVar380);
      auVar382._8_4_ = fVar238 * pfVar7[2] + fVar366 * pfVar3[2];
      auVar382._12_4_ = fVar305 * pfVar7[3] + fVar219 * pfVar3[3];
      fVar389 = fVar220 * *pfVar8 + fVar282 * *pfVar4;
      fVar394 = fVar304 * pfVar8[1] + fVar235 * pfVar4[1];
      auVar391._0_8_ = CONCAT44(fVar394,fVar389);
      auVar391._8_4_ = fVar238 * pfVar8[2] + fVar366 * pfVar4[2];
      auVar391._12_4_ = fVar305 * pfVar8[3] + fVar219 * pfVar4[3];
      aVar13 = (local_7d8->super_RayK<1>).org.field_0;
      auVar253 = vsubps_avx(auVar250,(undefined1  [16])aVar13);
      _local_7a0 = auVar250;
      auVar271 = vshufps_avx(auVar253,auVar253,0);
      auVar208 = vshufps_avx(auVar253,auVar253,0x55);
      auVar253 = vshufps_avx(auVar253,auVar253,0xaa);
      fVar220 = (local_788->ray_space).vx.field_0.m128[0];
      fVar282 = (local_788->ray_space).vx.field_0.m128[1];
      fVar235 = (local_788->ray_space).vx.field_0.m128[2];
      fVar366 = (local_788->ray_space).vx.field_0.m128[3];
      fVar219 = (local_788->ray_space).vy.field_0.m128[0];
      fVar304 = (local_788->ray_space).vy.field_0.m128[1];
      fVar238 = (local_788->ray_space).vy.field_0.m128[2];
      fVar305 = (local_788->ray_space).vy.field_0.m128[3];
      fVar240 = (local_788->ray_space).vz.field_0.m128[0];
      fVar242 = (local_788->ray_space).vz.field_0.m128[1];
      fVar244 = (local_788->ray_space).vz.field_0.m128[2];
      fVar247 = (local_788->ray_space).vz.field_0.m128[3];
      auVar204._0_4_ =
           auVar271._0_4_ * fVar220 + auVar253._0_4_ * fVar240 + auVar208._0_4_ * fVar219;
      auVar204._4_4_ =
           auVar271._4_4_ * fVar282 + auVar253._4_4_ * fVar242 + auVar208._4_4_ * fVar304;
      auVar204._8_4_ =
           auVar271._8_4_ * fVar235 + auVar253._8_4_ * fVar244 + auVar208._8_4_ * fVar238;
      auVar204._12_4_ =
           auVar271._12_4_ * fVar366 + auVar253._12_4_ * fVar247 + auVar208._12_4_ * fVar305;
      auVar271 = vblendps_avx(auVar204,auVar250,8);
      auVar223 = vsubps_avx(auVar354,(undefined1  [16])aVar13);
      auVar208 = vshufps_avx(auVar223,auVar223,0);
      auVar253 = vshufps_avx(auVar223,auVar223,0x55);
      auVar223 = vshufps_avx(auVar223,auVar223,0xaa);
      auVar270._0_4_ =
           auVar208._0_4_ * fVar220 + auVar223._0_4_ * fVar240 + auVar253._0_4_ * fVar219;
      auVar270._4_4_ =
           auVar208._4_4_ * fVar282 + auVar223._4_4_ * fVar242 + auVar253._4_4_ * fVar304;
      auVar270._8_4_ =
           auVar208._8_4_ * fVar235 + auVar223._8_4_ * fVar244 + auVar253._8_4_ * fVar238;
      auVar270._12_4_ =
           auVar208._12_4_ * fVar366 + auVar223._12_4_ * fVar247 + auVar253._12_4_ * fVar305;
      auVar208 = vblendps_avx(auVar270,auVar354,8);
      auVar46 = vsubps_avx(auVar382,(undefined1  [16])aVar13);
      auVar253 = vshufps_avx(auVar46,auVar46,0);
      auVar223 = vshufps_avx(auVar46,auVar46,0x55);
      auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
      auVar251._0_4_ = auVar253._0_4_ * fVar220 + auVar223._0_4_ * fVar219 + auVar46._0_4_ * fVar240
      ;
      auVar251._4_4_ = auVar253._4_4_ * fVar282 + auVar223._4_4_ * fVar304 + auVar46._4_4_ * fVar242
      ;
      auVar251._8_4_ = auVar253._8_4_ * fVar235 + auVar223._8_4_ * fVar238 + auVar46._8_4_ * fVar244
      ;
      auVar251._12_4_ =
           auVar253._12_4_ * fVar366 + auVar223._12_4_ * fVar305 + auVar46._12_4_ * fVar247;
      auVar253 = vblendps_avx(auVar251,auVar382,8);
      local_3a0._0_16_ = (undefined1  [16])aVar13;
      auVar14 = vsubps_avx(auVar391,(undefined1  [16])aVar13);
      auVar223 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar46 = vshufps_avx(auVar14,auVar14,0);
      auVar14 = vshufps_avx(auVar14,auVar14,0x55);
      auVar181._0_4_ = auVar46._0_4_ * fVar220 + auVar223._0_4_ * fVar240 + auVar14._0_4_ * fVar219;
      auVar181._4_4_ = auVar46._4_4_ * fVar282 + auVar223._4_4_ * fVar242 + auVar14._4_4_ * fVar304;
      auVar181._8_4_ = auVar46._8_4_ * fVar235 + auVar223._8_4_ * fVar244 + auVar14._8_4_ * fVar238;
      auVar181._12_4_ =
           auVar46._12_4_ * fVar366 + auVar223._12_4_ * fVar247 + auVar14._12_4_ * fVar305;
      auVar223 = vblendps_avx(auVar181,auVar391,8);
      auVar252._8_4_ = 0x7fffffff;
      auVar252._0_8_ = 0x7fffffff7fffffff;
      auVar252._12_4_ = 0x7fffffff;
      auVar271 = vandps_avx(auVar271,auVar252);
      auVar208 = vandps_avx(auVar208,auVar252);
      auVar46 = vmaxps_avx(auVar271,auVar208);
      auVar271 = vandps_avx(auVar253,auVar252);
      auVar208 = vandps_avx(auVar223,auVar252);
      auVar271 = vmaxps_avx(auVar271,auVar208);
      auVar271 = vmaxps_avx(auVar46,auVar271);
      auVar208 = vmovshdup_avx(auVar271);
      auVar208 = vmaxss_avx(auVar208,auVar271);
      auVar271 = vshufpd_avx(auVar271,auVar271,1);
      auVar271 = vmaxss_avx(auVar271,auVar208);
      fVar267 = *(float *)(bspline_basis0 + lVar151 + 0x908);
      fVar274 = *(float *)(bspline_basis0 + lVar151 + 0x90c);
      fVar276 = *(float *)(bspline_basis0 + lVar151 + 0x910);
      fVar278 = *(float *)(bspline_basis0 + lVar151 + 0x914);
      fVar279 = *(float *)(bspline_basis0 + lVar151 + 0x918);
      fVar280 = *(float *)(bspline_basis0 + lVar151 + 0x91c);
      fVar281 = *(float *)(bspline_basis0 + lVar151 + 0x920);
      auVar208 = vshufps_avx(auVar251,auVar251,0);
      register0x00001250 = auVar208;
      _local_600 = auVar208;
      fVar305 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar151 + 0xd8c);
      fVar240 = *(float *)(bspline_basis0 + lVar151 + 0xd90);
      fVar244 = *(float *)(bspline_basis0 + lVar151 + 0xd94);
      fVar247 = *(float *)(bspline_basis0 + lVar151 + 0xd98);
      fVar258 = *(float *)(bspline_basis0 + lVar151 + 0xd9c);
      fVar260 = *(float *)(bspline_basis0 + lVar151 + 0xda0);
      fVar261 = *(float *)(bspline_basis0 + lVar151 + 0xda4);
      auVar137 = *(undefined1 (*) [28])(bspline_basis0 + lVar151 + 0xd8c);
      auVar253 = vshufps_avx(auVar181,auVar181,0);
      register0x00001210 = auVar253;
      _local_400 = auVar253;
      fVar220 = auVar253._0_4_;
      fVar366 = auVar253._4_4_;
      fVar238 = auVar253._8_4_;
      fVar242 = auVar253._12_4_;
      fVar266 = auVar208._0_4_;
      fVar265 = auVar208._4_4_;
      fVar294 = auVar208._8_4_;
      fVar174 = auVar208._12_4_;
      auVar208 = vshufps_avx(auVar251,auVar251,0x55);
      register0x00001290 = auVar208;
      _local_700 = auVar208;
      auVar253 = vshufps_avx(auVar181,auVar181,0x55);
      register0x000014d0 = auVar253;
      _local_5c0 = auVar253;
      fVar328 = auVar253._0_4_;
      fVar329 = auVar253._4_4_;
      fVar330 = auVar253._8_4_;
      fVar331 = auVar253._12_4_;
      fVar202 = auVar208._0_4_;
      fVar216 = auVar208._4_4_;
      fVar217 = auVar208._8_4_;
      fVar218 = auVar208._12_4_;
      _local_740 = auVar382;
      auVar208 = vshufps_avx(auVar382,auVar382,0xff);
      register0x00001410 = auVar208;
      _local_140 = auVar208;
      _local_750 = auVar391;
      auVar253 = vshufps_avx(auVar391,auVar391,0xff);
      register0x000013d0 = auVar253;
      _local_a0 = auVar253;
      fVar282 = auVar253._0_4_;
      fVar235 = auVar253._4_4_;
      fVar219 = auVar253._8_4_;
      fVar304 = auVar253._12_4_;
      fVar195 = auVar208._0_4_;
      fVar196 = auVar208._4_4_;
      fVar198 = auVar208._8_4_;
      auVar253 = vshufps_avx(auVar270,auVar270,0);
      register0x00001550 = auVar253;
      _local_720 = auVar253;
      pauVar10 = (undefined1 (*) [32])(bspline_basis0 + lVar151 + 0x484);
      fVar262 = *(float *)*pauVar10;
      fVar263 = *(float *)(bspline_basis0 + lVar151 + 0x488);
      fVar264 = *(float *)(bspline_basis0 + lVar151 + 0x48c);
      fVar367 = *(float *)(bspline_basis0 + lVar151 + 0x490);
      fVar197 = *(float *)(bspline_basis0 + lVar151 + 0x494);
      fVar349 = *(float *)(bspline_basis0 + lVar151 + 0x498);
      fVar348 = *(float *)(bspline_basis0 + lVar151 + 0x49c);
      auVar138 = *(undefined1 (*) [28])*pauVar10;
      fVar350 = *(float *)(bspline_basis0 + lVar151 + 0x4a0);
      _auStack_570 = SUB3216(*pauVar10,0x10);
      fVar368 = auVar253._0_4_;
      fVar374 = auVar253._4_4_;
      fVar376 = auVar253._8_4_;
      fVar378 = auVar253._12_4_;
      auVar253 = vshufps_avx(auVar270,auVar270,0x55);
      register0x00001350 = auVar253;
      _local_6c0 = auVar253;
      fVar268 = auVar253._0_4_;
      fVar275 = auVar253._4_4_;
      fVar277 = auVar253._8_4_;
      fVar155 = auVar253._12_4_;
      _local_730 = auVar354;
      auVar253 = vshufps_avx(auVar354,auVar354,0xff);
      register0x00001590 = auVar253;
      _local_c0 = auVar253;
      fVar346 = auVar253._0_4_;
      fVar347 = auVar253._4_4_;
      fVar369 = auVar253._8_4_;
      fVar375 = auVar253._12_4_;
      auVar253 = vshufps_avx(auVar204,auVar204,0);
      register0x000015d0 = auVar253;
      _local_360 = auVar253;
      fVar200 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar151);
      fVar352 = *(float *)(bspline_basis0 + lVar151 + 4);
      fVar351 = *(float *)(bspline_basis0 + lVar151 + 8);
      fVar290 = *(float *)(bspline_basis0 + lVar151 + 0xc);
      fVar291 = *(float *)(bspline_basis0 + lVar151 + 0x10);
      fVar292 = *(float *)(bspline_basis0 + lVar151 + 0x14);
      fVar293 = *(float *)(bspline_basis0 + lVar151 + 0x18);
      auVar139 = *(undefined1 (*) [28])(bspline_basis0 + lVar151);
      fVar390 = auVar253._0_4_;
      fVar395 = auVar253._4_4_;
      fVar396 = auVar253._8_4_;
      fVar397 = auVar253._12_4_;
      auVar321._0_4_ = fVar390 * fVar200 + fVar368 * fVar262 + fVar266 * fVar267 + fVar305 * fVar220
      ;
      auVar321._4_4_ = fVar395 * fVar352 + fVar374 * fVar263 + fVar265 * fVar274 + fVar240 * fVar366
      ;
      auVar321._8_4_ = fVar396 * fVar351 + fVar376 * fVar264 + fVar294 * fVar276 + fVar244 * fVar238
      ;
      auVar321._12_4_ =
           fVar397 * fVar290 + fVar378 * fVar367 + fVar174 * fVar278 + fVar247 * fVar242;
      auVar321._16_4_ =
           fVar390 * fVar291 + fVar368 * fVar197 + fVar266 * fVar279 + fVar258 * fVar220;
      auVar321._20_4_ =
           fVar395 * fVar292 + fVar374 * fVar349 + fVar265 * fVar280 + fVar260 * fVar366;
      auVar321._24_4_ =
           fVar396 * fVar293 + fVar376 * fVar348 + fVar294 * fVar281 + fVar261 * fVar238;
      auVar321._28_4_ = fVar350 + fVar174 + fVar242 + 0.0;
      auVar253 = vshufps_avx(auVar204,auVar204,0x55);
      register0x00001310 = auVar253;
      _local_380 = auVar253;
      fVar177 = auVar253._0_4_;
      fVar178 = auVar253._4_4_;
      fVar193 = auVar253._8_4_;
      fVar194 = auVar253._12_4_;
      auVar359._0_4_ = fVar177 * fVar200 + fVar268 * fVar262 + fVar202 * fVar267 + fVar328 * fVar305
      ;
      auVar359._4_4_ = fVar178 * fVar352 + fVar275 * fVar263 + fVar216 * fVar274 + fVar329 * fVar240
      ;
      auVar359._8_4_ = fVar193 * fVar351 + fVar277 * fVar264 + fVar217 * fVar276 + fVar330 * fVar244
      ;
      auVar359._12_4_ =
           fVar194 * fVar290 + fVar155 * fVar367 + fVar218 * fVar278 + fVar331 * fVar247;
      auVar359._16_4_ =
           fVar177 * fVar291 + fVar268 * fVar197 + fVar202 * fVar279 + fVar328 * fVar258;
      auVar359._20_4_ =
           fVar178 * fVar292 + fVar275 * fVar349 + fVar216 * fVar280 + fVar329 * fVar260;
      auVar359._24_4_ =
           fVar193 * fVar293 + fVar277 * fVar348 + fVar217 * fVar281 + fVar330 * fVar261;
      auVar359._28_4_ = fVar218 + 0.0 + 0.0 + 0.0;
      auVar253 = vpermilps_avx(auVar250,0xff);
      register0x00001490 = auVar253;
      _local_160 = auVar253;
      fVar199 = auVar253._0_4_;
      fVar295 = auVar253._4_4_;
      fVar327 = auVar253._8_4_;
      local_7c0._0_4_ =
           fVar199 * fVar200 + fVar346 * fVar262 + fVar195 * fVar267 + fVar305 * fVar282;
      local_7c0._4_4_ =
           fVar295 * fVar352 + fVar347 * fVar263 + fVar196 * fVar274 + fVar240 * fVar235;
      fStack_7b8 = fVar327 * fVar351 + fVar369 * fVar264 + fVar198 * fVar276 + fVar244 * fVar219;
      fStack_7b4 = auVar253._12_4_ * fVar290 +
                   fVar375 * fVar367 + auVar208._12_4_ * fVar278 + fVar247 * fVar304;
      fStack_7b0 = fVar199 * fVar291 + fVar346 * fVar197 + fVar195 * fVar279 + fVar258 * fVar282;
      fStack_7ac = fVar295 * fVar292 + fVar347 * fVar349 + fVar196 * fVar280 + fVar260 * fVar235;
      fStack_7a8 = fVar327 * fVar293 + fVar369 * fVar348 + fVar198 * fVar281 + fVar261 * fVar219;
      fStack_7a4 = *(float *)(bspline_basis0 + lVar151 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar367 = *(float *)(bspline_basis1 + lVar151 + 0x908);
      fVar197 = *(float *)(bspline_basis1 + lVar151 + 0x90c);
      fVar349 = *(float *)(bspline_basis1 + lVar151 + 0x910);
      fVar348 = *(float *)(bspline_basis1 + lVar151 + 0x914);
      fVar200 = *(float *)(bspline_basis1 + lVar151 + 0x918);
      fVar352 = *(float *)(bspline_basis1 + lVar151 + 0x91c);
      fVar351 = *(float *)(bspline_basis1 + lVar151 + 0x920);
      fVar290 = *(float *)(bspline_basis1 + lVar151 + 0xd8c);
      fVar291 = *(float *)(bspline_basis1 + lVar151 + 0xd90);
      fVar292 = *(float *)(bspline_basis1 + lVar151 + 0xd94);
      fVar293 = *(float *)(bspline_basis1 + lVar151 + 0xd98);
      fVar315 = *(float *)(bspline_basis1 + lVar151 + 0xd9c);
      fVar246 = *(float *)(bspline_basis1 + lVar151 + 0xda0);
      fVar316 = *(float *)(bspline_basis1 + lVar151 + 0xda4);
      fVar154 = *(float *)(bspline_basis1 + lVar151 + 0x484);
      fVar172 = *(float *)(bspline_basis1 + lVar151 + 0x488);
      fVar173 = *(float *)(bspline_basis1 + lVar151 + 0x48c);
      fVar201 = *(float *)(bspline_basis1 + lVar151 + 0x490);
      fVar332 = *(float *)(bspline_basis1 + lVar151 + 0x494);
      fVar175 = *(float *)(bspline_basis1 + lVar151 + 0x498);
      fVar176 = *(float *)(bspline_basis1 + lVar151 + 0x49c);
      fVar240 = fVar378 + fVar350 + 0.0;
      fVar221 = *(float *)(bspline_basis1 + lVar151);
      fVar236 = *(float *)(bspline_basis1 + lVar151 + 4);
      fVar237 = *(float *)(bspline_basis1 + lVar151 + 8);
      fVar239 = *(float *)(bspline_basis1 + lVar151 + 0xc);
      fVar241 = *(float *)(bspline_basis1 + lVar151 + 0x10);
      fVar243 = *(float *)(bspline_basis1 + lVar151 + 0x14);
      fVar245 = *(float *)(bspline_basis1 + lVar151 + 0x18);
      auVar312._0_4_ = fVar390 * fVar221 + fVar368 * fVar154 + fVar367 * fVar266 + fVar290 * fVar220
      ;
      auVar312._4_4_ = fVar395 * fVar236 + fVar374 * fVar172 + fVar197 * fVar265 + fVar291 * fVar366
      ;
      auVar312._8_4_ = fVar396 * fVar237 + fVar376 * fVar173 + fVar349 * fVar294 + fVar292 * fVar238
      ;
      auVar312._12_4_ =
           fVar397 * fVar239 + fVar378 * fVar201 + fVar348 * fVar174 + fVar293 * fVar242;
      auVar312._16_4_ =
           fVar390 * fVar241 + fVar368 * fVar332 + fVar200 * fVar266 + fVar315 * fVar220;
      auVar312._20_4_ =
           fVar395 * fVar243 + fVar374 * fVar175 + fVar352 * fVar265 + fVar246 * fVar366;
      auVar312._24_4_ =
           fVar396 * fVar245 + fVar376 * fVar176 + fVar351 * fVar294 + fVar316 * fVar238;
      auVar312._28_4_ = fVar375 + fVar240;
      auVar229._0_4_ = fVar177 * fVar221 + fVar268 * fVar154 + fVar367 * fVar202 + fVar328 * fVar290
      ;
      auVar229._4_4_ = fVar178 * fVar236 + fVar275 * fVar172 + fVar197 * fVar216 + fVar329 * fVar291
      ;
      auVar229._8_4_ = fVar193 * fVar237 + fVar277 * fVar173 + fVar349 * fVar217 + fVar330 * fVar292
      ;
      auVar229._12_4_ =
           fVar194 * fVar239 + fVar155 * fVar201 + fVar348 * fVar218 + fVar331 * fVar293;
      auVar229._16_4_ =
           fVar177 * fVar241 + fVar268 * fVar332 + fVar200 * fVar202 + fVar328 * fVar315;
      auVar229._20_4_ =
           fVar178 * fVar243 + fVar275 * fVar175 + fVar352 * fVar216 + fVar329 * fVar246;
      auVar229._24_4_ =
           fVar193 * fVar245 + fVar277 * fVar176 + fVar351 * fVar217 + fVar330 * fVar316;
      auVar229._28_4_ = fVar240 + fVar378 + fVar350 + 0.0;
      local_5a0._0_4_ =
           fVar346 * fVar154 + fVar195 * fVar367 + fVar282 * fVar290 + fVar199 * fVar221;
      local_5a0._4_4_ =
           fVar347 * fVar172 + fVar196 * fVar197 + fVar235 * fVar291 + fVar295 * fVar236;
      local_5a0._8_4_ =
           fVar369 * fVar173 + fVar198 * fVar349 + fVar219 * fVar292 + fVar327 * fVar237;
      local_5a0._12_4_ =
           fVar375 * fVar201 + auVar208._12_4_ * fVar348 + fVar304 * fVar293 +
           auVar253._12_4_ * fVar239;
      local_5a0._16_4_ =
           fVar346 * fVar332 + fVar195 * fVar200 + fVar282 * fVar315 + fVar199 * fVar241;
      local_5a0._20_4_ =
           fVar347 * fVar175 + fVar196 * fVar352 + fVar235 * fVar246 + fVar295 * fVar243;
      local_5a0._24_4_ =
           fVar369 * fVar176 + fVar198 * fVar351 + fVar219 * fVar316 + fVar327 * fVar245;
      local_5a0._28_4_ = fVar378 + fVar304 + fVar350 + fVar240;
      auVar40 = vsubps_avx(auVar312,auVar321);
      auVar41 = vsubps_avx(auVar229,auVar359);
      fVar282 = auVar40._0_4_;
      fVar219 = auVar40._4_4_;
      auVar48._4_4_ = auVar359._4_4_ * fVar219;
      auVar48._0_4_ = auVar359._0_4_ * fVar282;
      fVar305 = auVar40._8_4_;
      auVar48._8_4_ = auVar359._8_4_ * fVar305;
      fVar244 = auVar40._12_4_;
      auVar48._12_4_ = auVar359._12_4_ * fVar244;
      fVar258 = auVar40._16_4_;
      auVar48._16_4_ = auVar359._16_4_ * fVar258;
      fVar261 = auVar40._20_4_;
      auVar48._20_4_ = auVar359._20_4_ * fVar261;
      fVar263 = auVar40._24_4_;
      auVar48._24_4_ = auVar359._24_4_ * fVar263;
      auVar48._28_4_ = fVar240;
      fVar235 = auVar41._0_4_;
      fVar304 = auVar41._4_4_;
      auVar49._4_4_ = auVar321._4_4_ * fVar304;
      auVar49._0_4_ = auVar321._0_4_ * fVar235;
      fVar240 = auVar41._8_4_;
      auVar49._8_4_ = auVar321._8_4_ * fVar240;
      fVar247 = auVar41._12_4_;
      auVar49._12_4_ = auVar321._12_4_ * fVar247;
      fVar260 = auVar41._16_4_;
      auVar49._16_4_ = auVar321._16_4_ * fVar260;
      fVar262 = auVar41._20_4_;
      auVar49._20_4_ = auVar321._20_4_ * fVar262;
      fVar264 = auVar41._24_4_;
      auVar49._24_4_ = auVar321._24_4_ * fVar264;
      auVar49._28_4_ = auVar229._28_4_;
      auVar39 = vsubps_avx(auVar48,auVar49);
      auVar164 = vmaxps_avx(_local_7c0,local_5a0);
      auVar50._4_4_ = auVar164._4_4_ * auVar164._4_4_ * (fVar219 * fVar219 + fVar304 * fVar304);
      auVar50._0_4_ = auVar164._0_4_ * auVar164._0_4_ * (fVar282 * fVar282 + fVar235 * fVar235);
      auVar50._8_4_ = auVar164._8_4_ * auVar164._8_4_ * (fVar305 * fVar305 + fVar240 * fVar240);
      auVar50._12_4_ = auVar164._12_4_ * auVar164._12_4_ * (fVar244 * fVar244 + fVar247 * fVar247);
      auVar50._16_4_ = auVar164._16_4_ * auVar164._16_4_ * (fVar258 * fVar258 + fVar260 * fVar260);
      auVar50._20_4_ = auVar164._20_4_ * auVar164._20_4_ * (fVar261 * fVar261 + fVar262 * fVar262);
      auVar50._24_4_ = auVar164._24_4_ * auVar164._24_4_ * (fVar263 * fVar263 + fVar264 * fVar264);
      auVar50._28_4_ = auVar41._28_4_ + auVar229._28_4_;
      auVar51._4_4_ = auVar39._4_4_ * auVar39._4_4_;
      auVar51._0_4_ = auVar39._0_4_ * auVar39._0_4_;
      auVar51._8_4_ = auVar39._8_4_ * auVar39._8_4_;
      auVar51._12_4_ = auVar39._12_4_ * auVar39._12_4_;
      auVar51._16_4_ = auVar39._16_4_ * auVar39._16_4_;
      auVar51._20_4_ = auVar39._20_4_ * auVar39._20_4_;
      auVar51._24_4_ = auVar39._24_4_ * auVar39._24_4_;
      auVar51._28_4_ = auVar39._28_4_;
      auVar164 = vcmpps_avx(auVar51,auVar50,2);
      local_3c0 = (float)(int)uVar34;
      fStack_3bc = 0.0;
      fStack_3b8 = 0.0;
      fStack_3b4 = 0.0;
      auVar208 = vshufps_avx(ZEXT416((uint)local_3c0),ZEXT416((uint)local_3c0),0);
      auVar230._16_16_ = auVar208;
      auVar230._0_16_ = auVar208;
      auVar39 = vcmpps_avx(_DAT_01faff40,auVar230,1);
      auVar234 = ZEXT3264(auVar39);
      auVar208 = vpermilps_avx(auVar204,0xaa);
      auVar337._16_16_ = auVar208;
      auVar337._0_16_ = auVar208;
      auVar253 = vpermilps_avx(auVar270,0xaa);
      register0x00001550 = auVar253;
      _local_340 = auVar253;
      auVar223 = vpermilps_avx(auVar251,0xaa);
      register0x00001590 = auVar223;
      _local_2e0 = auVar223;
      auVar46 = vpermilps_avx(auVar181,0xaa);
      register0x000014d0 = auVar46;
      _local_620 = auVar46;
      auVar42 = auVar39 & auVar164;
      auVar271 = ZEXT416((uint)(auVar271._0_4_ * 4.7683716e-07));
      local_6e0._0_16_ = auVar271;
      ray = local_7d8;
      auVar302 = local_4e0;
      fVar282 = fVar268;
      fVar235 = fVar275;
      fVar219 = fVar277;
      fVar304 = fVar368;
      fVar305 = fVar374;
      fVar240 = fVar376;
      fVar244 = fVar378;
      fVar247 = fVar202;
      fVar258 = fVar216;
      fVar260 = fVar217;
      fVar261 = fVar218;
      if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar42 >> 0x7f,0) != '\0') ||
            (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar42 >> 0xbf,0) != '\0') ||
          (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar42[0x1f] < '\0') {
        local_300 = vandps_avx(auVar164,auVar39);
        fVar195 = auVar208._0_4_;
        fVar196 = auVar208._4_4_;
        fVar198 = auVar208._8_4_;
        fVar199 = auVar208._12_4_;
        fVar369 = auVar253._0_4_;
        fVar375 = auVar253._4_4_;
        fVar377 = auVar253._8_4_;
        fVar379 = auVar253._12_4_;
        fVar381 = auVar223._0_4_;
        fVar386 = auVar223._4_4_;
        fVar387 = auVar223._8_4_;
        fVar388 = auVar223._12_4_;
        fVar295 = auVar46._0_4_;
        fVar327 = auVar46._4_4_;
        fVar346 = auVar46._8_4_;
        fVar347 = auVar46._12_4_;
        local_440 = fVar195 * fVar221 + fVar369 * fVar154 + fVar381 * fVar367 + fVar295 * fVar290;
        fStack_43c = fVar196 * fVar236 + fVar375 * fVar172 + fVar386 * fVar197 + fVar327 * fVar291;
        fStack_438 = fVar198 * fVar237 + fVar377 * fVar173 + fVar387 * fVar349 + fVar346 * fVar292;
        fStack_434 = fVar199 * fVar239 + fVar379 * fVar201 + fVar388 * fVar348 + fVar347 * fVar293;
        fStack_430 = fVar195 * fVar241 + fVar369 * fVar332 + fVar381 * fVar200 + fVar295 * fVar315;
        fStack_42c = fVar196 * fVar243 + fVar375 * fVar175 + fVar386 * fVar352 + fVar327 * fVar246;
        fStack_428 = fVar198 * fVar245 + fVar377 * fVar176 + fVar387 * fVar351 + fVar346 * fVar316;
        fStack_424 = local_300._28_4_ +
                     auVar39._28_4_ + *(float *)(bspline_basis1 + lVar151 + 0x924) + fVar397;
        local_420._0_4_ = auVar139._0_4_;
        local_420._4_4_ = auVar139._4_4_;
        fStack_418 = auVar139._8_4_;
        fStack_414 = auVar139._12_4_;
        fStack_410 = auVar139._16_4_;
        fStack_40c = auVar139._20_4_;
        fStack_408 = auVar139._24_4_;
        local_580._0_4_ = auVar138._0_4_;
        local_580._4_4_ = auVar138._4_4_;
        fStack_578 = auVar138._8_4_;
        fStack_574 = auVar138._12_4_;
        auStack_570._0_4_ = auVar138._16_4_;
        auStack_570._4_4_ = auVar138._20_4_;
        fStack_568 = auVar138._24_4_;
        local_5e0._0_4_ = auVar137._0_4_;
        local_5e0._4_4_ = auVar137._4_4_;
        fStack_5d8 = auVar137._8_4_;
        fStack_5d4 = auVar137._12_4_;
        fStack_5d0 = auVar137._16_4_;
        fStack_5cc = auVar137._20_4_;
        fStack_5c8 = auVar137._24_4_;
        local_640 = fVar195 * (float)local_420._0_4_ +
                    fVar369 * (float)local_580._0_4_ +
                    fVar381 * fVar267 + fVar295 * (float)local_5e0._0_4_;
        fStack_63c = fVar196 * (float)local_420._4_4_ +
                     fVar375 * (float)local_580._4_4_ +
                     fVar386 * fVar274 + fVar327 * (float)local_5e0._4_4_;
        fStack_638 = fVar198 * fStack_418 +
                     fVar377 * fStack_578 + fVar387 * fVar276 + fVar346 * fStack_5d8;
        fStack_634 = fVar199 * fStack_414 +
                     fVar379 * fStack_574 + fVar388 * fVar278 + fVar347 * fStack_5d4;
        fStack_630 = fVar195 * fStack_410 +
                     fVar369 * (float)auStack_570._0_4_ + fVar381 * fVar279 + fVar295 * fStack_5d0;
        fStack_62c = fVar196 * fStack_40c +
                     fVar375 * (float)auStack_570._4_4_ + fVar386 * fVar280 + fVar327 * fStack_5cc;
        fStack_628 = fVar198 * fStack_408 +
                     fVar377 * fStack_568 + fVar387 * fVar281 + fVar346 * fStack_5c8;
        fStack_624 = fVar194 + fStack_424 + local_300._28_4_ + auVar39._28_4_;
        fVar262 = *(float *)(bspline_basis0 + lVar151 + 0x1210);
        fVar263 = *(float *)(bspline_basis0 + lVar151 + 0x1214);
        fVar264 = *(float *)(bspline_basis0 + lVar151 + 0x1218);
        fVar267 = *(float *)(bspline_basis0 + lVar151 + 0x121c);
        fVar274 = *(float *)(bspline_basis0 + lVar151 + 0x1220);
        fVar276 = *(float *)(bspline_basis0 + lVar151 + 0x1224);
        fVar278 = *(float *)(bspline_basis0 + lVar151 + 0x1228);
        fVar279 = *(float *)(bspline_basis0 + lVar151 + 0x1694);
        fVar280 = *(float *)(bspline_basis0 + lVar151 + 0x1698);
        fVar281 = *(float *)(bspline_basis0 + lVar151 + 0x169c);
        fVar367 = *(float *)(bspline_basis0 + lVar151 + 0x16a0);
        fVar197 = *(float *)(bspline_basis0 + lVar151 + 0x16a4);
        fVar349 = *(float *)(bspline_basis0 + lVar151 + 0x16a8);
        fVar348 = *(float *)(bspline_basis0 + lVar151 + 0x16ac);
        fVar350 = *(float *)(bspline_basis0 + lVar151 + 0x1b18);
        fVar200 = *(float *)(bspline_basis0 + lVar151 + 0x1b1c);
        fVar352 = *(float *)(bspline_basis0 + lVar151 + 0x1b20);
        fVar351 = *(float *)(bspline_basis0 + lVar151 + 0x1b24);
        fVar290 = *(float *)(bspline_basis0 + lVar151 + 0x1b28);
        fVar291 = *(float *)(bspline_basis0 + lVar151 + 0x1b2c);
        fVar292 = *(float *)(bspline_basis0 + lVar151 + 0x1b30);
        fVar293 = *(float *)(bspline_basis0 + lVar151 + 0x1f9c);
        fVar315 = *(float *)(bspline_basis0 + lVar151 + 0x1fa0);
        fVar246 = *(float *)(bspline_basis0 + lVar151 + 0x1fa4);
        fVar316 = *(float *)(bspline_basis0 + lVar151 + 0x1fa8);
        fVar154 = *(float *)(bspline_basis0 + lVar151 + 0x1fac);
        fVar172 = *(float *)(bspline_basis0 + lVar151 + 0x1fb0);
        fVar173 = *(float *)(bspline_basis0 + lVar151 + 0x1fb4);
        _local_5e0 = auVar312;
        fVar201 = *(float *)(bspline_basis0 + lVar151 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar151 + 0x1fb8);
        fVar332 = *(float *)(bspline_basis0 + lVar151 + 0x16b0) + fVar201;
        local_420._4_4_ =
             fVar263 * fVar395 + fVar374 * fVar280 + fVar265 * fVar200 + fVar366 * fVar315;
        local_420._0_4_ =
             fVar262 * fVar390 + fVar368 * fVar279 + fVar266 * fVar350 + fVar220 * fVar293;
        fStack_418 = fVar264 * fVar396 + fVar376 * fVar281 + fVar294 * fVar352 + fVar238 * fVar246;
        fStack_414 = fVar267 * fVar397 + fVar378 * fVar367 + fVar174 * fVar351 + fVar242 * fVar316;
        fStack_410 = fVar274 * fVar390 + fVar368 * fVar197 + fVar266 * fVar290 + fVar220 * fVar154;
        fStack_40c = fVar276 * fVar395 + fVar374 * fVar349 + fVar265 * fVar291 + fVar366 * fVar172;
        fStack_408 = fVar278 * fVar396 + fVar376 * fVar348 + fVar294 * fVar292 + fVar238 * fVar173;
        fStack_404 = *(float *)(bspline_basis0 + lVar151 + 0x16b0) +
                     *(float *)(bspline_basis0 + lVar151 + 0x1fb8) +
                     *(float *)(bspline_basis1 + lVar151 + 0x4a0) + 0.0;
        auVar185._0_4_ =
             fVar177 * fVar262 + fVar202 * fVar350 + fVar328 * fVar293 + fVar268 * fVar279;
        auVar185._4_4_ =
             fVar178 * fVar263 + fVar216 * fVar200 + fVar329 * fVar315 + fVar275 * fVar280;
        auVar185._8_4_ =
             fVar193 * fVar264 + fVar217 * fVar352 + fVar330 * fVar246 + fVar277 * fVar281;
        auVar185._12_4_ =
             fVar194 * fVar267 + fVar218 * fVar351 + fVar331 * fVar316 + fVar155 * fVar367;
        auVar185._16_4_ =
             fVar177 * fVar274 + fVar202 * fVar290 + fVar328 * fVar154 + fVar268 * fVar197;
        auVar185._20_4_ =
             fVar178 * fVar276 + fVar216 * fVar291 + fVar329 * fVar172 + fVar275 * fVar349;
        auVar185._24_4_ =
             fVar193 * fVar278 + fVar217 * fVar292 + fVar330 * fVar173 + fVar277 * fVar348;
        auVar185._28_4_ = fVar201 + *(float *)(bspline_basis1 + lVar151 + 0x4a0) + 0.0 + 0.0;
        auVar285._0_4_ =
             fVar369 * fVar279 + fVar381 * fVar350 + fVar295 * fVar293 + fVar195 * fVar262;
        auVar285._4_4_ =
             fVar375 * fVar280 + fVar386 * fVar200 + fVar327 * fVar315 + fVar196 * fVar263;
        auVar285._8_4_ =
             fVar377 * fVar281 + fVar387 * fVar352 + fVar346 * fVar246 + fVar198 * fVar264;
        auVar285._12_4_ =
             fVar379 * fVar367 + fVar388 * fVar351 + fVar347 * fVar316 + fVar199 * fVar267;
        auVar285._16_4_ =
             fVar369 * fVar197 + fVar381 * fVar290 + fVar295 * fVar154 + fVar195 * fVar274;
        auVar285._20_4_ =
             fVar375 * fVar349 + fVar386 * fVar291 + fVar327 * fVar172 + fVar196 * fVar276;
        auVar285._24_4_ =
             fVar377 * fVar348 + fVar387 * fVar292 + fVar346 * fVar173 + fVar198 * fVar278;
        auVar285._28_4_ = fVar332 + *(float *)(bspline_basis0 + lVar151 + 0x122c);
        fVar262 = *(float *)(bspline_basis1 + lVar151 + 0x1b18);
        fVar263 = *(float *)(bspline_basis1 + lVar151 + 0x1b1c);
        fVar264 = *(float *)(bspline_basis1 + lVar151 + 0x1b20);
        fVar267 = *(float *)(bspline_basis1 + lVar151 + 0x1b24);
        fVar274 = *(float *)(bspline_basis1 + lVar151 + 0x1b28);
        fVar276 = *(float *)(bspline_basis1 + lVar151 + 0x1b2c);
        fVar278 = *(float *)(bspline_basis1 + lVar151 + 0x1b30);
        fVar279 = *(float *)(bspline_basis1 + lVar151 + 0x1f9c);
        fVar280 = *(float *)(bspline_basis1 + lVar151 + 0x1fa0);
        fVar281 = *(float *)(bspline_basis1 + lVar151 + 0x1fa4);
        fVar367 = *(float *)(bspline_basis1 + lVar151 + 0x1fa8);
        fVar197 = *(float *)(bspline_basis1 + lVar151 + 0x1fac);
        fVar349 = *(float *)(bspline_basis1 + lVar151 + 0x1fb0);
        fVar348 = *(float *)(bspline_basis1 + lVar151 + 0x1fb4);
        fVar350 = *(float *)(bspline_basis1 + lVar151 + 0x1694);
        fVar200 = *(float *)(bspline_basis1 + lVar151 + 0x1698);
        fVar352 = *(float *)(bspline_basis1 + lVar151 + 0x169c);
        fVar351 = *(float *)(bspline_basis1 + lVar151 + 0x16a0);
        fVar290 = *(float *)(bspline_basis1 + lVar151 + 0x16a4);
        fVar291 = *(float *)(bspline_basis1 + lVar151 + 0x16a8);
        fVar292 = *(float *)(bspline_basis1 + lVar151 + 0x16ac);
        fVar293 = *(float *)(bspline_basis1 + lVar151 + 0x1210);
        fVar315 = *(float *)(bspline_basis1 + lVar151 + 0x1214);
        fVar246 = *(float *)(bspline_basis1 + lVar151 + 0x1218);
        fVar316 = *(float *)(bspline_basis1 + lVar151 + 0x121c);
        fVar154 = *(float *)(bspline_basis1 + lVar151 + 0x1220);
        fVar172 = *(float *)(bspline_basis1 + lVar151 + 0x1224);
        fVar173 = *(float *)(bspline_basis1 + lVar151 + 0x1228);
        auVar300._0_4_ =
             fVar293 * fVar390 + fVar368 * fVar350 + fVar266 * fVar262 + fVar220 * fVar279;
        auVar300._4_4_ =
             fVar315 * fVar395 + fVar374 * fVar200 + fVar265 * fVar263 + fVar366 * fVar280;
        auVar300._8_4_ =
             fVar246 * fVar396 + fVar376 * fVar352 + fVar294 * fVar264 + fVar238 * fVar281;
        auVar300._12_4_ =
             fVar316 * fVar397 + fVar378 * fVar351 + fVar174 * fVar267 + fVar242 * fVar367;
        auVar300._16_4_ =
             fVar154 * fVar390 + fVar368 * fVar290 + fVar266 * fVar274 + fVar220 * fVar197;
        auVar300._20_4_ =
             fVar172 * fVar395 + fVar374 * fVar291 + fVar265 * fVar276 + fVar366 * fVar349;
        auVar300._24_4_ =
             fVar173 * fVar396 + fVar376 * fVar292 + fVar294 * fVar278 + fVar238 * fVar348;
        auVar300._28_4_ = fVar218 + fVar218 + fVar332 + fVar242;
        auVar322._0_4_ =
             fVar177 * fVar293 + fVar268 * fVar350 + fVar202 * fVar262 + fVar328 * fVar279;
        auVar322._4_4_ =
             fVar178 * fVar315 + fVar275 * fVar200 + fVar216 * fVar263 + fVar329 * fVar280;
        auVar322._8_4_ =
             fVar193 * fVar246 + fVar277 * fVar352 + fVar217 * fVar264 + fVar330 * fVar281;
        auVar322._12_4_ =
             fVar194 * fVar316 + fVar155 * fVar351 + fVar218 * fVar267 + fVar331 * fVar367;
        auVar322._16_4_ =
             fVar177 * fVar154 + fVar268 * fVar290 + fVar202 * fVar274 + fVar328 * fVar197;
        auVar322._20_4_ =
             fVar178 * fVar172 + fVar275 * fVar291 + fVar216 * fVar276 + fVar329 * fVar349;
        auVar322._24_4_ =
             fVar193 * fVar173 + fVar277 * fVar292 + fVar217 * fVar278 + fVar330 * fVar348;
        auVar322._28_4_ = fVar218 + fVar218 + fVar218 + fVar332;
        _local_660 = auVar337;
        auVar215._0_4_ =
             fVar195 * fVar293 + fVar369 * fVar350 + fVar381 * fVar262 + fVar295 * fVar279;
        auVar215._4_4_ =
             fVar196 * fVar315 + fVar375 * fVar200 + fVar386 * fVar263 + fVar327 * fVar280;
        auVar215._8_4_ =
             fVar198 * fVar246 + fVar377 * fVar352 + fVar387 * fVar264 + fVar346 * fVar281;
        auVar215._12_4_ =
             fVar199 * fVar316 + fVar379 * fVar351 + fVar388 * fVar267 + fVar347 * fVar367;
        auVar215._16_4_ =
             fVar195 * fVar154 + fVar369 * fVar290 + fVar381 * fVar274 + fVar295 * fVar197;
        auVar215._20_4_ =
             fVar196 * fVar172 + fVar375 * fVar291 + fVar386 * fVar276 + fVar327 * fVar349;
        auVar215._24_4_ =
             fVar198 * fVar173 + fVar377 * fVar292 + fVar387 * fVar278 + fVar346 * fVar348;
        auVar215._28_4_ =
             *(float *)(bspline_basis1 + lVar151 + 0x122c) +
             *(float *)(bspline_basis1 + lVar151 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar151 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar151 + 0x1fb8);
        auVar254._8_4_ = 0x7fffffff;
        auVar254._0_8_ = 0x7fffffff7fffffff;
        auVar254._12_4_ = 0x7fffffff;
        auVar254._16_4_ = 0x7fffffff;
        auVar254._20_4_ = 0x7fffffff;
        auVar254._24_4_ = 0x7fffffff;
        auVar254._28_4_ = 0x7fffffff;
        auVar164 = vandps_avx(_local_420,auVar254);
        auVar39 = vandps_avx(auVar185,auVar254);
        auVar39 = vmaxps_avx(auVar164,auVar39);
        auVar164 = vandps_avx(auVar285,auVar254);
        auVar164 = vmaxps_avx(auVar39,auVar164);
        auVar271 = vpermilps_avx(auVar271,0);
        auVar286._16_16_ = auVar271;
        auVar286._0_16_ = auVar271;
        auVar164 = vcmpps_avx(auVar164,auVar286,1);
        auVar42 = vblendvps_avx(_local_420,auVar40,auVar164);
        auVar302 = vblendvps_avx(auVar185,auVar41,auVar164);
        auVar164 = vandps_avx(auVar300,auVar254);
        auVar39 = vandps_avx(auVar322,auVar254);
        auVar43 = vmaxps_avx(auVar164,auVar39);
        auVar164 = vandps_avx(auVar215,auVar254);
        auVar164 = vmaxps_avx(auVar43,auVar164);
        auVar43 = vcmpps_avx(auVar164,auVar286,1);
        auVar164 = vblendvps_avx(auVar300,auVar40,auVar43);
        auVar40 = vblendvps_avx(auVar322,auVar41,auVar43);
        fVar154 = auVar42._0_4_;
        fVar172 = auVar42._4_4_;
        fVar173 = auVar42._8_4_;
        fVar201 = auVar42._12_4_;
        fVar332 = auVar42._16_4_;
        fVar175 = auVar42._20_4_;
        fVar176 = auVar42._24_4_;
        fVar221 = auVar164._0_4_;
        fVar236 = auVar164._4_4_;
        fVar237 = auVar164._8_4_;
        fVar239 = auVar164._12_4_;
        fVar241 = auVar164._16_4_;
        fVar243 = auVar164._20_4_;
        fVar245 = auVar164._24_4_;
        fVar266 = -auVar164._28_4_;
        fVar220 = auVar302._0_4_;
        fVar262 = auVar302._4_4_;
        fVar274 = auVar302._8_4_;
        fVar280 = auVar302._12_4_;
        fVar349 = auVar302._16_4_;
        fVar352 = auVar302._20_4_;
        fVar292 = auVar302._24_4_;
        auVar160._0_4_ = fVar220 * fVar220 + fVar154 * fVar154;
        auVar160._4_4_ = fVar262 * fVar262 + fVar172 * fVar172;
        auVar160._8_4_ = fVar274 * fVar274 + fVar173 * fVar173;
        auVar160._12_4_ = fVar280 * fVar280 + fVar201 * fVar201;
        auVar160._16_4_ = fVar349 * fVar349 + fVar332 * fVar332;
        auVar160._20_4_ = fVar352 * fVar352 + fVar175 * fVar175;
        auVar160._24_4_ = fVar292 * fVar292 + fVar176 * fVar176;
        auVar160._28_4_ = auVar322._28_4_ + auVar42._28_4_;
        auVar41 = vrsqrtps_avx(auVar160);
        fVar366 = auVar41._0_4_;
        fVar238 = auVar41._4_4_;
        auVar52._4_4_ = fVar238 * 1.5;
        auVar52._0_4_ = fVar366 * 1.5;
        fVar242 = auVar41._8_4_;
        auVar52._8_4_ = fVar242 * 1.5;
        fVar263 = auVar41._12_4_;
        auVar52._12_4_ = fVar263 * 1.5;
        fVar264 = auVar41._16_4_;
        auVar52._16_4_ = fVar264 * 1.5;
        fVar267 = auVar41._20_4_;
        auVar52._20_4_ = fVar267 * 1.5;
        fVar276 = auVar41._24_4_;
        fVar316 = auVar39._28_4_;
        auVar52._24_4_ = fVar276 * 1.5;
        auVar52._28_4_ = fVar316;
        auVar53._4_4_ = fVar238 * fVar238 * fVar238 * auVar160._4_4_ * 0.5;
        auVar53._0_4_ = fVar366 * fVar366 * fVar366 * auVar160._0_4_ * 0.5;
        auVar53._8_4_ = fVar242 * fVar242 * fVar242 * auVar160._8_4_ * 0.5;
        auVar53._12_4_ = fVar263 * fVar263 * fVar263 * auVar160._12_4_ * 0.5;
        auVar53._16_4_ = fVar264 * fVar264 * fVar264 * auVar160._16_4_ * 0.5;
        auVar53._20_4_ = fVar267 * fVar267 * fVar267 * auVar160._20_4_ * 0.5;
        auVar53._24_4_ = fVar276 * fVar276 * fVar276 * auVar160._24_4_ * 0.5;
        auVar53._28_4_ = auVar160._28_4_;
        auVar39 = vsubps_avx(auVar52,auVar53);
        fVar366 = auVar39._0_4_;
        fVar263 = auVar39._4_4_;
        fVar276 = auVar39._8_4_;
        fVar281 = auVar39._12_4_;
        fVar348 = auVar39._16_4_;
        fVar351 = auVar39._20_4_;
        fVar293 = auVar39._24_4_;
        fVar238 = auVar40._0_4_;
        fVar264 = auVar40._4_4_;
        fVar278 = auVar40._8_4_;
        fVar367 = auVar40._12_4_;
        fVar350 = auVar40._16_4_;
        fVar290 = auVar40._20_4_;
        fVar315 = auVar40._24_4_;
        auVar161._0_4_ = fVar238 * fVar238 + fVar221 * fVar221;
        auVar161._4_4_ = fVar264 * fVar264 + fVar236 * fVar236;
        auVar161._8_4_ = fVar278 * fVar278 + fVar237 * fVar237;
        auVar161._12_4_ = fVar367 * fVar367 + fVar239 * fVar239;
        auVar161._16_4_ = fVar350 * fVar350 + fVar241 * fVar241;
        auVar161._20_4_ = fVar290 * fVar290 + fVar243 * fVar243;
        auVar161._24_4_ = fVar315 * fVar315 + fVar245 * fVar245;
        auVar161._28_4_ = auVar164._28_4_ + auVar39._28_4_;
        auVar164 = vrsqrtps_avx(auVar161);
        fVar242 = auVar164._0_4_;
        fVar267 = auVar164._4_4_;
        auVar54._4_4_ = fVar267 * 1.5;
        auVar54._0_4_ = fVar242 * 1.5;
        fVar279 = auVar164._8_4_;
        auVar54._8_4_ = fVar279 * 1.5;
        fVar197 = auVar164._12_4_;
        auVar54._12_4_ = fVar197 * 1.5;
        fVar200 = auVar164._16_4_;
        auVar54._16_4_ = fVar200 * 1.5;
        fVar291 = auVar164._20_4_;
        auVar54._20_4_ = fVar291 * 1.5;
        fVar246 = auVar164._24_4_;
        auVar54._24_4_ = fVar246 * 1.5;
        auVar54._28_4_ = fVar316;
        auVar55._4_4_ = fVar267 * fVar267 * fVar267 * auVar161._4_4_ * 0.5;
        auVar55._0_4_ = fVar242 * fVar242 * fVar242 * auVar161._0_4_ * 0.5;
        auVar55._8_4_ = fVar279 * fVar279 * fVar279 * auVar161._8_4_ * 0.5;
        auVar55._12_4_ = fVar197 * fVar197 * fVar197 * auVar161._12_4_ * 0.5;
        auVar55._16_4_ = fVar200 * fVar200 * fVar200 * auVar161._16_4_ * 0.5;
        auVar55._20_4_ = fVar291 * fVar291 * fVar291 * auVar161._20_4_ * 0.5;
        auVar55._24_4_ = fVar246 * fVar246 * fVar246 * auVar161._24_4_ * 0.5;
        auVar55._28_4_ = auVar161._28_4_;
        auVar164 = vsubps_avx(auVar54,auVar55);
        fVar242 = auVar164._0_4_;
        fVar267 = auVar164._4_4_;
        fVar279 = auVar164._8_4_;
        fVar197 = auVar164._12_4_;
        fVar200 = auVar164._16_4_;
        fVar291 = auVar164._20_4_;
        fVar246 = auVar164._24_4_;
        fVar220 = (float)local_7c0._0_4_ * fVar220 * fVar366;
        fVar262 = (float)local_7c0._4_4_ * fVar262 * fVar263;
        auVar56._4_4_ = fVar262;
        auVar56._0_4_ = fVar220;
        fVar274 = fStack_7b8 * fVar274 * fVar276;
        auVar56._8_4_ = fVar274;
        fVar280 = fStack_7b4 * fVar280 * fVar281;
        auVar56._12_4_ = fVar280;
        fVar349 = fStack_7b0 * fVar349 * fVar348;
        auVar56._16_4_ = fVar349;
        fVar352 = fStack_7ac * fVar352 * fVar351;
        auVar56._20_4_ = fVar352;
        fVar292 = fStack_7a8 * fVar292 * fVar293;
        auVar56._24_4_ = fVar292;
        auVar56._28_4_ = fVar266;
        local_560._4_4_ = auVar321._4_4_ + fVar262;
        local_560._0_4_ = auVar321._0_4_ + fVar220;
        fStack_558 = auVar321._8_4_ + fVar274;
        fStack_554 = auVar321._12_4_ + fVar280;
        fStack_550 = auVar321._16_4_ + fVar349;
        fStack_54c = auVar321._20_4_ + fVar352;
        fStack_548 = auVar321._24_4_ + fVar292;
        fStack_544 = auVar321._28_4_ + fVar266;
        fVar220 = (float)local_7c0._0_4_ * fVar366 * -fVar154;
        fVar262 = (float)local_7c0._4_4_ * fVar263 * -fVar172;
        auVar57._4_4_ = fVar262;
        auVar57._0_4_ = fVar220;
        fVar274 = fStack_7b8 * fVar276 * -fVar173;
        auVar57._8_4_ = fVar274;
        fVar280 = fStack_7b4 * fVar281 * -fVar201;
        auVar57._12_4_ = fVar280;
        fVar349 = fStack_7b0 * fVar348 * -fVar332;
        auVar57._16_4_ = fVar349;
        fVar352 = fStack_7ac * fVar351 * -fVar175;
        auVar57._20_4_ = fVar352;
        fVar292 = fStack_7a8 * fVar293 * -fVar176;
        auVar57._24_4_ = fVar292;
        auVar57._28_4_ = fVar316;
        local_580._4_4_ = fVar262 + auVar359._4_4_;
        local_580._0_4_ = fVar220 + auVar359._0_4_;
        fStack_578 = fVar274 + auVar359._8_4_;
        fStack_574 = fVar280 + auVar359._12_4_;
        auStack_570._0_4_ = fVar349 + auVar359._16_4_;
        auStack_570._4_4_ = fVar352 + auVar359._20_4_;
        fStack_568 = fVar292 + auVar359._24_4_;
        fStack_564 = fVar316 + auVar359._28_4_;
        fVar220 = fVar366 * 0.0 * (float)local_7c0._0_4_;
        fVar366 = fVar263 * 0.0 * (float)local_7c0._4_4_;
        auVar58._4_4_ = fVar366;
        auVar58._0_4_ = fVar220;
        fVar262 = fVar276 * 0.0 * fStack_7b8;
        auVar58._8_4_ = fVar262;
        fVar263 = fVar281 * 0.0 * fStack_7b4;
        auVar58._12_4_ = fVar263;
        fVar274 = fVar348 * 0.0 * fStack_7b0;
        auVar58._16_4_ = fVar274;
        fVar276 = fVar351 * 0.0 * fStack_7ac;
        auVar58._20_4_ = fVar276;
        fVar280 = fVar293 * 0.0 * fStack_7a8;
        auVar58._24_4_ = fVar280;
        auVar58._28_4_ = fVar331;
        auVar132._4_4_ = fStack_63c;
        auVar132._0_4_ = local_640;
        auVar132._8_4_ = fStack_638;
        auVar132._12_4_ = fStack_634;
        auVar132._16_4_ = fStack_630;
        auVar132._20_4_ = fStack_62c;
        auVar132._24_4_ = fStack_628;
        auVar132._28_4_ = fStack_624;
        auVar287._0_4_ = fVar220 + local_640;
        auVar287._4_4_ = fVar366 + fStack_63c;
        auVar287._8_4_ = fVar262 + fStack_638;
        auVar287._12_4_ = fVar263 + fStack_634;
        auVar287._16_4_ = fVar274 + fStack_630;
        auVar287._20_4_ = fVar276 + fStack_62c;
        auVar287._24_4_ = fVar280 + fStack_628;
        auVar287._28_4_ = fVar331 + fStack_624;
        fVar220 = local_5a0._0_4_ * fVar238 * fVar242;
        fVar366 = local_5a0._4_4_ * fVar264 * fVar267;
        auVar59._4_4_ = fVar366;
        auVar59._0_4_ = fVar220;
        fVar238 = local_5a0._8_4_ * fVar278 * fVar279;
        auVar59._8_4_ = fVar238;
        fVar262 = local_5a0._12_4_ * fVar367 * fVar197;
        auVar59._12_4_ = fVar262;
        fVar263 = local_5a0._16_4_ * fVar350 * fVar200;
        auVar59._16_4_ = fVar263;
        fVar264 = local_5a0._20_4_ * fVar290 * fVar291;
        auVar59._20_4_ = fVar264;
        fVar274 = local_5a0._24_4_ * fVar315 * fVar246;
        auVar59._24_4_ = fVar274;
        auVar59._28_4_ = auVar40._28_4_;
        auVar42 = vsubps_avx(auVar321,auVar56);
        auVar323._0_4_ = auVar312._0_4_ + fVar220;
        auVar323._4_4_ = auVar312._4_4_ + fVar366;
        auVar323._8_4_ = auVar312._8_4_ + fVar238;
        auVar323._12_4_ = auVar312._12_4_ + fVar262;
        auVar323._16_4_ = auVar312._16_4_ + fVar263;
        auVar323._20_4_ = auVar312._20_4_ + fVar264;
        auVar323._24_4_ = auVar312._24_4_ + fVar274;
        auVar323._28_4_ = auVar312._28_4_ + auVar40._28_4_;
        fVar220 = local_5a0._0_4_ * fVar242 * -fVar221;
        fVar366 = local_5a0._4_4_ * fVar267 * -fVar236;
        auVar60._4_4_ = fVar366;
        auVar60._0_4_ = fVar220;
        fVar238 = local_5a0._8_4_ * fVar279 * -fVar237;
        auVar60._8_4_ = fVar238;
        fVar262 = local_5a0._12_4_ * fVar197 * -fVar239;
        auVar60._12_4_ = fVar262;
        fVar263 = local_5a0._16_4_ * fVar200 * -fVar241;
        auVar60._16_4_ = fVar263;
        fVar264 = local_5a0._20_4_ * fVar291 * -fVar243;
        auVar60._20_4_ = fVar264;
        fVar274 = local_5a0._24_4_ * fVar246 * -fVar245;
        auVar60._24_4_ = fVar274;
        auVar60._28_4_ = fVar379;
        auVar302 = vsubps_avx(auVar359,auVar57);
        auVar338._0_4_ = fVar220 + auVar229._0_4_;
        auVar338._4_4_ = fVar366 + auVar229._4_4_;
        auVar338._8_4_ = fVar238 + auVar229._8_4_;
        auVar338._12_4_ = fVar262 + auVar229._12_4_;
        auVar338._16_4_ = fVar263 + auVar229._16_4_;
        auVar338._20_4_ = fVar264 + auVar229._20_4_;
        auVar338._24_4_ = fVar274 + auVar229._24_4_;
        auVar338._28_4_ = fVar379 + auVar229._28_4_;
        fVar220 = local_5a0._0_4_ * fVar242 * 0.0;
        fVar366 = local_5a0._4_4_ * fVar267 * 0.0;
        auVar61._4_4_ = fVar366;
        auVar61._0_4_ = fVar220;
        fVar238 = local_5a0._8_4_ * fVar279 * 0.0;
        auVar61._8_4_ = fVar238;
        fVar242 = local_5a0._12_4_ * fVar197 * 0.0;
        auVar61._12_4_ = fVar242;
        fVar262 = local_5a0._16_4_ * fVar200 * 0.0;
        auVar61._16_4_ = fVar262;
        fVar263 = local_5a0._20_4_ * fVar291 * 0.0;
        auVar61._20_4_ = fVar263;
        fVar264 = local_5a0._24_4_ * fVar246 * 0.0;
        auVar61._24_4_ = fVar264;
        auVar61._28_4_ = 0x3f000000;
        auVar43 = vsubps_avx(auVar132,auVar58);
        auVar134._4_4_ = fStack_43c;
        auVar134._0_4_ = local_440;
        auVar134._8_4_ = fStack_438;
        auVar134._12_4_ = fStack_434;
        auVar134._16_4_ = fStack_430;
        auVar134._20_4_ = fStack_42c;
        auVar134._24_4_ = fStack_428;
        auVar134._28_4_ = fStack_424;
        auVar384._0_4_ = fVar220 + local_440;
        auVar384._4_4_ = fVar366 + fStack_43c;
        auVar384._8_4_ = fVar238 + fStack_438;
        auVar384._12_4_ = fVar242 + fStack_434;
        auVar384._16_4_ = fVar262 + fStack_430;
        auVar384._20_4_ = fVar263 + fStack_42c;
        auVar384._24_4_ = fVar264 + fStack_428;
        auVar384._28_4_ = fStack_424 + 0.5;
        auVar164 = vsubps_avx(auVar312,auVar59);
        auVar39 = vsubps_avx(auVar229,auVar60);
        auVar45 = vsubps_avx(auVar134,auVar61);
        auVar40 = vsubps_avx(auVar338,auVar302);
        auVar41 = vsubps_avx(auVar384,auVar43);
        auVar62._4_4_ = auVar43._4_4_ * auVar40._4_4_;
        auVar62._0_4_ = auVar43._0_4_ * auVar40._0_4_;
        auVar62._8_4_ = auVar43._8_4_ * auVar40._8_4_;
        auVar62._12_4_ = auVar43._12_4_ * auVar40._12_4_;
        auVar62._16_4_ = auVar43._16_4_ * auVar40._16_4_;
        auVar62._20_4_ = auVar43._20_4_ * auVar40._20_4_;
        auVar62._24_4_ = auVar43._24_4_ * auVar40._24_4_;
        auVar62._28_4_ = auVar312._28_4_;
        auVar63._4_4_ = auVar302._4_4_ * auVar41._4_4_;
        auVar63._0_4_ = auVar302._0_4_ * auVar41._0_4_;
        auVar63._8_4_ = auVar302._8_4_ * auVar41._8_4_;
        auVar63._12_4_ = auVar302._12_4_ * auVar41._12_4_;
        auVar63._16_4_ = auVar302._16_4_ * auVar41._16_4_;
        auVar63._20_4_ = auVar302._20_4_ * auVar41._20_4_;
        auVar63._24_4_ = auVar302._24_4_ * auVar41._24_4_;
        auVar63._28_4_ = fStack_424;
        auVar44 = vsubps_avx(auVar63,auVar62);
        auVar64._4_4_ = auVar42._4_4_ * auVar41._4_4_;
        auVar64._0_4_ = auVar42._0_4_ * auVar41._0_4_;
        auVar64._8_4_ = auVar42._8_4_ * auVar41._8_4_;
        auVar64._12_4_ = auVar42._12_4_ * auVar41._12_4_;
        auVar64._16_4_ = auVar42._16_4_ * auVar41._16_4_;
        auVar64._20_4_ = auVar42._20_4_ * auVar41._20_4_;
        auVar64._24_4_ = auVar42._24_4_ * auVar41._24_4_;
        auVar64._28_4_ = auVar41._28_4_;
        auVar47 = vsubps_avx(auVar323,auVar42);
        auVar65._4_4_ = auVar43._4_4_ * auVar47._4_4_;
        auVar65._0_4_ = auVar43._0_4_ * auVar47._0_4_;
        auVar65._8_4_ = auVar43._8_4_ * auVar47._8_4_;
        auVar65._12_4_ = auVar43._12_4_ * auVar47._12_4_;
        auVar65._16_4_ = auVar43._16_4_ * auVar47._16_4_;
        auVar65._20_4_ = auVar43._20_4_ * auVar47._20_4_;
        auVar65._24_4_ = auVar43._24_4_ * auVar47._24_4_;
        auVar65._28_4_ = auVar229._28_4_;
        auVar38 = vsubps_avx(auVar65,auVar64);
        auVar66._4_4_ = auVar47._4_4_ * auVar302._4_4_;
        auVar66._0_4_ = auVar47._0_4_ * auVar302._0_4_;
        auVar66._8_4_ = auVar47._8_4_ * auVar302._8_4_;
        auVar66._12_4_ = auVar47._12_4_ * auVar302._12_4_;
        auVar66._16_4_ = auVar47._16_4_ * auVar302._16_4_;
        auVar66._20_4_ = auVar47._20_4_ * auVar302._20_4_;
        auVar66._24_4_ = auVar47._24_4_ * auVar302._24_4_;
        auVar66._28_4_ = auVar41._28_4_;
        auVar67._4_4_ = auVar42._4_4_ * auVar40._4_4_;
        auVar67._0_4_ = auVar42._0_4_ * auVar40._0_4_;
        auVar67._8_4_ = auVar42._8_4_ * auVar40._8_4_;
        auVar67._12_4_ = auVar42._12_4_ * auVar40._12_4_;
        auVar67._16_4_ = auVar42._16_4_ * auVar40._16_4_;
        auVar67._20_4_ = auVar42._20_4_ * auVar40._20_4_;
        auVar67._24_4_ = auVar42._24_4_ * auVar40._24_4_;
        auVar67._28_4_ = auVar40._28_4_;
        auVar40 = vsubps_avx(auVar67,auVar66);
        auVar162._0_4_ = auVar44._0_4_ * 0.0 + auVar40._0_4_ + auVar38._0_4_ * 0.0;
        auVar162._4_4_ = auVar44._4_4_ * 0.0 + auVar40._4_4_ + auVar38._4_4_ * 0.0;
        auVar162._8_4_ = auVar44._8_4_ * 0.0 + auVar40._8_4_ + auVar38._8_4_ * 0.0;
        auVar162._12_4_ = auVar44._12_4_ * 0.0 + auVar40._12_4_ + auVar38._12_4_ * 0.0;
        auVar162._16_4_ = auVar44._16_4_ * 0.0 + auVar40._16_4_ + auVar38._16_4_ * 0.0;
        auVar162._20_4_ = auVar44._20_4_ * 0.0 + auVar40._20_4_ + auVar38._20_4_ * 0.0;
        auVar162._24_4_ = auVar44._24_4_ * 0.0 + auVar40._24_4_ + auVar38._24_4_ * 0.0;
        auVar162._28_4_ = auVar40._28_4_ + auVar40._28_4_ + auVar38._28_4_;
        auVar44 = vcmpps_avx(auVar162,ZEXT432(0) << 0x20,2);
        _local_520 = vblendvps_avx(auVar164,_local_560,auVar44);
        _local_540 = vblendvps_avx(auVar39,_local_580,auVar44);
        auVar164 = vblendvps_avx(auVar45,auVar287,auVar44);
        auVar39 = vblendvps_avx(auVar42,auVar323,auVar44);
        auVar40 = vblendvps_avx(auVar302,auVar338,auVar44);
        auVar41 = vblendvps_avx(auVar43,auVar384,auVar44);
        auVar42 = vblendvps_avx(auVar323,auVar42,auVar44);
        auVar302 = vblendvps_avx(auVar338,auVar302,auVar44);
        _local_500 = vpackssdw_avx(local_300._0_16_,local_300._16_16_);
        _auStack_4f0 = auVar321._16_16_;
        auVar43 = vblendvps_avx(auVar384,auVar43,auVar44);
        auVar42 = vsubps_avx(auVar42,_local_520);
        auVar47 = vsubps_avx(auVar302,_local_540);
        auVar43 = vsubps_avx(auVar43,auVar164);
        auVar38 = vsubps_avx(_local_540,auVar40);
        fVar220 = auVar47._0_4_;
        fVar176 = auVar164._0_4_;
        fVar263 = auVar47._4_4_;
        fVar221 = auVar164._4_4_;
        auVar68._4_4_ = fVar221 * fVar263;
        auVar68._0_4_ = fVar176 * fVar220;
        fVar278 = auVar47._8_4_;
        fVar236 = auVar164._8_4_;
        auVar68._8_4_ = fVar236 * fVar278;
        fVar197 = auVar47._12_4_;
        fVar237 = auVar164._12_4_;
        auVar68._12_4_ = fVar237 * fVar197;
        fVar352 = auVar47._16_4_;
        fVar239 = auVar164._16_4_;
        auVar68._16_4_ = fVar239 * fVar352;
        fVar293 = auVar47._20_4_;
        fVar241 = auVar164._20_4_;
        auVar68._20_4_ = fVar241 * fVar293;
        fVar172 = auVar47._24_4_;
        fVar243 = auVar164._24_4_;
        auVar68._24_4_ = fVar243 * fVar172;
        auVar68._28_4_ = auVar302._28_4_;
        fVar366 = local_540._0_4_;
        fVar193 = auVar43._0_4_;
        fVar264 = local_540._4_4_;
        fVar194 = auVar43._4_4_;
        auVar69._4_4_ = fVar194 * fVar264;
        auVar69._0_4_ = fVar193 * fVar366;
        fVar279 = local_540._8_4_;
        fVar195 = auVar43._8_4_;
        auVar69._8_4_ = fVar195 * fVar279;
        fVar349 = local_540._12_4_;
        fVar196 = auVar43._12_4_;
        auVar69._12_4_ = fVar196 * fVar349;
        fVar351 = local_540._16_4_;
        fVar198 = auVar43._16_4_;
        auVar69._16_4_ = fVar198 * fVar351;
        fVar315 = local_540._20_4_;
        fVar199 = auVar43._20_4_;
        auVar69._20_4_ = fVar199 * fVar315;
        fVar173 = local_540._24_4_;
        fVar295 = auVar43._24_4_;
        uVar11 = auVar45._28_4_;
        auVar69._24_4_ = fVar295 * fVar173;
        auVar69._28_4_ = uVar11;
        auVar302 = vsubps_avx(auVar69,auVar68);
        fVar238 = local_520._0_4_;
        fVar267 = local_520._4_4_;
        auVar70._4_4_ = fVar194 * fVar267;
        auVar70._0_4_ = fVar193 * fVar238;
        fVar280 = local_520._8_4_;
        auVar70._8_4_ = fVar195 * fVar280;
        fVar348 = local_520._12_4_;
        auVar70._12_4_ = fVar196 * fVar348;
        fVar290 = local_520._16_4_;
        auVar70._16_4_ = fVar198 * fVar290;
        fVar246 = local_520._20_4_;
        auVar70._20_4_ = fVar199 * fVar246;
        fVar201 = local_520._24_4_;
        auVar70._24_4_ = fVar295 * fVar201;
        auVar70._28_4_ = uVar11;
        fVar242 = auVar42._0_4_;
        fVar274 = auVar42._4_4_;
        auVar71._4_4_ = fVar221 * fVar274;
        auVar71._0_4_ = fVar176 * fVar242;
        fVar281 = auVar42._8_4_;
        auVar71._8_4_ = fVar236 * fVar281;
        fVar350 = auVar42._12_4_;
        auVar71._12_4_ = fVar237 * fVar350;
        fVar291 = auVar42._16_4_;
        auVar71._16_4_ = fVar239 * fVar291;
        fVar316 = auVar42._20_4_;
        auVar71._20_4_ = fVar241 * fVar316;
        fVar332 = auVar42._24_4_;
        auVar71._24_4_ = fVar243 * fVar332;
        auVar71._28_4_ = auVar384._28_4_;
        auVar45 = vsubps_avx(auVar71,auVar70);
        auVar72._4_4_ = fVar264 * fVar274;
        auVar72._0_4_ = fVar366 * fVar242;
        auVar72._8_4_ = fVar279 * fVar281;
        auVar72._12_4_ = fVar349 * fVar350;
        auVar72._16_4_ = fVar351 * fVar291;
        auVar72._20_4_ = fVar315 * fVar316;
        auVar72._24_4_ = fVar173 * fVar332;
        auVar72._28_4_ = uVar11;
        auVar392._0_4_ = fVar238 * fVar220;
        auVar392._4_4_ = fVar267 * fVar263;
        auVar392._8_4_ = fVar280 * fVar278;
        auVar392._12_4_ = fVar348 * fVar197;
        auVar392._16_4_ = fVar290 * fVar352;
        auVar392._20_4_ = fVar246 * fVar293;
        auVar392._24_4_ = fVar201 * fVar172;
        auVar392._28_4_ = 0;
        auVar158 = vsubps_avx(auVar392,auVar72);
        auVar159 = vsubps_avx(auVar164,auVar41);
        fVar262 = auVar158._28_4_ + auVar45._28_4_;
        auVar186._0_4_ = auVar158._0_4_ + auVar45._0_4_ * 0.0 + auVar302._0_4_ * 0.0;
        auVar186._4_4_ = auVar158._4_4_ + auVar45._4_4_ * 0.0 + auVar302._4_4_ * 0.0;
        auVar186._8_4_ = auVar158._8_4_ + auVar45._8_4_ * 0.0 + auVar302._8_4_ * 0.0;
        auVar186._12_4_ = auVar158._12_4_ + auVar45._12_4_ * 0.0 + auVar302._12_4_ * 0.0;
        auVar186._16_4_ = auVar158._16_4_ + auVar45._16_4_ * 0.0 + auVar302._16_4_ * 0.0;
        auVar186._20_4_ = auVar158._20_4_ + auVar45._20_4_ * 0.0 + auVar302._20_4_ * 0.0;
        auVar186._24_4_ = auVar158._24_4_ + auVar45._24_4_ * 0.0 + auVar302._24_4_ * 0.0;
        auVar186._28_4_ = fVar262 + auVar302._28_4_;
        fVar245 = auVar38._0_4_;
        fVar266 = auVar38._4_4_;
        auVar73._4_4_ = fVar266 * auVar41._4_4_;
        auVar73._0_4_ = fVar245 * auVar41._0_4_;
        fVar265 = auVar38._8_4_;
        auVar73._8_4_ = fVar265 * auVar41._8_4_;
        fVar294 = auVar38._12_4_;
        auVar73._12_4_ = fVar294 * auVar41._12_4_;
        fVar174 = auVar38._16_4_;
        auVar73._16_4_ = fVar174 * auVar41._16_4_;
        fVar177 = auVar38._20_4_;
        auVar73._20_4_ = fVar177 * auVar41._20_4_;
        fVar178 = auVar38._24_4_;
        auVar73._24_4_ = fVar178 * auVar41._24_4_;
        auVar73._28_4_ = fVar262;
        fVar262 = auVar159._0_4_;
        fVar276 = auVar159._4_4_;
        auVar74._4_4_ = auVar40._4_4_ * fVar276;
        auVar74._0_4_ = auVar40._0_4_ * fVar262;
        fVar367 = auVar159._8_4_;
        auVar74._8_4_ = auVar40._8_4_ * fVar367;
        fVar200 = auVar159._12_4_;
        auVar74._12_4_ = auVar40._12_4_ * fVar200;
        fVar292 = auVar159._16_4_;
        auVar74._16_4_ = auVar40._16_4_ * fVar292;
        fVar154 = auVar159._20_4_;
        auVar74._20_4_ = auVar40._20_4_ * fVar154;
        fVar175 = auVar159._24_4_;
        auVar74._24_4_ = auVar40._24_4_ * fVar175;
        auVar74._28_4_ = auVar158._28_4_;
        auVar45 = vsubps_avx(auVar74,auVar73);
        auVar38 = vsubps_avx(_local_520,auVar39);
        fVar327 = auVar38._0_4_;
        fVar328 = auVar38._4_4_;
        auVar75._4_4_ = fVar328 * auVar41._4_4_;
        auVar75._0_4_ = fVar327 * auVar41._0_4_;
        fVar329 = auVar38._8_4_;
        auVar75._8_4_ = fVar329 * auVar41._8_4_;
        fVar330 = auVar38._12_4_;
        auVar75._12_4_ = fVar330 * auVar41._12_4_;
        fVar331 = auVar38._16_4_;
        auVar75._16_4_ = fVar331 * auVar41._16_4_;
        fVar346 = auVar38._20_4_;
        auVar75._20_4_ = fVar346 * auVar41._20_4_;
        fVar347 = auVar38._24_4_;
        auVar75._24_4_ = fVar347 * auVar41._24_4_;
        auVar75._28_4_ = auVar41._28_4_;
        auVar76._4_4_ = auVar39._4_4_ * fVar276;
        auVar76._0_4_ = auVar39._0_4_ * fVar262;
        auVar76._8_4_ = auVar39._8_4_ * fVar367;
        auVar76._12_4_ = auVar39._12_4_ * fVar200;
        auVar76._16_4_ = auVar39._16_4_ * fVar292;
        auVar76._20_4_ = auVar39._20_4_ * fVar154;
        auVar76._24_4_ = auVar39._24_4_ * fVar175;
        auVar76._28_4_ = auVar302._28_4_;
        auVar302 = vsubps_avx(auVar75,auVar76);
        auVar77._4_4_ = auVar40._4_4_ * fVar328;
        auVar77._0_4_ = auVar40._0_4_ * fVar327;
        auVar77._8_4_ = auVar40._8_4_ * fVar329;
        auVar77._12_4_ = auVar40._12_4_ * fVar330;
        auVar77._16_4_ = auVar40._16_4_ * fVar331;
        auVar77._20_4_ = auVar40._20_4_ * fVar346;
        auVar77._24_4_ = auVar40._24_4_ * fVar347;
        auVar77._28_4_ = auVar41._28_4_;
        auVar78._4_4_ = auVar39._4_4_ * fVar266;
        auVar78._0_4_ = auVar39._0_4_ * fVar245;
        auVar78._8_4_ = auVar39._8_4_ * fVar265;
        auVar78._12_4_ = auVar39._12_4_ * fVar294;
        auVar78._16_4_ = auVar39._16_4_ * fVar174;
        auVar78._20_4_ = auVar39._20_4_ * fVar177;
        auVar78._24_4_ = auVar39._24_4_ * fVar178;
        auVar78._28_4_ = auVar39._28_4_;
        auVar39 = vsubps_avx(auVar78,auVar77);
        auVar255._0_4_ = auVar45._0_4_ * 0.0 + auVar39._0_4_ + auVar302._0_4_ * 0.0;
        auVar255._4_4_ = auVar45._4_4_ * 0.0 + auVar39._4_4_ + auVar302._4_4_ * 0.0;
        auVar255._8_4_ = auVar45._8_4_ * 0.0 + auVar39._8_4_ + auVar302._8_4_ * 0.0;
        auVar255._12_4_ = auVar45._12_4_ * 0.0 + auVar39._12_4_ + auVar302._12_4_ * 0.0;
        auVar255._16_4_ = auVar45._16_4_ * 0.0 + auVar39._16_4_ + auVar302._16_4_ * 0.0;
        auVar255._20_4_ = auVar45._20_4_ * 0.0 + auVar39._20_4_ + auVar302._20_4_ * 0.0;
        auVar255._24_4_ = auVar45._24_4_ * 0.0 + auVar39._24_4_ + auVar302._24_4_ * 0.0;
        auVar255._28_4_ = auVar39._28_4_ + auVar39._28_4_ + auVar302._28_4_;
        auVar39 = vmaxps_avx(auVar186,auVar255);
        auVar39 = vcmpps_avx(auVar39,ZEXT832(0) << 0x20,2);
        auVar271 = vpackssdw_avx(auVar39._0_16_,auVar39._16_16_);
        auVar271 = vpand_avx(auVar271,_local_500);
        auVar208 = vpmovsxwd_avx(auVar271);
        auVar253 = vpunpckhwd_avx(auVar271,auVar271);
        auVar231._16_16_ = auVar253;
        auVar231._0_16_ = auVar208;
        if ((((((((auVar231 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar231 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar231 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar231 >> 0x7f,0) == '\0') &&
              (auVar231 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar253 >> 0x3f,0) == '\0') &&
            (auVar231 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar253[0xf]) {
LAB_0114f081:
          auVar234 = ZEXT3264(auVar231);
          auVar192 = ZEXT3264(CONCAT824(uStack_468,
                                        CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
          auVar171 = ZEXT3264(local_4e0);
        }
        else {
          auVar79._4_4_ = fVar276 * fVar263;
          auVar79._0_4_ = fVar262 * fVar220;
          auVar79._8_4_ = fVar367 * fVar278;
          auVar79._12_4_ = fVar200 * fVar197;
          auVar79._16_4_ = fVar292 * fVar352;
          auVar79._20_4_ = fVar154 * fVar293;
          auVar79._24_4_ = fVar175 * fVar172;
          auVar79._28_4_ = auVar253._12_4_;
          auVar360._0_4_ = fVar245 * fVar193;
          auVar360._4_4_ = fVar266 * fVar194;
          auVar360._8_4_ = fVar265 * fVar195;
          auVar360._12_4_ = fVar294 * fVar196;
          auVar360._16_4_ = fVar174 * fVar198;
          auVar360._20_4_ = fVar177 * fVar199;
          auVar360._24_4_ = fVar178 * fVar295;
          auVar360._28_4_ = 0;
          auVar39 = vsubps_avx(auVar360,auVar79);
          auVar80._4_4_ = fVar328 * fVar194;
          auVar80._0_4_ = fVar327 * fVar193;
          auVar80._8_4_ = fVar329 * fVar195;
          auVar80._12_4_ = fVar330 * fVar196;
          auVar80._16_4_ = fVar331 * fVar198;
          auVar80._20_4_ = fVar346 * fVar199;
          auVar80._24_4_ = fVar347 * fVar295;
          auVar80._28_4_ = auVar43._28_4_;
          auVar81._4_4_ = fVar276 * fVar274;
          auVar81._0_4_ = fVar262 * fVar242;
          auVar81._8_4_ = fVar367 * fVar281;
          auVar81._12_4_ = fVar200 * fVar350;
          auVar81._16_4_ = fVar292 * fVar291;
          auVar81._20_4_ = fVar154 * fVar316;
          auVar81._24_4_ = fVar175 * fVar332;
          auVar81._28_4_ = auVar159._28_4_;
          auVar41 = vsubps_avx(auVar81,auVar80);
          auVar82._4_4_ = fVar266 * fVar274;
          auVar82._0_4_ = fVar245 * fVar242;
          auVar82._8_4_ = fVar265 * fVar281;
          auVar82._12_4_ = fVar294 * fVar350;
          auVar82._16_4_ = fVar174 * fVar291;
          auVar82._20_4_ = fVar177 * fVar316;
          auVar82._24_4_ = fVar178 * fVar332;
          auVar82._28_4_ = auVar186._28_4_;
          auVar83._4_4_ = fVar328 * fVar263;
          auVar83._0_4_ = fVar327 * fVar220;
          auVar83._8_4_ = fVar329 * fVar278;
          auVar83._12_4_ = fVar330 * fVar197;
          auVar83._16_4_ = fVar331 * fVar352;
          auVar83._20_4_ = fVar346 * fVar293;
          auVar83._24_4_ = fVar347 * fVar172;
          auVar83._28_4_ = auVar47._28_4_;
          auVar302 = vsubps_avx(auVar83,auVar82);
          auVar301._0_4_ = auVar39._0_4_ * 0.0 + auVar302._0_4_ + auVar41._0_4_ * 0.0;
          auVar301._4_4_ = auVar39._4_4_ * 0.0 + auVar302._4_4_ + auVar41._4_4_ * 0.0;
          auVar301._8_4_ = auVar39._8_4_ * 0.0 + auVar302._8_4_ + auVar41._8_4_ * 0.0;
          auVar301._12_4_ = auVar39._12_4_ * 0.0 + auVar302._12_4_ + auVar41._12_4_ * 0.0;
          auVar301._16_4_ = auVar39._16_4_ * 0.0 + auVar302._16_4_ + auVar41._16_4_ * 0.0;
          auVar301._20_4_ = auVar39._20_4_ * 0.0 + auVar302._20_4_ + auVar41._20_4_ * 0.0;
          auVar301._24_4_ = auVar39._24_4_ * 0.0 + auVar302._24_4_ + auVar41._24_4_ * 0.0;
          auVar301._28_4_ = auVar47._28_4_ + auVar302._28_4_ + auVar186._28_4_;
          auVar40 = vrcpps_avx(auVar301);
          fVar242 = auVar40._0_4_;
          fVar262 = auVar40._4_4_;
          auVar84._4_4_ = auVar301._4_4_ * fVar262;
          auVar84._0_4_ = auVar301._0_4_ * fVar242;
          fVar263 = auVar40._8_4_;
          auVar84._8_4_ = auVar301._8_4_ * fVar263;
          fVar274 = auVar40._12_4_;
          auVar84._12_4_ = auVar301._12_4_ * fVar274;
          fVar276 = auVar40._16_4_;
          auVar84._16_4_ = auVar301._16_4_ * fVar276;
          fVar278 = auVar40._20_4_;
          auVar84._20_4_ = auVar301._20_4_ * fVar278;
          fVar281 = auVar40._24_4_;
          auVar84._24_4_ = auVar301._24_4_ * fVar281;
          auVar84._28_4_ = auVar159._28_4_;
          auVar361._8_4_ = 0x3f800000;
          auVar361._0_8_ = 0x3f8000003f800000;
          auVar361._12_4_ = 0x3f800000;
          auVar361._16_4_ = 0x3f800000;
          auVar361._20_4_ = 0x3f800000;
          auVar361._24_4_ = 0x3f800000;
          auVar361._28_4_ = 0x3f800000;
          auVar43 = vsubps_avx(auVar361,auVar84);
          fVar242 = auVar43._0_4_ * fVar242 + fVar242;
          fVar262 = auVar43._4_4_ * fVar262 + fVar262;
          fVar263 = auVar43._8_4_ * fVar263 + fVar263;
          fVar274 = auVar43._12_4_ * fVar274 + fVar274;
          fVar276 = auVar43._16_4_ * fVar276 + fVar276;
          fVar278 = auVar43._20_4_ * fVar278 + fVar278;
          fVar281 = auVar43._24_4_ * fVar281 + fVar281;
          auVar85._4_4_ =
               (auVar39._4_4_ * fVar267 + auVar41._4_4_ * fVar264 + auVar302._4_4_ * fVar221) *
               fVar262;
          auVar85._0_4_ =
               (auVar39._0_4_ * fVar238 + auVar41._0_4_ * fVar366 + auVar302._0_4_ * fVar176) *
               fVar242;
          auVar85._8_4_ =
               (auVar39._8_4_ * fVar280 + auVar41._8_4_ * fVar279 + auVar302._8_4_ * fVar236) *
               fVar263;
          auVar85._12_4_ =
               (auVar39._12_4_ * fVar348 + auVar41._12_4_ * fVar349 + auVar302._12_4_ * fVar237) *
               fVar274;
          auVar85._16_4_ =
               (auVar39._16_4_ * fVar290 + auVar41._16_4_ * fVar351 + auVar302._16_4_ * fVar239) *
               fVar276;
          auVar85._20_4_ =
               (auVar39._20_4_ * fVar246 + auVar41._20_4_ * fVar315 + auVar302._20_4_ * fVar241) *
               fVar278;
          auVar85._24_4_ =
               (auVar39._24_4_ * fVar201 + auVar41._24_4_ * fVar173 + auVar302._24_4_ * fVar243) *
               fVar281;
          auVar85._28_4_ = auVar42._28_4_ + auVar164._28_4_;
          auVar208 = vpermilps_avx((undefined1  [16])aVar13,0xff);
          auVar163._16_16_ = auVar208;
          auVar163._0_16_ = auVar208;
          auVar164 = vcmpps_avx(auVar163,auVar85,2);
          fVar220 = (local_7d8->super_RayK<1>).tfar;
          auVar232._4_4_ = fVar220;
          auVar232._0_4_ = fVar220;
          auVar232._8_4_ = fVar220;
          auVar232._12_4_ = fVar220;
          auVar232._16_4_ = fVar220;
          auVar232._20_4_ = fVar220;
          auVar232._24_4_ = fVar220;
          auVar232._28_4_ = fVar220;
          auVar39 = vcmpps_avx(auVar85,auVar232,2);
          auVar164 = vandps_avx(auVar39,auVar164);
          auVar208 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
          auVar271 = vpand_avx(auVar271,auVar208);
          auVar208 = vpmovsxwd_avx(auVar271);
          auVar253 = vpshufd_avx(auVar271,0xee);
          auVar253 = vpmovsxwd_avx(auVar253);
          auVar231._16_16_ = auVar253;
          auVar231._0_16_ = auVar208;
          if ((((((((auVar231 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar231 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar231 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar231 >> 0x7f,0) == '\0') &&
                (auVar231 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar253 >> 0x3f,0) == '\0') &&
              (auVar231 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar253[0xf]) goto LAB_0114f081;
          auVar164 = vcmpps_avx(ZEXT832(0) << 0x20,auVar301,4);
          auVar208 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
          auVar271 = vpand_avx(auVar271,auVar208);
          auVar208 = vpmovsxwd_avx(auVar271);
          auVar234 = ZEXT1664(auVar208);
          auVar271 = vpunpckhwd_avx(auVar271,auVar271);
          auVar288._16_16_ = auVar271;
          auVar288._0_16_ = auVar208;
          auVar192 = ZEXT3264(CONCAT824(uStack_468,
                                        CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
          auVar171 = ZEXT3264(local_4e0);
          if ((((((((auVar288 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar288 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar288 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar288 >> 0x7f,0) != '\0') ||
                (auVar288 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar271 >> 0x3f,0) != '\0') ||
              (auVar288 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar271[0xf] < '\0') {
            auVar86._4_4_ = auVar186._4_4_ * fVar262;
            auVar86._0_4_ = auVar186._0_4_ * fVar242;
            auVar86._8_4_ = auVar186._8_4_ * fVar263;
            auVar86._12_4_ = auVar186._12_4_ * fVar274;
            auVar86._16_4_ = auVar186._16_4_ * fVar276;
            auVar86._20_4_ = auVar186._20_4_ * fVar278;
            auVar86._24_4_ = auVar186._24_4_ * fVar281;
            auVar86._28_4_ = SUB84(uStack_468,4);
            auVar87._4_4_ = auVar255._4_4_ * fVar262;
            auVar87._0_4_ = auVar255._0_4_ * fVar242;
            auVar87._8_4_ = auVar255._8_4_ * fVar263;
            auVar87._12_4_ = auVar255._12_4_ * fVar274;
            auVar87._16_4_ = auVar255._16_4_ * fVar276;
            auVar87._20_4_ = auVar255._20_4_ * fVar278;
            auVar87._24_4_ = auVar255._24_4_ * fVar281;
            auVar87._28_4_ = auVar43._28_4_ + auVar40._28_4_;
            auVar256._8_4_ = 0x3f800000;
            auVar256._0_8_ = 0x3f8000003f800000;
            auVar256._12_4_ = 0x3f800000;
            auVar256._16_4_ = 0x3f800000;
            auVar256._20_4_ = 0x3f800000;
            auVar256._24_4_ = 0x3f800000;
            auVar256._28_4_ = 0x3f800000;
            auVar164 = vsubps_avx(auVar256,auVar86);
            auVar234 = ZEXT3264(auVar164);
            auVar164 = vblendvps_avx(auVar164,auVar86,auVar44);
            auVar171 = ZEXT3264(auVar164);
            auVar164 = vsubps_avx(auVar256,auVar87);
            _local_320 = vblendvps_avx(auVar164,auVar87,auVar44);
            auVar192 = ZEXT3264(auVar288);
            local_460 = auVar85;
          }
        }
        auVar340 = ZEXT3264(auVar337);
        auVar302 = auVar171._0_32_;
        auVar164 = auVar192._0_32_;
        if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar164 >> 0x7f,0) != '\0') ||
              (auVar192 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar164 >> 0xbf,0) != '\0') ||
            (auVar192 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar192[0x1f] < '\0') {
          auVar39 = vsubps_avx(local_5a0,_local_7c0);
          local_7c0._0_4_ = (float)local_7c0._0_4_ + auVar39._0_4_ * auVar171._0_4_;
          local_7c0._4_4_ = (float)local_7c0._4_4_ + auVar39._4_4_ * auVar171._4_4_;
          fStack_7b8 = fStack_7b8 + auVar39._8_4_ * auVar171._8_4_;
          fStack_7b4 = fStack_7b4 + auVar39._12_4_ * auVar171._12_4_;
          fStack_7b0 = fStack_7b0 + auVar39._16_4_ * auVar171._16_4_;
          fStack_7ac = fStack_7ac + auVar39._20_4_ * auVar171._20_4_;
          fStack_7a8 = fStack_7a8 + auVar39._24_4_ * auVar171._24_4_;
          fStack_7a4 = fStack_7a4 + auVar39._28_4_;
          fVar220 = local_788->depth_scale;
          auVar88._4_4_ = ((float)local_7c0._4_4_ + (float)local_7c0._4_4_) * fVar220;
          auVar88._0_4_ = ((float)local_7c0._0_4_ + (float)local_7c0._0_4_) * fVar220;
          auVar88._8_4_ = (fStack_7b8 + fStack_7b8) * fVar220;
          auVar88._12_4_ = (fStack_7b4 + fStack_7b4) * fVar220;
          auVar88._16_4_ = (fStack_7b0 + fStack_7b0) * fVar220;
          auVar88._20_4_ = (fStack_7ac + fStack_7ac) * fVar220;
          auVar88._24_4_ = (fStack_7a8 + fStack_7a8) * fVar220;
          auVar88._28_4_ = fStack_7a4 + fStack_7a4;
          auVar39 = vcmpps_avx(local_460,auVar88,6);
          auVar40 = auVar164 & auVar39;
          if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar40 >> 0x7f,0) != '\0') ||
                (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar40 >> 0xbf,0) != '\0') ||
              (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar40[0x1f] < '\0') {
            auVar234 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_320._0_4_ = (float)local_320._0_4_ + (float)local_320._0_4_ + -1.0;
            local_320._4_4_ = (float)local_320._4_4_ + (float)local_320._4_4_ + -1.0;
            fStack_318 = fStack_318 + fStack_318 + -1.0;
            fStack_314 = fStack_314 + fStack_314 + -1.0;
            uStack_310._0_4_ = (float)uStack_310 + (float)uStack_310 + -1.0;
            uStack_310._4_4_ = uStack_310._4_4_ + uStack_310._4_4_ + -1.0;
            uStack_308._0_4_ = (float)uStack_308 + (float)uStack_308 + -1.0;
            uStack_308._4_4_ = uStack_308._4_4_ + uStack_308._4_4_ + -1.0;
            local_2c0 = auVar302;
            auVar40 = _local_320;
            local_2a0._4_4_ = local_320._4_4_;
            local_2a0._0_4_ = local_320._0_4_;
            fStack_298 = fStack_318;
            fStack_294 = fStack_314;
            fStack_290 = (float)uStack_310;
            fStack_28c = uStack_310._4_4_;
            fStack_288 = (float)uStack_308;
            fStack_284 = uStack_308._4_4_;
            local_280 = local_460;
            local_260 = 0;
            local_25c = uVar34;
            uStack_798 = auVar250._8_8_;
            local_250 = auVar250._0_8_;
            uStack_248 = uStack_798;
            uStack_728 = auVar354._8_8_;
            local_240 = auVar354._0_8_;
            uStack_238 = uStack_728;
            uStack_738 = auVar382._8_8_;
            local_230 = auVar382._0_8_;
            uStack_228 = uStack_738;
            uStack_748 = auVar391._8_8_;
            local_220._8_8_ = uStack_748;
            local_220._0_8_ = auVar391._0_8_;
            _local_320 = auVar40;
            if ((pGVar150->mask & (local_7d8->super_RayK<1>).mask) != 0) {
              auVar164 = vandps_avx(auVar39,auVar164);
              local_4c0 = auVar164;
              auVar205._0_4_ = 1.0 / local_3c0;
              auVar205._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar271 = vshufps_avx(auVar205,auVar205,0);
              local_1e0[0] = auVar271._0_4_ * (auVar171._0_4_ + 0.0);
              local_1e0[1] = auVar271._4_4_ * (auVar171._4_4_ + 1.0);
              local_1e0[2] = auVar271._8_4_ * (auVar171._8_4_ + 2.0);
              local_1e0[3] = auVar271._12_4_ * (auVar171._12_4_ + 3.0);
              fStack_1d0 = auVar271._0_4_ * (auVar171._16_4_ + 4.0);
              fStack_1cc = auVar271._4_4_ * (auVar171._20_4_ + 5.0);
              fStack_1c8 = auVar271._8_4_ * (auVar171._24_4_ + 6.0);
              fStack_1c4 = auVar171._28_4_ + 7.0;
              uStack_308 = auVar40._24_8_;
              local_1c0._16_8_ = uStack_310;
              local_1c0._0_16_ = _local_320;
              local_1c0._24_8_ = uStack_308;
              local_1a0 = local_460;
              auVar187._8_4_ = 0x7f800000;
              auVar187._0_8_ = 0x7f8000007f800000;
              auVar187._12_4_ = 0x7f800000;
              auVar187._16_4_ = 0x7f800000;
              auVar187._20_4_ = 0x7f800000;
              auVar187._24_4_ = 0x7f800000;
              auVar187._28_4_ = 0x7f800000;
              auVar39 = vblendvps_avx(auVar187,local_460,auVar164);
              auVar40 = vshufps_avx(auVar39,auVar39,0xb1);
              auVar40 = vminps_avx(auVar39,auVar40);
              auVar41 = vshufpd_avx(auVar40,auVar40,5);
              auVar40 = vminps_avx(auVar40,auVar41);
              auVar41 = vperm2f128_avx(auVar40,auVar40,1);
              auVar40 = vminps_avx(auVar40,auVar41);
              auVar39 = vcmpps_avx(auVar39,auVar40,0);
              auVar40 = auVar164 & auVar39;
              if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar40 >> 0x7f,0) != '\0') ||
                    (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar40 >> 0xbf,0) != '\0') ||
                  (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar40[0x1f] < '\0') {
                auVar164 = vandps_avx(auVar39,auVar164);
              }
              uVar143 = vmovmskps_avx(auVar164);
              uVar37 = 0;
              if (uVar143 != 0) {
                for (; (uVar143 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                }
              }
              uVar145 = (ulong)uVar37;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar150->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                _local_7c0 = ZEXT432((uint)(local_7d8->super_RayK<1>).tfar);
                local_4e0 = auVar302;
                local_780.ray = (RTCRayN *)local_7d8;
                do {
                  local_684 = local_1e0[uVar145];
                  local_680 = *(undefined4 *)(local_1c0 + uVar145 * 4);
                  (((RayHit *)local_780.ray)->super_RayK<1>).tfar =
                       *(float *)(local_1a0 + uVar145 * 4);
                  local_780.context = context->user;
                  fVar282 = 1.0 - local_684;
                  fVar220 = local_684 * fVar282 * 4.0;
                  auVar271 = ZEXT416((uint)(local_684 * local_684 * 0.5));
                  auVar271 = vshufps_avx(auVar271,auVar271,0);
                  auVar208 = ZEXT416((uint)((fVar282 * fVar282 + fVar220) * 0.5));
                  auVar208 = vshufps_avx(auVar208,auVar208,0);
                  auVar253 = ZEXT416((uint)((-local_684 * local_684 - fVar220) * 0.5));
                  auVar253 = vshufps_avx(auVar253,auVar253,0);
                  auVar223 = ZEXT416((uint)(fVar282 * -fVar282 * 0.5));
                  auVar223 = vshufps_avx(auVar223,auVar223,0);
                  auVar211._0_4_ =
                       auVar223._0_4_ * (float)local_7a0._0_4_ +
                       auVar253._0_4_ * (float)local_730._0_4_ +
                       auVar271._0_4_ * (float)local_750._0_4_ +
                       auVar208._0_4_ * (float)local_740._0_4_;
                  auVar211._4_4_ =
                       auVar223._4_4_ * (float)local_7a0._4_4_ +
                       auVar253._4_4_ * (float)local_730._4_4_ +
                       auVar271._4_4_ * (float)local_750._4_4_ +
                       auVar208._4_4_ * (float)local_740._4_4_;
                  auVar211._8_4_ =
                       auVar223._8_4_ * (float)uStack_798 +
                       auVar253._8_4_ * (float)uStack_728 +
                       auVar271._8_4_ * (float)uStack_748 + auVar208._8_4_ * (float)uStack_738;
                  auVar211._12_4_ =
                       auVar223._12_4_ * uStack_798._4_4_ +
                       auVar253._12_4_ * uStack_728._4_4_ +
                       auVar271._12_4_ * uStack_748._4_4_ + auVar208._12_4_ * uStack_738._4_4_;
                  local_690 = vmovlps_avx(auVar211);
                  local_688 = vextractps_avx(auVar211,2);
                  local_67c = (int)local_7c8;
                  local_678 = (int)local_7d0;
                  local_674 = (local_780.context)->instID[0];
                  local_670 = (local_780.context)->instPrimID[0];
                  local_7dc = -1;
                  local_780.valid = &local_7dc;
                  local_780.geometryUserPtr = pGVar150->userPtr;
                  local_780.hit = (RTCHitN *)&local_690;
                  local_780.N = 1;
                  pRVar147 = (RayHit *)local_780.ray;
                  if (pGVar150->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0114f298:
                    p_Var36 = context->args->filter;
                    if ((p_Var36 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar150->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var36)(&local_780);
                      auVar340 = ZEXT3264(_local_660);
                      auVar171 = ZEXT3264(local_4e0);
                      pRVar147 = local_7d8;
                      fVar368 = (float)local_720._0_4_;
                      fVar374 = (float)local_720._4_4_;
                      fVar376 = fStack_718;
                      fVar378 = fStack_714;
                      fVar304 = fStack_710;
                      fVar305 = fStack_70c;
                      fVar240 = fStack_708;
                      fVar244 = fStack_704;
                      fVar202 = (float)local_700._0_4_;
                      fVar216 = (float)local_700._4_4_;
                      fVar217 = fStack_6f8;
                      fVar218 = fStack_6f4;
                      fVar247 = fStack_6f0;
                      fVar258 = fStack_6ec;
                      fVar260 = fStack_6e8;
                      fVar261 = fStack_6e4;
                      if (*local_780.valid == 0) goto LAB_0114f354;
                    }
                    (((Vec3f *)((long)local_780.ray + 0x30))->field_0).components[0] =
                         *(float *)local_780.hit;
                    (((Vec3f *)((long)local_780.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_780.hit + 4);
                    (((Vec3f *)((long)local_780.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_780.hit + 8);
                    *(float *)((long)local_780.ray + 0x3c) = *(float *)(local_780.hit + 0xc);
                    *(float *)((long)local_780.ray + 0x40) = *(float *)(local_780.hit + 0x10);
                    *(float *)((long)local_780.ray + 0x44) = *(float *)(local_780.hit + 0x14);
                    *(float *)((long)local_780.ray + 0x48) = *(float *)(local_780.hit + 0x18);
                    *(float *)((long)local_780.ray + 0x4c) = *(float *)(local_780.hit + 0x1c);
                    *(float *)((long)local_780.ray + 0x50) = *(float *)(local_780.hit + 0x20);
                    local_780.ray = (RTCRayN *)pRVar147;
                  }
                  else {
                    (*pGVar150->intersectionFilterN)(&local_780);
                    auVar340 = ZEXT3264(_local_660);
                    auVar171 = ZEXT3264(local_4e0);
                    pRVar147 = local_7d8;
                    fVar368 = (float)local_720._0_4_;
                    fVar374 = (float)local_720._4_4_;
                    fVar376 = fStack_718;
                    fVar378 = fStack_714;
                    fVar304 = fStack_710;
                    fVar305 = fStack_70c;
                    fVar240 = fStack_708;
                    fVar244 = fStack_704;
                    fVar202 = (float)local_700._0_4_;
                    fVar216 = (float)local_700._4_4_;
                    fVar217 = fStack_6f8;
                    fVar218 = fStack_6f4;
                    fVar247 = fStack_6f0;
                    fVar258 = fStack_6ec;
                    fVar260 = fStack_6e8;
                    fVar261 = fStack_6e4;
                    if (*local_780.valid != 0) goto LAB_0114f298;
LAB_0114f354:
                    (local_7d8->super_RayK<1>).tfar = (float)local_7c0._0_4_;
                    local_780.ray = (RTCRayN *)local_7d8;
                  }
                  auVar337 = auVar340._0_32_;
                  *(undefined4 *)(local_4c0 + uVar145 * 4) = 0;
                  auVar40 = local_4c0;
                  _local_7c0 = *(undefined1 (*) [32])
                                &(((RayHit *)local_780.ray)->super_RayK<1>).tfar;
                  auVar234 = ZEXT3264(_local_7c0);
                  fVar220 = (((RayHit *)local_780.ray)->super_RayK<1>).tfar;
                  auVar170._4_4_ = fVar220;
                  auVar170._0_4_ = fVar220;
                  auVar170._8_4_ = fVar220;
                  auVar170._12_4_ = fVar220;
                  auVar170._16_4_ = fVar220;
                  auVar170._20_4_ = fVar220;
                  auVar170._24_4_ = fVar220;
                  auVar170._28_4_ = fVar220;
                  auVar39 = vcmpps_avx(local_460,auVar170,2);
                  auVar164 = vandps_avx(auVar39,local_4c0);
                  local_4c0 = auVar164;
                  auVar40 = auVar40 & auVar39;
                  ray = (RayHit *)local_780.ray;
                  auVar302 = auVar171._0_32_;
                  fVar268 = (float)local_6c0._0_4_;
                  fVar275 = (float)local_6c0._4_4_;
                  fVar277 = fStack_6b8;
                  fVar155 = fStack_6b4;
                  fVar282 = fStack_6b0;
                  fVar235 = fStack_6ac;
                  fVar219 = fStack_6a8;
                  if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar40 >> 0x7f,0) == '\0') &&
                        (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar40 >> 0xbf,0) == '\0') &&
                      (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar40[0x1f]) goto LAB_0114e0dd;
                  auVar191._8_4_ = 0x7f800000;
                  auVar191._0_8_ = 0x7f8000007f800000;
                  auVar191._12_4_ = 0x7f800000;
                  auVar191._16_4_ = 0x7f800000;
                  auVar191._20_4_ = 0x7f800000;
                  auVar191._24_4_ = 0x7f800000;
                  auVar191._28_4_ = 0x7f800000;
                  auVar39 = vblendvps_avx(auVar191,local_460,auVar164);
                  auVar40 = vshufps_avx(auVar39,auVar39,0xb1);
                  auVar40 = vminps_avx(auVar39,auVar40);
                  auVar41 = vshufpd_avx(auVar40,auVar40,5);
                  auVar40 = vminps_avx(auVar40,auVar41);
                  auVar41 = vperm2f128_avx(auVar40,auVar40,1);
                  auVar40 = vminps_avx(auVar40,auVar41);
                  auVar39 = vcmpps_avx(auVar39,auVar40,0);
                  auVar40 = auVar164 & auVar39;
                  if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar40 >> 0x7f,0) != '\0') ||
                        (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar40 >> 0xbf,0) != '\0') ||
                      (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar40[0x1f] < '\0') {
                    auVar164 = vandps_avx(auVar39,auVar164);
                  }
                  uVar144 = vmovmskps_avx(auVar164);
                  uVar146 = 0;
                  if (uVar144 != 0) {
                    for (; (uVar144 >> uVar146 & 1) == 0; uVar146 = uVar146 + 1) {
                    }
                  }
                  uVar145 = (ulong)uVar146;
                } while( true );
              }
              fVar220 = local_1e0[uVar145];
              fVar366 = *(float *)(local_1c0 + uVar145 * 4);
              fVar242 = 1.0 - fVar220;
              fVar238 = fVar220 * fVar242 * 4.0;
              auVar271 = ZEXT416((uint)(fVar220 * fVar220 * 0.5));
              auVar271 = vshufps_avx(auVar271,auVar271,0);
              auVar208 = ZEXT416((uint)((fVar242 * fVar242 + fVar238) * 0.5));
              auVar208 = vshufps_avx(auVar208,auVar208,0);
              auVar253 = ZEXT416((uint)((-fVar220 * fVar220 - fVar238) * 0.5));
              auVar253 = vshufps_avx(auVar253,auVar253,0);
              auVar223 = ZEXT416((uint)(fVar242 * -fVar242 * 0.5));
              auVar223 = vshufps_avx(auVar223,auVar223,0);
              auVar206._0_4_ =
                   auVar223._0_4_ * fVar248 +
                   auVar253._0_4_ * fVar353 + auVar271._0_4_ * fVar389 + auVar208._0_4_ * fVar380;
              auVar206._4_4_ =
                   auVar223._4_4_ * fVar259 +
                   auVar253._4_4_ * fVar365 + auVar271._4_4_ * fVar394 + auVar208._4_4_ * fVar385;
              auVar206._8_4_ =
                   auVar223._8_4_ * auVar250._8_4_ +
                   auVar253._8_4_ * auVar354._8_4_ +
                   auVar271._8_4_ * auVar391._8_4_ + auVar208._8_4_ * auVar382._8_4_;
              auVar206._12_4_ =
                   auVar223._12_4_ * auVar250._12_4_ +
                   auVar253._12_4_ * auVar354._12_4_ +
                   auVar271._12_4_ * auVar391._12_4_ + auVar208._12_4_ * auVar382._12_4_;
              auVar234 = ZEXT464((uint)*(float *)(local_1a0 + uVar145 * 4));
              (local_7d8->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar145 * 4);
              uVar12 = vmovlps_avx(auVar206);
              *(undefined8 *)&(local_7d8->Ng).field_0 = uVar12;
              fVar238 = (float)vextractps_avx(auVar206,2);
              (local_7d8->Ng).field_0.field_0.z = fVar238;
              local_7d8->u = fVar220;
              local_7d8->v = fVar366;
              local_7d8->primID = uVar144;
              local_7d8->geomID = uVar146;
              local_7d8->instID[0] = context->user->instID[0];
              local_7d8->instPrimID[0] = context->user->instPrimID[0];
            }
          }
        }
      }
LAB_0114e0dd:
      local_4e0 = auVar302;
      auVar192 = ZEXT1664(local_6e0._0_16_);
      if (8 < (int)uVar34) {
        _local_660 = auVar337;
        _local_580 = vpshufd_avx(ZEXT416(uVar34),0);
        auVar271 = vshufps_avx(local_6e0._0_16_,local_6e0._0_16_,0);
        local_300._16_16_ = auVar271;
        local_300._0_16_ = auVar271;
        auVar271 = vpermilps_avx(local_3a0._0_16_,0xff);
        local_100._16_16_ = auVar271;
        local_100._0_16_ = auVar271;
        auVar157._0_4_ = 1.0 / local_3c0;
        auVar157._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar271 = vshufps_avx(auVar157,auVar157,0);
        register0x00001210 = auVar271;
        _local_120 = auVar271;
        auVar171 = ZEXT3264(_local_120);
        lVar153 = 8;
        fVar220 = (float)local_5c0._0_4_;
        fVar366 = (float)local_5c0._4_4_;
        fVar238 = fStack_5b8;
        fVar242 = fStack_5b4;
        fVar262 = fStack_5b0;
        fVar263 = fStack_5ac;
        fVar264 = fStack_5a8;
        fVar267 = fStack_5a4;
        fVar274 = (float)local_600._0_4_;
        fVar276 = (float)local_600._4_4_;
        fVar278 = fStack_5f8;
        fVar279 = fStack_5f4;
        fVar280 = fStack_5f0;
        fVar281 = fStack_5ec;
        fVar367 = fStack_5e8;
LAB_0114e1c7:
        pauVar9 = (undefined1 (*) [28])(bspline_basis0 + lVar153 * 4 + lVar151);
        fVar197 = *(float *)*pauVar9;
        fVar349 = *(float *)(*pauVar9 + 4);
        fVar348 = *(float *)(*pauVar9 + 8);
        fVar350 = *(float *)(*pauVar9 + 0xc);
        fVar200 = *(float *)(*pauVar9 + 0x10);
        fVar352 = *(float *)(*pauVar9 + 0x14);
        fVar351 = *(float *)(*pauVar9 + 0x18);
        auVar139 = *pauVar9;
        pauVar9 = (undefined1 (*) [28])(lVar151 + 0x21aefac + lVar153 * 4);
        fVar290 = *(float *)*pauVar9;
        fVar291 = *(float *)(*pauVar9 + 4);
        fVar292 = *(float *)(*pauVar9 + 8);
        fVar293 = *(float *)(*pauVar9 + 0xc);
        fVar315 = *(float *)(*pauVar9 + 0x10);
        fVar246 = *(float *)(*pauVar9 + 0x14);
        fVar316 = *(float *)(*pauVar9 + 0x18);
        auVar138 = *pauVar9;
        pauVar9 = (undefined1 (*) [28])(lVar151 + 0x21af430 + lVar153 * 4);
        fVar154 = *(float *)*pauVar9;
        fVar172 = *(float *)(*pauVar9 + 4);
        fVar173 = *(float *)(*pauVar9 + 8);
        fVar201 = *(float *)(*pauVar9 + 0xc);
        fVar332 = *(float *)(*pauVar9 + 0x10);
        fVar175 = *(float *)(*pauVar9 + 0x14);
        fVar176 = *(float *)(*pauVar9 + 0x18);
        auVar137 = *pauVar9;
        pfVar1 = (float *)(lVar151 + 0x21af8b4 + lVar153 * 4);
        fVar221 = *pfVar1;
        fVar236 = pfVar1[1];
        fVar237 = pfVar1[2];
        fVar239 = pfVar1[3];
        fVar241 = pfVar1[4];
        fVar243 = pfVar1[5];
        fVar245 = pfVar1[6];
        fVar266 = auVar234._28_4_;
        fStack_7a4 = fVar266 + fVar266 + auVar171._28_4_;
        fVar265 = fVar266 + fVar266 + pfVar1[7];
        auVar324._0_4_ =
             (float)local_360._0_4_ * fVar197 +
             fVar368 * fVar290 + fVar274 * fVar154 + (float)local_400._0_4_ * fVar221;
        auVar324._4_4_ =
             (float)local_360._4_4_ * fVar349 +
             fVar374 * fVar291 + fVar276 * fVar172 + (float)local_400._4_4_ * fVar236;
        auVar324._8_4_ =
             fStack_358 * fVar348 + fVar376 * fVar292 + fVar278 * fVar173 + fStack_3f8 * fVar237;
        auVar324._12_4_ =
             fStack_354 * fVar350 + fVar378 * fVar293 + fVar279 * fVar201 + fStack_3f4 * fVar239;
        auVar324._16_4_ =
             fStack_350 * fVar200 + fVar304 * fVar315 + fVar280 * fVar332 + fStack_3f0 * fVar241;
        auVar324._20_4_ =
             fStack_34c * fVar352 + fVar305 * fVar246 + fVar281 * fVar175 + fStack_3ec * fVar243;
        auVar324._24_4_ =
             fStack_348 * fVar351 + fVar240 * fVar316 + fVar367 * fVar176 + fStack_3e8 * fVar245;
        auVar324._28_4_ = fVar266 + pfVar1[7] + fStack_7a4;
        local_6e0._0_4_ =
             (float)local_380._0_4_ * fVar197 +
             fVar268 * fVar290 + fVar202 * fVar154 + fVar220 * fVar221;
        local_6e0._4_4_ =
             (float)local_380._4_4_ * fVar349 +
             fVar275 * fVar291 + fVar216 * fVar172 + fVar366 * fVar236;
        local_6e0._8_4_ =
             fStack_378 * fVar348 + fVar277 * fVar292 + fVar217 * fVar173 + fVar238 * fVar237;
        local_6e0._12_4_ =
             fStack_374 * fVar350 + fVar155 * fVar293 + fVar218 * fVar201 + fVar242 * fVar239;
        local_6e0._16_4_ =
             fStack_370 * fVar200 + fVar282 * fVar315 + fVar247 * fVar332 + fVar262 * fVar241;
        local_6e0._20_4_ =
             fStack_36c * fVar352 + fVar235 * fVar246 + fVar258 * fVar175 + fVar263 * fVar243;
        local_6e0._24_4_ =
             fStack_368 * fVar351 + fVar219 * fVar316 + fVar260 * fVar176 + fVar264 * fVar245;
        local_6e0._28_4_ = fStack_7a4 + fVar266 + fVar266 + auVar192._28_4_;
        local_7c0._0_4_ =
             fVar197 * (float)local_160._0_4_ +
             (float)local_c0._0_4_ * fVar290 +
             fVar154 * (float)local_140._0_4_ + (float)local_a0._0_4_ * fVar221;
        local_7c0._4_4_ =
             fVar349 * (float)local_160._4_4_ +
             (float)local_c0._4_4_ * fVar291 +
             fVar172 * (float)local_140._4_4_ + (float)local_a0._4_4_ * fVar236;
        fStack_7b8 = fVar348 * fStack_158 +
                     fStack_b8 * fVar292 + fVar173 * fStack_138 + fStack_98 * fVar237;
        fStack_7b4 = fVar350 * fStack_154 +
                     fStack_b4 * fVar293 + fVar201 * fStack_134 + fStack_94 * fVar239;
        fStack_7b0 = fVar200 * fStack_150 +
                     fStack_b0 * fVar315 + fVar332 * fStack_130 + fStack_90 * fVar241;
        fStack_7ac = fVar352 * fStack_14c +
                     fStack_ac * fVar246 + fVar175 * fStack_12c + fStack_8c * fVar243;
        fStack_7a8 = fVar351 * fStack_148 +
                     fStack_a8 * fVar316 + fVar176 * fStack_128 + fStack_88 * fVar245;
        fStack_7a4 = fStack_7a4 + fVar265;
        pauVar9 = (undefined1 (*) [28])(bspline_basis1 + lVar153 * 4 + lVar151);
        fVar274 = *(float *)*pauVar9;
        fVar276 = *(float *)(*pauVar9 + 4);
        fVar278 = *(float *)(*pauVar9 + 8);
        fVar279 = *(float *)(*pauVar9 + 0xc);
        fVar280 = *(float *)(*pauVar9 + 0x10);
        fVar281 = *(float *)(*pauVar9 + 0x14);
        fVar367 = *(float *)(*pauVar9 + 0x18);
        auVar141 = *pauVar9;
        pfVar1 = (float *)(lVar151 + 0x21b13cc + lVar153 * 4);
        fVar197 = *pfVar1;
        fVar349 = pfVar1[1];
        fVar348 = pfVar1[2];
        fVar350 = pfVar1[3];
        fVar200 = pfVar1[4];
        fVar352 = pfVar1[5];
        fVar351 = pfVar1[6];
        auVar164 = *(undefined1 (*) [32])(lVar151 + 0x21b1850 + lVar153 * 4);
        pauVar9 = (undefined1 (*) [28])(lVar151 + 0x21b1cd4 + lVar153 * 4);
        fVar290 = *(float *)*pauVar9;
        fVar291 = *(float *)(*pauVar9 + 4);
        fVar292 = *(float *)(*pauVar9 + 8);
        fVar293 = *(float *)(*pauVar9 + 0xc);
        fVar315 = *(float *)(*pauVar9 + 0x10);
        fVar246 = *(float *)(*pauVar9 + 0x14);
        fVar316 = *(float *)(*pauVar9 + 0x18);
        auVar140 = *pauVar9;
        auVar171 = ZEXT3264(auVar164);
        fVar154 = auVar164._0_4_;
        fVar172 = auVar164._4_4_;
        fVar173 = auVar164._8_4_;
        fVar201 = auVar164._12_4_;
        fVar332 = auVar164._16_4_;
        fVar175 = auVar164._20_4_;
        fVar176 = auVar164._24_4_;
        fVar294 = fVar267 + fStack_84;
        fVar266 = fVar267 + fVar267 + fVar265;
        auVar362._0_4_ =
             (float)local_360._0_4_ * fVar274 +
             fVar368 * fVar197 + fVar154 * (float)local_600._0_4_ + (float)local_400._0_4_ * fVar290
        ;
        auVar362._4_4_ =
             (float)local_360._4_4_ * fVar276 +
             fVar374 * fVar349 + fVar172 * (float)local_600._4_4_ + (float)local_400._4_4_ * fVar291
        ;
        auVar362._8_4_ =
             fStack_358 * fVar278 + fVar376 * fVar348 + fVar173 * fStack_5f8 + fStack_3f8 * fVar292;
        auVar362._12_4_ =
             fStack_354 * fVar279 + fVar378 * fVar350 + fVar201 * fStack_5f4 + fStack_3f4 * fVar293;
        auVar362._16_4_ =
             fStack_350 * fVar280 + fVar304 * fVar200 + fVar332 * fStack_5f0 + fStack_3f0 * fVar315;
        auVar362._20_4_ =
             fStack_34c * fVar281 + fVar305 * fVar352 + fVar175 * fStack_5ec + fStack_3ec * fVar246;
        auVar362._24_4_ =
             fStack_348 * fVar367 + fVar240 * fVar351 + fVar176 * fStack_5e8 + fStack_3e8 * fVar316;
        auVar362._28_4_ = fVar294 + fVar266;
        local_3a0._0_4_ =
             fVar274 * (float)local_380._0_4_ +
             fVar268 * fVar197 + fVar202 * fVar154 + fVar220 * fVar290;
        local_3a0._4_4_ =
             fVar276 * (float)local_380._4_4_ +
             fVar275 * fVar349 + fVar216 * fVar172 + fVar366 * fVar291;
        local_3a0._8_4_ =
             fVar278 * fStack_378 + fVar277 * fVar348 + fVar217 * fVar173 + fVar238 * fVar292;
        local_3a0._12_4_ =
             fVar279 * fStack_374 + fVar155 * fVar350 + fVar218 * fVar201 + fVar242 * fVar293;
        local_3a0._16_4_ =
             fVar280 * fStack_370 + fVar282 * fVar200 + fVar247 * fVar332 + fVar262 * fVar315;
        local_3a0._20_4_ =
             fVar281 * fStack_36c + fVar235 * fVar352 + fVar258 * fVar175 + fVar263 * fVar246;
        local_3a0._24_4_ =
             fVar367 * fStack_368 + fVar219 * fVar351 + fVar260 * fVar176 + fVar264 * fVar316;
        local_3a0._28_4_ = fVar266 + fVar267 + fVar267 + fVar244;
        auVar303._0_4_ =
             (float)local_c0._0_4_ * fVar197 +
             fVar154 * (float)local_140._0_4_ + (float)local_a0._0_4_ * fVar290 +
             fVar274 * (float)local_160._0_4_;
        auVar303._4_4_ =
             (float)local_c0._4_4_ * fVar349 +
             fVar172 * (float)local_140._4_4_ + (float)local_a0._4_4_ * fVar291 +
             fVar276 * (float)local_160._4_4_;
        auVar303._8_4_ =
             fStack_b8 * fVar348 + fVar173 * fStack_138 + fStack_98 * fVar292 + fVar278 * fStack_158
        ;
        auVar303._12_4_ =
             fStack_b4 * fVar350 + fVar201 * fStack_134 + fStack_94 * fVar293 + fVar279 * fStack_154
        ;
        auVar303._16_4_ =
             fStack_b0 * fVar200 + fVar332 * fStack_130 + fStack_90 * fVar315 + fVar280 * fStack_150
        ;
        auVar303._20_4_ =
             fStack_ac * fVar352 + fVar175 * fStack_12c + fStack_8c * fVar246 + fVar281 * fStack_14c
        ;
        auVar303._24_4_ =
             fStack_a8 * fVar351 + fVar176 * fStack_128 + fStack_88 * fVar316 + fVar367 * fStack_148
        ;
        auVar303._28_4_ = fVar267 + fVar294 + fVar266;
        auVar40 = vsubps_avx(auVar362,auVar324);
        auVar41 = vsubps_avx(local_3a0,local_6e0);
        fVar305 = auVar40._0_4_;
        fVar240 = auVar40._4_4_;
        auVar89._4_4_ = fVar240 * local_6e0._4_4_;
        auVar89._0_4_ = fVar305 * local_6e0._0_4_;
        fVar242 = auVar40._8_4_;
        auVar89._8_4_ = fVar242 * local_6e0._8_4_;
        fVar244 = auVar40._12_4_;
        auVar89._12_4_ = fVar244 * local_6e0._12_4_;
        fVar262 = auVar40._16_4_;
        auVar89._16_4_ = fVar262 * local_6e0._16_4_;
        fVar263 = auVar40._20_4_;
        auVar89._20_4_ = fVar263 * local_6e0._20_4_;
        fVar264 = auVar40._24_4_;
        auVar89._24_4_ = fVar264 * local_6e0._24_4_;
        auVar89._28_4_ = fVar266;
        fVar220 = auVar41._0_4_;
        fVar282 = auVar41._4_4_;
        auVar90._4_4_ = auVar324._4_4_ * fVar282;
        auVar90._0_4_ = auVar324._0_4_ * fVar220;
        fVar235 = auVar41._8_4_;
        auVar90._8_4_ = auVar324._8_4_ * fVar235;
        fVar366 = auVar41._12_4_;
        auVar90._12_4_ = auVar324._12_4_ * fVar366;
        fVar219 = auVar41._16_4_;
        auVar90._16_4_ = auVar324._16_4_ * fVar219;
        fVar304 = auVar41._20_4_;
        auVar90._20_4_ = auVar324._20_4_ * fVar304;
        fVar238 = auVar41._24_4_;
        auVar90._24_4_ = auVar324._24_4_ * fVar238;
        auVar90._28_4_ = local_3a0._28_4_;
        auVar42 = vsubps_avx(auVar89,auVar90);
        auVar192 = ZEXT3264(_local_7c0);
        auVar39 = vmaxps_avx(_local_7c0,auVar303);
        auVar91._4_4_ = auVar39._4_4_ * auVar39._4_4_ * (fVar240 * fVar240 + fVar282 * fVar282);
        auVar91._0_4_ = auVar39._0_4_ * auVar39._0_4_ * (fVar305 * fVar305 + fVar220 * fVar220);
        auVar91._8_4_ = auVar39._8_4_ * auVar39._8_4_ * (fVar242 * fVar242 + fVar235 * fVar235);
        auVar91._12_4_ = auVar39._12_4_ * auVar39._12_4_ * (fVar244 * fVar244 + fVar366 * fVar366);
        auVar91._16_4_ = auVar39._16_4_ * auVar39._16_4_ * (fVar262 * fVar262 + fVar219 * fVar219);
        auVar91._20_4_ = auVar39._20_4_ * auVar39._20_4_ * (fVar263 * fVar263 + fVar304 * fVar304);
        auVar91._24_4_ = auVar39._24_4_ * auVar39._24_4_ * (fVar264 * fVar264 + fVar238 * fVar238);
        auVar91._28_4_ = fVar294 + local_3a0._28_4_;
        auVar92._4_4_ = auVar42._4_4_ * auVar42._4_4_;
        auVar92._0_4_ = auVar42._0_4_ * auVar42._0_4_;
        auVar92._8_4_ = auVar42._8_4_ * auVar42._8_4_;
        auVar92._12_4_ = auVar42._12_4_ * auVar42._12_4_;
        auVar92._16_4_ = auVar42._16_4_ * auVar42._16_4_;
        auVar92._20_4_ = auVar42._20_4_ * auVar42._20_4_;
        auVar92._24_4_ = auVar42._24_4_ * auVar42._24_4_;
        auVar92._28_4_ = auVar42._28_4_;
        auVar39 = vcmpps_avx(auVar92,auVar91,2);
        local_260 = (uint)lVar153;
        auVar208 = vpshufd_avx(ZEXT416(local_260),0);
        auVar271 = vpor_avx(auVar208,_DAT_01f7fcf0);
        auVar208 = vpor_avx(auVar208,_DAT_01fafea0);
        auVar271 = vpcmpgtd_avx(_local_580,auVar271);
        auVar208 = vpcmpgtd_avx(_local_580,auVar208);
        register0x000012d0 = auVar208;
        _local_420 = auVar271;
        auVar234 = ZEXT3264(_local_420);
        auVar42 = _local_420 & auVar39;
        fVar220 = (float)local_5c0._0_4_;
        fVar366 = (float)local_5c0._4_4_;
        fVar238 = fStack_5b8;
        fVar242 = fStack_5b4;
        fVar262 = fStack_5b0;
        fVar263 = fStack_5ac;
        fVar264 = fStack_5a8;
        fVar267 = fStack_5a4;
        fVar274 = (float)local_600._0_4_;
        fVar276 = (float)local_600._4_4_;
        fVar278 = fStack_5f8;
        fVar279 = fStack_5f4;
        fVar280 = fStack_5f0;
        fVar281 = fStack_5ec;
        fVar367 = fStack_5e8;
        fVar368 = (float)local_720._0_4_;
        fVar374 = (float)local_720._4_4_;
        fVar376 = fStack_718;
        fVar378 = fStack_714;
        fVar304 = fStack_710;
        fVar305 = fStack_70c;
        fVar240 = fStack_708;
        fVar244 = fStack_704;
        if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar42 >> 0x7f,0) != '\0') ||
              (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar42 >> 0xbf,0) != '\0') ||
            (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar42[0x1f] < '\0') {
          local_5e0._0_4_ = auVar141._0_4_;
          local_5e0._4_4_ = auVar141._4_4_;
          fStack_5d8 = auVar141._8_4_;
          fStack_5d4 = auVar141._12_4_;
          fStack_5d0 = auVar141._16_4_;
          fStack_5cc = auVar141._20_4_;
          fStack_5c8 = auVar141._24_4_;
          fVar282 = (float)local_660._0_4_ * (float)local_5e0._0_4_;
          fVar235 = (float)local_660._4_4_ * (float)local_5e0._4_4_;
          fVar219 = fStack_658 * fStack_5d8;
          fVar290 = fStack_654 * fStack_5d4;
          fVar291 = fStack_650 * fStack_5d0;
          fVar292 = fStack_64c * fStack_5cc;
          fVar293 = fStack_648 * fStack_5c8;
          _local_5e0 = auVar303;
          local_560._0_4_ = auVar140._0_4_;
          local_560._4_4_ = auVar140._4_4_;
          fStack_558 = auVar140._8_4_;
          fStack_554 = auVar140._12_4_;
          fStack_550 = auVar140._16_4_;
          fStack_54c = auVar140._20_4_;
          fStack_548 = auVar140._24_4_;
          local_560._0_4_ =
               fVar282 + fVar197 * (float)local_340._0_4_ +
                         (float)local_2e0._0_4_ * fVar154 +
                         (float)local_620._0_4_ * (float)local_560._0_4_;
          local_560._4_4_ =
               fVar235 + fVar349 * (float)local_340._4_4_ +
                         (float)local_2e0._4_4_ * fVar172 +
                         (float)local_620._4_4_ * (float)local_560._4_4_;
          fStack_558 = fVar219 + fVar348 * fStack_338 +
                                 fStack_2d8 * fVar173 + fStack_618 * fStack_558;
          fStack_554 = fVar290 + fVar350 * fStack_334 +
                                 fStack_2d4 * fVar201 + fStack_614 * fStack_554;
          fStack_550 = fVar291 + fVar200 * fStack_330 +
                                 fStack_2d0 * fVar332 + fStack_610 * fStack_550;
          fStack_54c = fVar292 + fVar352 * fStack_32c +
                                 fStack_2cc * fVar175 + fStack_60c * fStack_54c;
          fStack_548 = fVar293 + fVar351 * fStack_328 +
                                 fStack_2c8 * fVar176 + fStack_608 * fStack_548;
          fStack_544 = auVar324._28_4_ + auVar164._28_4_ + fStack_644 + 0.0;
          local_520._0_4_ = auVar138._0_4_;
          local_520._4_4_ = auVar138._4_4_;
          fStack_518 = auVar138._8_4_;
          fStack_514 = auVar138._12_4_;
          fStack_510 = auVar138._16_4_;
          fStack_50c = auVar138._20_4_;
          fStack_508 = auVar138._24_4_;
          fVar155 = (float)local_340._0_4_ * (float)local_520._0_4_;
          fVar266 = (float)local_340._4_4_ * (float)local_520._4_4_;
          fVar265 = fStack_338 * fStack_518;
          fVar294 = fStack_334 * fStack_514;
          fVar174 = fStack_330 * fStack_510;
          fVar248 = fStack_32c * fStack_50c;
          fVar177 = fStack_328 * fStack_508;
          local_540._0_4_ = auVar137._0_4_;
          local_540._4_4_ = auVar137._4_4_;
          fStack_538 = auVar137._8_4_;
          fStack_534 = auVar137._12_4_;
          fStack_530 = auVar137._16_4_;
          fStack_52c = auVar137._20_4_;
          fStack_528 = auVar137._24_4_;
          fVar178 = (float)local_2e0._0_4_ * (float)local_540._0_4_;
          fVar193 = (float)local_2e0._4_4_ * (float)local_540._4_4_;
          fVar194 = fStack_2d8 * fStack_538;
          fVar195 = fStack_2d4 * fStack_534;
          fVar196 = fStack_2d0 * fStack_530;
          fVar198 = fStack_2cc * fStack_52c;
          fVar199 = fStack_2c8 * fStack_528;
          pfVar2 = (float *)(lVar151 + 0x21b0640 + lVar153 * 4);
          fVar282 = *pfVar2;
          fVar235 = pfVar2[1];
          fVar219 = pfVar2[2];
          fVar197 = pfVar2[3];
          fVar349 = pfVar2[4];
          fVar348 = pfVar2[5];
          fVar350 = pfVar2[6];
          pfVar3 = (float *)(lVar151 + 0x21b0ac4 + lVar153 * 4);
          fVar200 = *pfVar3;
          fVar352 = pfVar3[1];
          fVar351 = pfVar3[2];
          fVar290 = pfVar3[3];
          fVar291 = pfVar3[4];
          fVar292 = pfVar3[5];
          fVar293 = pfVar3[6];
          _local_540 = auVar362;
          pfVar4 = (float *)(lVar151 + 0x21b01bc + lVar153 * 4);
          fVar315 = *pfVar4;
          fVar246 = pfVar4[1];
          fVar316 = pfVar4[2];
          fVar154 = pfVar4[3];
          fVar172 = pfVar4[4];
          fVar173 = pfVar4[5];
          fVar201 = pfVar4[6];
          fVar259 = pfVar2[7] + pfVar3[7];
          fStack_3a4 = pfVar3[7] + fVar261 + 0.0;
          fVar295 = fVar261 + pfVar1[7] + fVar261 + 0.0;
          pfVar1 = (float *)(lVar151 + 0x21afd38 + lVar153 * 4);
          fVar261 = *pfVar1;
          fVar332 = pfVar1[1];
          fVar175 = pfVar1[2];
          fVar176 = pfVar1[3];
          fVar268 = pfVar1[4];
          fVar275 = pfVar1[5];
          fVar277 = pfVar1[6];
          local_440 = fVar261 * (float)local_360._0_4_ +
                      fVar315 * (float)local_720._0_4_ +
                      (float)local_600._0_4_ * fVar282 + (float)local_400._0_4_ * fVar200;
          fStack_43c = fVar332 * (float)local_360._4_4_ +
                       fVar246 * (float)local_720._4_4_ +
                       (float)local_600._4_4_ * fVar235 + (float)local_400._4_4_ * fVar352;
          fStack_438 = fVar175 * fStack_358 +
                       fVar316 * fStack_718 + fStack_5f8 * fVar219 + fStack_3f8 * fVar351;
          fStack_434 = fVar176 * fStack_354 +
                       fVar154 * fStack_714 + fStack_5f4 * fVar197 + fStack_3f4 * fVar290;
          fStack_430 = fVar268 * fStack_350 +
                       fVar172 * fStack_710 + fStack_5f0 * fVar349 + fStack_3f0 * fVar291;
          fStack_42c = fVar275 * fStack_34c +
                       fVar173 * fStack_70c + fStack_5ec * fVar348 + fStack_3ec * fVar292;
          fStack_428 = fVar277 * fStack_348 +
                       fVar201 * fStack_708 + fStack_5e8 * fVar350 + fStack_3e8 * fVar293;
          fStack_424 = fVar259 + fStack_3a4;
          local_3c0 = fVar261 * (float)local_380._0_4_ +
                      fVar202 * fVar282 + (float)local_5c0._0_4_ * fVar200 +
                      (float)local_6c0._0_4_ * fVar315;
          fStack_3bc = fVar332 * (float)local_380._4_4_ +
                       fVar216 * fVar235 + (float)local_5c0._4_4_ * fVar352 +
                       (float)local_6c0._4_4_ * fVar246;
          fStack_3b8 = fVar175 * fStack_378 +
                       fVar217 * fVar219 + fStack_5b8 * fVar351 + fStack_6b8 * fVar316;
          fStack_3b4 = fVar176 * fStack_374 +
                       fVar218 * fVar197 + fStack_5b4 * fVar290 + fStack_6b4 * fVar154;
          fStack_3b0 = fVar268 * fStack_370 +
                       fVar247 * fVar349 + fStack_5b0 * fVar291 + fStack_6b0 * fVar172;
          fStack_3ac = fVar275 * fStack_36c +
                       fVar258 * fVar348 + fStack_5ac * fVar292 + fStack_6ac * fVar173;
          fStack_3a8 = fVar277 * fStack_368 +
                       fVar260 * fVar350 + fStack_5a8 * fVar293 + fStack_6a8 * fVar201;
          fStack_3a4 = fStack_3a4 + fVar295;
          auVar372._0_4_ =
               fVar315 * (float)local_340._0_4_ +
               (float)local_2e0._0_4_ * fVar282 + (float)local_620._0_4_ * fVar200 +
               fVar261 * (float)local_660._0_4_;
          auVar372._4_4_ =
               fVar246 * (float)local_340._4_4_ +
               (float)local_2e0._4_4_ * fVar235 + (float)local_620._4_4_ * fVar352 +
               fVar332 * (float)local_660._4_4_;
          auVar372._8_4_ =
               fVar316 * fStack_338 + fStack_2d8 * fVar219 + fStack_618 * fVar351 +
               fVar175 * fStack_658;
          auVar372._12_4_ =
               fVar154 * fStack_334 + fStack_2d4 * fVar197 + fStack_614 * fVar290 +
               fVar176 * fStack_654;
          auVar372._16_4_ =
               fVar172 * fStack_330 + fStack_2d0 * fVar349 + fStack_610 * fVar291 +
               fVar268 * fStack_650;
          auVar372._20_4_ =
               fVar173 * fStack_32c + fStack_2cc * fVar348 + fStack_60c * fVar292 +
               fVar275 * fStack_64c;
          auVar372._24_4_ =
               fVar201 * fStack_328 + fStack_2c8 * fVar350 + fStack_608 * fVar293 +
               fVar277 * fStack_648;
          auVar372._28_4_ = pfVar4[7] + fVar259 + fVar295;
          pfVar1 = (float *)(lVar151 + 0x21b2a60 + lVar153 * 4);
          fVar282 = *pfVar1;
          fVar235 = pfVar1[1];
          fVar219 = pfVar1[2];
          fVar261 = pfVar1[3];
          fVar197 = pfVar1[4];
          fVar349 = pfVar1[5];
          fVar348 = pfVar1[6];
          pfVar2 = (float *)(lVar151 + 0x21b2ee4 + lVar153 * 4);
          fVar350 = *pfVar2;
          fVar200 = pfVar2[1];
          fVar352 = pfVar2[2];
          fVar351 = pfVar2[3];
          fVar290 = pfVar2[4];
          fVar291 = pfVar2[5];
          fVar292 = pfVar2[6];
          _local_520 = auVar39;
          pfVar3 = (float *)(lVar151 + 0x21b25dc + lVar153 * 4);
          fVar293 = *pfVar3;
          fVar315 = pfVar3[1];
          fVar246 = pfVar3[2];
          fVar316 = pfVar3[3];
          fVar154 = pfVar3[4];
          fVar172 = pfVar3[5];
          fVar173 = pfVar3[6];
          pfVar4 = (float *)(lVar151 + 0x21b2158 + lVar153 * 4);
          fVar201 = *pfVar4;
          fVar332 = pfVar4[1];
          fVar175 = pfVar4[2];
          fVar176 = pfVar4[3];
          fVar268 = pfVar4[4];
          fVar275 = pfVar4[5];
          fVar277 = pfVar4[6];
          auVar325._0_4_ =
               fVar201 * (float)local_360._0_4_ +
               fVar293 * (float)local_720._0_4_ +
               (float)local_600._0_4_ * fVar282 + (float)local_400._0_4_ * fVar350;
          auVar325._4_4_ =
               fVar332 * (float)local_360._4_4_ +
               fVar315 * (float)local_720._4_4_ +
               (float)local_600._4_4_ * fVar235 + (float)local_400._4_4_ * fVar200;
          auVar325._8_4_ =
               fVar175 * fStack_358 +
               fVar246 * fStack_718 + fStack_5f8 * fVar219 + fStack_3f8 * fVar352;
          auVar325._12_4_ =
               fVar176 * fStack_354 +
               fVar316 * fStack_714 + fStack_5f4 * fVar261 + fStack_3f4 * fVar351;
          auVar325._16_4_ =
               fVar268 * fStack_350 +
               fVar154 * fStack_710 + fStack_5f0 * fVar197 + fStack_3f0 * fVar290;
          auVar325._20_4_ =
               fVar275 * fStack_34c +
               fVar172 * fStack_70c + fStack_5ec * fVar349 + fStack_3ec * fVar291;
          auVar325._24_4_ =
               fVar277 * fStack_348 +
               fVar173 * fStack_708 + fStack_5e8 * fVar348 + fStack_3e8 * fVar292;
          auVar325._28_4_ = fStack_5a4 + fStack_5a4 + fStack_3e4 + fStack_3a4;
          auVar363._0_4_ =
               fVar201 * (float)local_380._0_4_ +
               (float)local_6c0._0_4_ * fVar293 +
               fVar202 * fVar282 + (float)local_5c0._0_4_ * fVar350;
          auVar363._4_4_ =
               fVar332 * (float)local_380._4_4_ +
               (float)local_6c0._4_4_ * fVar315 +
               fVar216 * fVar235 + (float)local_5c0._4_4_ * fVar200;
          auVar363._8_4_ =
               fVar175 * fStack_378 +
               fStack_6b8 * fVar246 + fVar217 * fVar219 + fStack_5b8 * fVar352;
          auVar363._12_4_ =
               fVar176 * fStack_374 +
               fStack_6b4 * fVar316 + fVar218 * fVar261 + fStack_5b4 * fVar351;
          auVar363._16_4_ =
               fVar268 * fStack_370 +
               fStack_6b0 * fVar154 + fVar247 * fVar197 + fStack_5b0 * fVar290;
          auVar363._20_4_ =
               fVar275 * fStack_36c +
               fStack_6ac * fVar172 + fVar258 * fVar349 + fStack_5ac * fVar291;
          auVar363._24_4_ =
               fVar277 * fStack_368 +
               fStack_6a8 * fVar173 + fVar260 * fVar348 + fStack_5a8 * fVar292;
          auVar363._28_4_ = fStack_5a4 + fStack_5a4 + fStack_5e4 + fStack_5a4;
          auVar273._8_4_ = 0x7fffffff;
          auVar273._0_8_ = 0x7fffffff7fffffff;
          auVar273._12_4_ = 0x7fffffff;
          auVar273._16_4_ = 0x7fffffff;
          auVar273._20_4_ = 0x7fffffff;
          auVar273._24_4_ = 0x7fffffff;
          auVar273._28_4_ = 0x7fffffff;
          auVar135._4_4_ = fStack_43c;
          auVar135._0_4_ = local_440;
          auVar135._8_4_ = fStack_438;
          auVar135._12_4_ = fStack_434;
          auVar135._16_4_ = fStack_430;
          auVar135._20_4_ = fStack_42c;
          auVar135._24_4_ = fStack_428;
          auVar135._28_4_ = fStack_424;
          auVar164 = vandps_avx(auVar135,auVar273);
          auVar136._4_4_ = fStack_3bc;
          auVar136._0_4_ = local_3c0;
          auVar136._8_4_ = fStack_3b8;
          auVar136._12_4_ = fStack_3b4;
          auVar136._16_4_ = fStack_3b0;
          auVar136._20_4_ = fStack_3ac;
          auVar136._24_4_ = fStack_3a8;
          auVar136._28_4_ = fStack_3a4;
          auVar42 = vandps_avx(auVar136,auVar273);
          auVar42 = vmaxps_avx(auVar164,auVar42);
          auVar164 = vandps_avx(auVar372,auVar273);
          auVar42 = vmaxps_avx(auVar42,auVar164);
          auVar42 = vcmpps_avx(auVar42,local_300,1);
          auVar302 = vblendvps_avx(auVar135,auVar40,auVar42);
          auVar166._0_4_ =
               fVar201 * (float)local_660._0_4_ +
               fVar293 * (float)local_340._0_4_ +
               fVar350 * (float)local_620._0_4_ + (float)local_2e0._0_4_ * fVar282;
          auVar166._4_4_ =
               fVar332 * (float)local_660._4_4_ +
               fVar315 * (float)local_340._4_4_ +
               fVar200 * (float)local_620._4_4_ + (float)local_2e0._4_4_ * fVar235;
          auVar166._8_4_ =
               fVar175 * fStack_658 +
               fVar246 * fStack_338 + fVar352 * fStack_618 + fStack_2d8 * fVar219;
          auVar166._12_4_ =
               fVar176 * fStack_654 +
               fVar316 * fStack_334 + fVar351 * fStack_614 + fStack_2d4 * fVar261;
          auVar166._16_4_ =
               fVar268 * fStack_650 +
               fVar154 * fStack_330 + fVar290 * fStack_610 + fStack_2d0 * fVar197;
          auVar166._20_4_ =
               fVar275 * fStack_64c +
               fVar172 * fStack_32c + fVar291 * fStack_60c + fStack_2cc * fVar349;
          auVar166._24_4_ =
               fVar277 * fStack_648 +
               fVar173 * fStack_328 + fVar292 * fStack_608 + fStack_2c8 * fVar348;
          auVar166._28_4_ = auVar164._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar43 = vblendvps_avx(auVar136,auVar41,auVar42);
          auVar164 = vandps_avx(auVar325,auVar273);
          auVar42 = vandps_avx(auVar363,auVar273);
          auVar44 = vmaxps_avx(auVar164,auVar42);
          auVar164 = vandps_avx(auVar166,auVar273);
          auVar164 = vmaxps_avx(auVar44,auVar164);
          local_500._0_4_ = auVar139._0_4_;
          local_500._4_4_ = auVar139._4_4_;
          fStack_4f8 = auVar139._8_4_;
          fStack_4f4 = auVar139._12_4_;
          auStack_4f0._0_4_ = auVar139._16_4_;
          auStack_4f0._4_4_ = auVar139._20_4_;
          fStack_4e8 = auVar139._24_4_;
          auVar42 = vcmpps_avx(auVar164,local_300,1);
          auVar164 = vblendvps_avx(auVar325,auVar40,auVar42);
          auVar167._0_4_ =
               (float)local_660._0_4_ * (float)local_500._0_4_ +
               fVar155 + fVar178 + (float)local_620._0_4_ * fVar221;
          auVar167._4_4_ =
               (float)local_660._4_4_ * (float)local_500._4_4_ +
               fVar266 + fVar193 + (float)local_620._4_4_ * fVar236;
          auVar167._8_4_ = fStack_658 * fStack_4f8 + fVar265 + fVar194 + fStack_618 * fVar237;
          auVar167._12_4_ = fStack_654 * fStack_4f4 + fVar294 + fVar195 + fStack_614 * fVar239;
          auVar167._16_4_ =
               fStack_650 * (float)auStack_4f0._0_4_ + fVar174 + fVar196 + fStack_610 * fVar241;
          auVar167._20_4_ =
               fStack_64c * (float)auStack_4f0._4_4_ + fVar248 + fVar198 + fStack_60c * fVar243;
          auVar167._24_4_ = fStack_648 * fStack_4e8 + fVar177 + fVar199 + fStack_608 * fVar245;
          auVar167._28_4_ = auVar44._28_4_ + fStack_544 + fStack_644 + 0.0;
          auVar42 = vblendvps_avx(auVar363,auVar41,auVar42);
          fVar268 = auVar302._0_4_;
          fVar275 = auVar302._4_4_;
          fVar277 = auVar302._8_4_;
          fVar155 = auVar302._12_4_;
          fVar202 = auVar302._16_4_;
          fVar216 = auVar302._20_4_;
          fVar217 = auVar302._24_4_;
          fVar218 = auVar302._28_4_;
          fVar290 = auVar164._0_4_;
          fVar292 = auVar164._4_4_;
          fVar315 = auVar164._8_4_;
          fVar316 = auVar164._12_4_;
          fVar172 = auVar164._16_4_;
          fVar201 = auVar164._20_4_;
          fVar175 = auVar164._24_4_;
          fVar282 = auVar43._0_4_;
          fVar219 = auVar43._4_4_;
          fVar258 = auVar43._8_4_;
          fVar261 = auVar43._12_4_;
          fVar349 = auVar43._16_4_;
          fVar350 = auVar43._20_4_;
          fVar352 = auVar43._24_4_;
          auVar339._0_4_ = fVar282 * fVar282 + fVar268 * fVar268;
          auVar339._4_4_ = fVar219 * fVar219 + fVar275 * fVar275;
          auVar339._8_4_ = fVar258 * fVar258 + fVar277 * fVar277;
          auVar339._12_4_ = fVar261 * fVar261 + fVar155 * fVar155;
          auVar339._16_4_ = fVar349 * fVar349 + fVar202 * fVar202;
          auVar339._20_4_ = fVar350 * fVar350 + fVar216 * fVar216;
          auVar339._24_4_ = fVar352 * fVar352 + fVar217 * fVar217;
          auVar339._28_4_ = auVar40._28_4_ + auVar41._28_4_;
          auVar40 = vrsqrtps_avx(auVar339);
          fVar235 = auVar40._0_4_;
          fVar247 = auVar40._4_4_;
          auVar93._4_4_ = fVar247 * 1.5;
          auVar93._0_4_ = fVar235 * 1.5;
          fVar260 = auVar40._8_4_;
          auVar93._8_4_ = fVar260 * 1.5;
          fVar197 = auVar40._12_4_;
          auVar93._12_4_ = fVar197 * 1.5;
          fVar348 = auVar40._16_4_;
          auVar93._16_4_ = fVar348 * 1.5;
          fVar200 = auVar40._20_4_;
          auVar93._20_4_ = fVar200 * 1.5;
          fVar351 = auVar40._24_4_;
          auVar93._24_4_ = fVar351 * 1.5;
          auVar93._28_4_ = auVar363._28_4_;
          auVar94._4_4_ = fVar247 * fVar247 * fVar247 * auVar339._4_4_ * 0.5;
          auVar94._0_4_ = fVar235 * fVar235 * fVar235 * auVar339._0_4_ * 0.5;
          auVar94._8_4_ = fVar260 * fVar260 * fVar260 * auVar339._8_4_ * 0.5;
          auVar94._12_4_ = fVar197 * fVar197 * fVar197 * auVar339._12_4_ * 0.5;
          auVar94._16_4_ = fVar348 * fVar348 * fVar348 * auVar339._16_4_ * 0.5;
          auVar94._20_4_ = fVar200 * fVar200 * fVar200 * auVar339._20_4_ * 0.5;
          auVar94._24_4_ = fVar351 * fVar351 * fVar351 * auVar339._24_4_ * 0.5;
          auVar94._28_4_ = auVar339._28_4_;
          auVar41 = vsubps_avx(auVar93,auVar94);
          fVar221 = auVar41._0_4_;
          fVar236 = auVar41._4_4_;
          fVar237 = auVar41._8_4_;
          fVar239 = auVar41._12_4_;
          fVar241 = auVar41._16_4_;
          fVar243 = auVar41._20_4_;
          fVar245 = auVar41._24_4_;
          fVar235 = auVar42._0_4_;
          fVar247 = auVar42._4_4_;
          fVar260 = auVar42._8_4_;
          fVar197 = auVar42._12_4_;
          fVar348 = auVar42._16_4_;
          fVar200 = auVar42._20_4_;
          fVar351 = auVar42._24_4_;
          auVar313._0_4_ = fVar235 * fVar235 + fVar290 * fVar290;
          auVar313._4_4_ = fVar247 * fVar247 + fVar292 * fVar292;
          auVar313._8_4_ = fVar260 * fVar260 + fVar315 * fVar315;
          auVar313._12_4_ = fVar197 * fVar197 + fVar316 * fVar316;
          auVar313._16_4_ = fVar348 * fVar348 + fVar172 * fVar172;
          auVar313._20_4_ = fVar200 * fVar200 + fVar201 * fVar201;
          auVar313._24_4_ = fVar351 * fVar351 + fVar175 * fVar175;
          auVar313._28_4_ = auVar40._28_4_ + auVar164._28_4_;
          auVar164 = vrsqrtps_avx(auVar313);
          fVar291 = auVar164._0_4_;
          fVar293 = auVar164._4_4_;
          auVar95._4_4_ = fVar293 * 1.5;
          auVar95._0_4_ = fVar291 * 1.5;
          fVar246 = auVar164._8_4_;
          auVar95._8_4_ = fVar246 * 1.5;
          fVar154 = auVar164._12_4_;
          auVar95._12_4_ = fVar154 * 1.5;
          fVar173 = auVar164._16_4_;
          auVar95._16_4_ = fVar173 * 1.5;
          fVar332 = auVar164._20_4_;
          auVar95._20_4_ = fVar332 * 1.5;
          fVar176 = auVar164._24_4_;
          auVar95._24_4_ = fVar176 * 1.5;
          auVar95._28_4_ = auVar363._28_4_;
          auVar96._4_4_ = fVar293 * fVar293 * fVar293 * auVar313._4_4_ * 0.5;
          auVar96._0_4_ = fVar291 * fVar291 * fVar291 * auVar313._0_4_ * 0.5;
          auVar96._8_4_ = fVar246 * fVar246 * fVar246 * auVar313._8_4_ * 0.5;
          auVar96._12_4_ = fVar154 * fVar154 * fVar154 * auVar313._12_4_ * 0.5;
          auVar96._16_4_ = fVar173 * fVar173 * fVar173 * auVar313._16_4_ * 0.5;
          auVar96._20_4_ = fVar332 * fVar332 * fVar332 * auVar313._20_4_ * 0.5;
          auVar96._24_4_ = fVar176 * fVar176 * fVar176 * auVar313._24_4_ * 0.5;
          auVar96._28_4_ = auVar313._28_4_;
          auVar40 = vsubps_avx(auVar95,auVar96);
          fVar291 = auVar40._0_4_;
          fVar293 = auVar40._4_4_;
          fVar246 = auVar40._8_4_;
          fVar154 = auVar40._12_4_;
          fVar173 = auVar40._16_4_;
          fVar332 = auVar40._20_4_;
          fVar176 = auVar40._24_4_;
          fVar282 = (float)local_7c0._0_4_ * fVar221 * fVar282;
          fVar219 = (float)local_7c0._4_4_ * fVar236 * fVar219;
          auVar97._4_4_ = fVar219;
          auVar97._0_4_ = fVar282;
          fVar258 = fStack_7b8 * fVar237 * fVar258;
          auVar97._8_4_ = fVar258;
          fVar261 = fStack_7b4 * fVar239 * fVar261;
          auVar97._12_4_ = fVar261;
          fVar349 = fStack_7b0 * fVar241 * fVar349;
          auVar97._16_4_ = fVar349;
          fVar350 = fStack_7ac * fVar243 * fVar350;
          auVar97._20_4_ = fVar350;
          fVar352 = fStack_7a8 * fVar245 * fVar352;
          auVar97._24_4_ = fVar352;
          auVar97._28_4_ = auVar164._28_4_;
          local_500._4_4_ = fVar219 + auVar324._4_4_;
          local_500._0_4_ = fVar282 + auVar324._0_4_;
          fStack_4f8 = fVar258 + auVar324._8_4_;
          fStack_4f4 = fVar261 + auVar324._12_4_;
          auStack_4f0._0_4_ = fVar349 + auVar324._16_4_;
          auStack_4f0._4_4_ = fVar350 + auVar324._20_4_;
          fStack_4e8 = fVar352 + auVar324._24_4_;
          fStack_4e4 = auVar164._28_4_ + auVar324._28_4_;
          local_640 = (float)local_7c0._0_4_ * fVar221 * -fVar268;
          fStack_63c = (float)local_7c0._4_4_ * fVar236 * -fVar275;
          auVar98._4_4_ = fStack_63c;
          auVar98._0_4_ = local_640;
          fStack_638 = fStack_7b8 * fVar237 * -fVar277;
          auVar98._8_4_ = fStack_638;
          fStack_634 = fStack_7b4 * fVar239 * -fVar155;
          auVar98._12_4_ = fStack_634;
          fStack_630 = fStack_7b0 * fVar241 * -fVar202;
          auVar98._16_4_ = fStack_630;
          fStack_62c = fStack_7ac * fVar243 * -fVar216;
          auVar98._20_4_ = fStack_62c;
          fStack_628 = fStack_7a8 * fVar245 * -fVar217;
          auVar98._24_4_ = fStack_628;
          auVar98._28_4_ = -fVar218;
          local_640 = local_6e0._0_4_ + local_640;
          fStack_63c = local_6e0._4_4_ + fStack_63c;
          fStack_638 = local_6e0._8_4_ + fStack_638;
          fStack_634 = local_6e0._12_4_ + fStack_634;
          fStack_630 = local_6e0._16_4_ + fStack_630;
          fStack_62c = local_6e0._20_4_ + fStack_62c;
          fStack_628 = local_6e0._24_4_ + fStack_628;
          fStack_624 = local_6e0._28_4_ + -fVar218;
          fVar282 = fVar221 * 0.0 * (float)local_7c0._0_4_;
          fVar219 = fVar236 * 0.0 * (float)local_7c0._4_4_;
          auVar99._4_4_ = fVar219;
          auVar99._0_4_ = fVar282;
          fVar258 = fVar237 * 0.0 * fStack_7b8;
          auVar99._8_4_ = fVar258;
          fVar261 = fVar239 * 0.0 * fStack_7b4;
          auVar99._12_4_ = fVar261;
          fVar349 = fVar241 * 0.0 * fStack_7b0;
          auVar99._16_4_ = fVar349;
          fVar350 = fVar243 * 0.0 * fStack_7ac;
          auVar99._20_4_ = fVar350;
          fVar352 = fVar245 * 0.0 * fStack_7a8;
          auVar99._24_4_ = fVar352;
          auVar99._28_4_ = fVar218;
          auVar44 = vsubps_avx(auVar324,auVar97);
          auVar393._0_4_ = fVar282 + auVar167._0_4_;
          auVar393._4_4_ = fVar219 + auVar167._4_4_;
          auVar393._8_4_ = fVar258 + auVar167._8_4_;
          auVar393._12_4_ = fVar261 + auVar167._12_4_;
          auVar393._16_4_ = fVar349 + auVar167._16_4_;
          auVar393._20_4_ = fVar350 + auVar167._20_4_;
          auVar393._24_4_ = fVar352 + auVar167._24_4_;
          auVar393._28_4_ = fVar218 + auVar167._28_4_;
          fVar282 = auVar303._0_4_ * fVar291 * fVar235;
          fVar235 = auVar303._4_4_ * fVar293 * fVar247;
          auVar100._4_4_ = fVar235;
          auVar100._0_4_ = fVar282;
          fVar219 = auVar303._8_4_ * fVar246 * fVar260;
          auVar100._8_4_ = fVar219;
          fVar247 = auVar303._12_4_ * fVar154 * fVar197;
          auVar100._12_4_ = fVar247;
          fVar258 = auVar303._16_4_ * fVar173 * fVar348;
          auVar100._16_4_ = fVar258;
          fVar260 = auVar303._20_4_ * fVar332 * fVar200;
          auVar100._20_4_ = fVar260;
          fVar261 = auVar303._24_4_ * fVar176 * fVar351;
          auVar100._24_4_ = fVar261;
          auVar100._28_4_ = fStack_7a4;
          auVar158 = vsubps_avx(local_6e0,auVar98);
          auVar373._0_4_ = auVar362._0_4_ + fVar282;
          auVar373._4_4_ = auVar362._4_4_ + fVar235;
          auVar373._8_4_ = auVar362._8_4_ + fVar219;
          auVar373._12_4_ = auVar362._12_4_ + fVar247;
          auVar373._16_4_ = auVar362._16_4_ + fVar258;
          auVar373._20_4_ = auVar362._20_4_ + fVar260;
          auVar373._24_4_ = auVar362._24_4_ + fVar261;
          auVar373._28_4_ = auVar362._28_4_ + fStack_7a4;
          fVar282 = fVar291 * -fVar290 * auVar303._0_4_;
          fVar235 = fVar293 * -fVar292 * auVar303._4_4_;
          auVar101._4_4_ = fVar235;
          auVar101._0_4_ = fVar282;
          fVar219 = fVar246 * -fVar315 * auVar303._8_4_;
          auVar101._8_4_ = fVar219;
          fVar247 = fVar154 * -fVar316 * auVar303._12_4_;
          auVar101._12_4_ = fVar247;
          fVar258 = fVar173 * -fVar172 * auVar303._16_4_;
          auVar101._16_4_ = fVar258;
          fVar260 = fVar332 * -fVar201 * auVar303._20_4_;
          auVar101._20_4_ = fVar260;
          fVar261 = fVar176 * -fVar175 * auVar303._24_4_;
          auVar101._24_4_ = fVar261;
          auVar101._28_4_ = auVar324._28_4_;
          auVar159 = vsubps_avx(auVar167,auVar99);
          auVar257._0_4_ = local_3a0._0_4_ + fVar282;
          auVar257._4_4_ = local_3a0._4_4_ + fVar235;
          auVar257._8_4_ = local_3a0._8_4_ + fVar219;
          auVar257._12_4_ = local_3a0._12_4_ + fVar247;
          auVar257._16_4_ = local_3a0._16_4_ + fVar258;
          auVar257._20_4_ = local_3a0._20_4_ + fVar260;
          auVar257._24_4_ = local_3a0._24_4_ + fVar261;
          auVar257._28_4_ = local_3a0._28_4_ + auVar324._28_4_;
          fVar282 = fVar291 * 0.0 * auVar303._0_4_;
          fVar235 = fVar293 * 0.0 * auVar303._4_4_;
          auVar102._4_4_ = fVar235;
          auVar102._0_4_ = fVar282;
          fVar219 = fVar246 * 0.0 * auVar303._8_4_;
          auVar102._8_4_ = fVar219;
          fVar247 = fVar154 * 0.0 * auVar303._12_4_;
          auVar102._12_4_ = fVar247;
          fVar258 = fVar173 * 0.0 * auVar303._16_4_;
          auVar102._16_4_ = fVar258;
          fVar260 = fVar332 * 0.0 * auVar303._20_4_;
          auVar102._20_4_ = fVar260;
          fVar261 = fVar176 * 0.0 * auVar303._24_4_;
          auVar102._24_4_ = fVar261;
          auVar102._28_4_ = auVar167._28_4_;
          auVar164 = vsubps_avx(auVar362,auVar100);
          auVar326._0_4_ = (float)local_560._0_4_ + fVar282;
          auVar326._4_4_ = (float)local_560._4_4_ + fVar235;
          auVar326._8_4_ = fStack_558 + fVar219;
          auVar326._12_4_ = fStack_554 + fVar247;
          auVar326._16_4_ = fStack_550 + fVar258;
          auVar326._20_4_ = fStack_54c + fVar260;
          auVar326._24_4_ = fStack_548 + fVar261;
          auVar326._28_4_ = fStack_544 + auVar167._28_4_;
          auVar41 = vsubps_avx(local_3a0,auVar101);
          auVar42 = vsubps_avx(_local_560,auVar102);
          auVar302 = vsubps_avx(auVar257,auVar158);
          auVar43 = vsubps_avx(auVar326,auVar159);
          auVar103._4_4_ = auVar159._4_4_ * auVar302._4_4_;
          auVar103._0_4_ = auVar159._0_4_ * auVar302._0_4_;
          auVar103._8_4_ = auVar159._8_4_ * auVar302._8_4_;
          auVar103._12_4_ = auVar159._12_4_ * auVar302._12_4_;
          auVar103._16_4_ = auVar159._16_4_ * auVar302._16_4_;
          auVar103._20_4_ = auVar159._20_4_ * auVar302._20_4_;
          auVar103._24_4_ = auVar159._24_4_ * auVar302._24_4_;
          auVar103._28_4_ = auVar363._28_4_;
          auVar104._4_4_ = auVar158._4_4_ * auVar43._4_4_;
          auVar104._0_4_ = auVar158._0_4_ * auVar43._0_4_;
          auVar104._8_4_ = auVar158._8_4_ * auVar43._8_4_;
          auVar104._12_4_ = auVar158._12_4_ * auVar43._12_4_;
          auVar104._16_4_ = auVar158._16_4_ * auVar43._16_4_;
          auVar104._20_4_ = auVar158._20_4_ * auVar43._20_4_;
          auVar104._24_4_ = auVar158._24_4_ * auVar43._24_4_;
          auVar104._28_4_ = local_3a0._28_4_;
          auVar45 = vsubps_avx(auVar104,auVar103);
          auVar105._4_4_ = auVar44._4_4_ * auVar43._4_4_;
          auVar105._0_4_ = auVar44._0_4_ * auVar43._0_4_;
          auVar105._8_4_ = auVar44._8_4_ * auVar43._8_4_;
          auVar105._12_4_ = auVar44._12_4_ * auVar43._12_4_;
          auVar105._16_4_ = auVar44._16_4_ * auVar43._16_4_;
          auVar105._20_4_ = auVar44._20_4_ * auVar43._20_4_;
          auVar105._24_4_ = auVar44._24_4_ * auVar43._24_4_;
          auVar105._28_4_ = auVar43._28_4_;
          auVar43 = vsubps_avx(auVar373,auVar44);
          auVar106._4_4_ = auVar159._4_4_ * auVar43._4_4_;
          auVar106._0_4_ = auVar159._0_4_ * auVar43._0_4_;
          auVar106._8_4_ = auVar159._8_4_ * auVar43._8_4_;
          auVar106._12_4_ = auVar159._12_4_ * auVar43._12_4_;
          auVar106._16_4_ = auVar159._16_4_ * auVar43._16_4_;
          auVar106._20_4_ = auVar159._20_4_ * auVar43._20_4_;
          auVar106._24_4_ = auVar159._24_4_ * auVar43._24_4_;
          auVar106._28_4_ = auVar40._28_4_;
          auVar47 = vsubps_avx(auVar106,auVar105);
          auVar107._4_4_ = auVar158._4_4_ * auVar43._4_4_;
          auVar107._0_4_ = auVar158._0_4_ * auVar43._0_4_;
          auVar107._8_4_ = auVar158._8_4_ * auVar43._8_4_;
          auVar107._12_4_ = auVar158._12_4_ * auVar43._12_4_;
          auVar107._16_4_ = auVar158._16_4_ * auVar43._16_4_;
          auVar107._20_4_ = auVar158._20_4_ * auVar43._20_4_;
          auVar107._24_4_ = auVar158._24_4_ * auVar43._24_4_;
          auVar107._28_4_ = auVar40._28_4_;
          auVar108._4_4_ = auVar44._4_4_ * auVar302._4_4_;
          auVar108._0_4_ = auVar44._0_4_ * auVar302._0_4_;
          auVar108._8_4_ = auVar44._8_4_ * auVar302._8_4_;
          auVar108._12_4_ = auVar44._12_4_ * auVar302._12_4_;
          auVar108._16_4_ = auVar44._16_4_ * auVar302._16_4_;
          auVar108._20_4_ = auVar44._20_4_ * auVar302._20_4_;
          auVar108._24_4_ = auVar44._24_4_ * auVar302._24_4_;
          auVar108._28_4_ = auVar302._28_4_;
          auVar40 = vsubps_avx(auVar108,auVar107);
          auVar188._0_4_ = auVar45._0_4_ * 0.0 + auVar40._0_4_ + auVar47._0_4_ * 0.0;
          auVar188._4_4_ = auVar45._4_4_ * 0.0 + auVar40._4_4_ + auVar47._4_4_ * 0.0;
          auVar188._8_4_ = auVar45._8_4_ * 0.0 + auVar40._8_4_ + auVar47._8_4_ * 0.0;
          auVar188._12_4_ = auVar45._12_4_ * 0.0 + auVar40._12_4_ + auVar47._12_4_ * 0.0;
          auVar188._16_4_ = auVar45._16_4_ * 0.0 + auVar40._16_4_ + auVar47._16_4_ * 0.0;
          auVar188._20_4_ = auVar45._20_4_ * 0.0 + auVar40._20_4_ + auVar47._20_4_ * 0.0;
          auVar188._24_4_ = auVar45._24_4_ * 0.0 + auVar40._24_4_ + auVar47._24_4_ * 0.0;
          auVar188._28_4_ = auVar45._28_4_ + auVar40._28_4_ + auVar47._28_4_;
          auVar38 = vcmpps_avx(auVar188,ZEXT832(0) << 0x20,2);
          auVar164 = vblendvps_avx(auVar164,_local_500,auVar38);
          auVar133._4_4_ = fStack_63c;
          auVar133._0_4_ = local_640;
          auVar133._8_4_ = fStack_638;
          auVar133._12_4_ = fStack_634;
          auVar133._16_4_ = fStack_630;
          auVar133._20_4_ = fStack_62c;
          auVar133._24_4_ = fStack_628;
          auVar133._28_4_ = fStack_624;
          auVar40 = vblendvps_avx(auVar41,auVar133,auVar38);
          auVar41 = vblendvps_avx(auVar42,auVar393,auVar38);
          auVar42 = vblendvps_avx(auVar44,auVar373,auVar38);
          auVar302 = vblendvps_avx(auVar158,auVar257,auVar38);
          auVar43 = vblendvps_avx(auVar159,auVar326,auVar38);
          auVar44 = vblendvps_avx(auVar373,auVar44,auVar38);
          auVar45 = vblendvps_avx(auVar257,auVar158,auVar38);
          auVar47 = vblendvps_avx(auVar326,auVar159,auVar38);
          local_6e0 = vandps_avx(auVar39,_local_420);
          auVar39 = vsubps_avx(auVar44,auVar164);
          auVar44 = vsubps_avx(auVar45,auVar40);
          auVar47 = vsubps_avx(auVar47,auVar41);
          auVar182 = vsubps_avx(auVar40,auVar302);
          fVar282 = auVar44._0_4_;
          fVar259 = auVar41._0_4_;
          fVar197 = auVar44._4_4_;
          fVar178 = auVar41._4_4_;
          auVar109._4_4_ = fVar178 * fVar197;
          auVar109._0_4_ = fVar259 * fVar282;
          fVar290 = auVar44._8_4_;
          fVar193 = auVar41._8_4_;
          auVar109._8_4_ = fVar193 * fVar290;
          fVar154 = auVar44._12_4_;
          fVar194 = auVar41._12_4_;
          auVar109._12_4_ = fVar194 * fVar154;
          fVar221 = auVar44._16_4_;
          fVar195 = auVar41._16_4_;
          auVar109._16_4_ = fVar195 * fVar221;
          fVar268 = auVar44._20_4_;
          fVar196 = auVar41._20_4_;
          auVar109._20_4_ = fVar196 * fVar268;
          fVar218 = auVar44._24_4_;
          fVar198 = auVar41._24_4_;
          auVar109._24_4_ = fVar198 * fVar218;
          auVar109._28_4_ = auVar45._28_4_;
          fVar235 = auVar40._0_4_;
          fVar199 = auVar47._0_4_;
          fVar349 = auVar40._4_4_;
          fVar295 = auVar47._4_4_;
          auVar110._4_4_ = fVar295 * fVar349;
          auVar110._0_4_ = fVar199 * fVar235;
          fVar291 = auVar40._8_4_;
          fVar327 = auVar47._8_4_;
          auVar110._8_4_ = fVar327 * fVar291;
          fVar172 = auVar40._12_4_;
          fVar328 = auVar47._12_4_;
          auVar110._12_4_ = fVar328 * fVar172;
          fVar236 = auVar40._16_4_;
          fVar329 = auVar47._16_4_;
          auVar110._16_4_ = fVar329 * fVar236;
          fVar275 = auVar40._20_4_;
          fVar330 = auVar47._20_4_;
          auVar110._20_4_ = fVar330 * fVar275;
          fVar266 = auVar40._24_4_;
          fVar331 = auVar47._24_4_;
          uVar11 = auVar158._28_4_;
          auVar110._24_4_ = fVar331 * fVar266;
          auVar110._28_4_ = uVar11;
          auVar45 = vsubps_avx(auVar110,auVar109);
          fVar219 = auVar164._0_4_;
          fVar348 = auVar164._4_4_;
          auVar111._4_4_ = fVar295 * fVar348;
          auVar111._0_4_ = fVar199 * fVar219;
          fVar292 = auVar164._8_4_;
          auVar111._8_4_ = fVar327 * fVar292;
          fVar173 = auVar164._12_4_;
          auVar111._12_4_ = fVar328 * fVar173;
          fVar237 = auVar164._16_4_;
          auVar111._16_4_ = fVar329 * fVar237;
          fVar277 = auVar164._20_4_;
          auVar111._20_4_ = fVar330 * fVar277;
          fVar265 = auVar164._24_4_;
          auVar111._24_4_ = fVar331 * fVar265;
          auVar111._28_4_ = uVar11;
          fVar247 = auVar39._0_4_;
          fVar350 = auVar39._4_4_;
          auVar112._4_4_ = fVar178 * fVar350;
          auVar112._0_4_ = fVar259 * fVar247;
          fVar293 = auVar39._8_4_;
          auVar112._8_4_ = fVar193 * fVar293;
          fVar201 = auVar39._12_4_;
          auVar112._12_4_ = fVar194 * fVar201;
          fVar239 = auVar39._16_4_;
          auVar112._16_4_ = fVar195 * fVar239;
          fVar155 = auVar39._20_4_;
          auVar112._20_4_ = fVar196 * fVar155;
          fVar294 = auVar39._24_4_;
          auVar112._24_4_ = fVar198 * fVar294;
          auVar112._28_4_ = auVar373._28_4_;
          auVar158 = vsubps_avx(auVar112,auVar111);
          auVar113._4_4_ = fVar349 * fVar350;
          auVar113._0_4_ = fVar235 * fVar247;
          auVar113._8_4_ = fVar291 * fVar293;
          auVar113._12_4_ = fVar172 * fVar201;
          auVar113._16_4_ = fVar236 * fVar239;
          auVar113._20_4_ = fVar275 * fVar155;
          auVar113._24_4_ = fVar266 * fVar294;
          auVar113._28_4_ = uVar11;
          auVar114._4_4_ = fVar348 * fVar197;
          auVar114._0_4_ = fVar219 * fVar282;
          auVar114._8_4_ = fVar292 * fVar290;
          auVar114._12_4_ = fVar173 * fVar154;
          auVar114._16_4_ = fVar237 * fVar221;
          auVar114._20_4_ = fVar277 * fVar268;
          auVar114._24_4_ = fVar265 * fVar218;
          auVar114._28_4_ = auVar159._28_4_;
          auVar159 = vsubps_avx(auVar114,auVar113);
          auVar41 = vsubps_avx(auVar41,auVar43);
          fVar260 = auVar159._28_4_ + auVar158._28_4_;
          local_5a0._0_4_ = auVar159._0_4_ + auVar158._0_4_ * 0.0 + auVar45._0_4_ * 0.0;
          local_5a0._4_4_ = auVar159._4_4_ + auVar158._4_4_ * 0.0 + auVar45._4_4_ * 0.0;
          local_5a0._8_4_ = auVar159._8_4_ + auVar158._8_4_ * 0.0 + auVar45._8_4_ * 0.0;
          local_5a0._12_4_ = auVar159._12_4_ + auVar158._12_4_ * 0.0 + auVar45._12_4_ * 0.0;
          local_5a0._16_4_ = auVar159._16_4_ + auVar158._16_4_ * 0.0 + auVar45._16_4_ * 0.0;
          local_5a0._20_4_ = auVar159._20_4_ + auVar158._20_4_ * 0.0 + auVar45._20_4_ * 0.0;
          local_5a0._24_4_ = auVar159._24_4_ + auVar158._24_4_ * 0.0 + auVar45._24_4_ * 0.0;
          local_5a0._28_4_ = fVar260 + auVar45._28_4_;
          fVar258 = auVar182._0_4_;
          fVar200 = auVar182._4_4_;
          auVar115._4_4_ = auVar43._4_4_ * fVar200;
          auVar115._0_4_ = auVar43._0_4_ * fVar258;
          fVar315 = auVar182._8_4_;
          auVar115._8_4_ = auVar43._8_4_ * fVar315;
          fVar332 = auVar182._12_4_;
          auVar115._12_4_ = auVar43._12_4_ * fVar332;
          fVar241 = auVar182._16_4_;
          auVar115._16_4_ = auVar43._16_4_ * fVar241;
          fVar202 = auVar182._20_4_;
          auVar115._20_4_ = auVar43._20_4_ * fVar202;
          fVar174 = auVar182._24_4_;
          auVar115._24_4_ = auVar43._24_4_ * fVar174;
          auVar115._28_4_ = fVar260;
          fVar260 = auVar41._0_4_;
          fVar352 = auVar41._4_4_;
          auVar116._4_4_ = auVar302._4_4_ * fVar352;
          auVar116._0_4_ = auVar302._0_4_ * fVar260;
          fVar246 = auVar41._8_4_;
          auVar116._8_4_ = auVar302._8_4_ * fVar246;
          fVar175 = auVar41._12_4_;
          auVar116._12_4_ = auVar302._12_4_ * fVar175;
          fVar243 = auVar41._16_4_;
          auVar116._16_4_ = auVar302._16_4_ * fVar243;
          fVar216 = auVar41._20_4_;
          auVar116._20_4_ = auVar302._20_4_ * fVar216;
          fVar248 = auVar41._24_4_;
          auVar116._24_4_ = auVar302._24_4_ * fVar248;
          auVar116._28_4_ = auVar159._28_4_;
          auVar158 = vsubps_avx(auVar116,auVar115);
          auVar164 = vsubps_avx(auVar164,auVar42);
          fVar261 = auVar164._0_4_;
          fVar351 = auVar164._4_4_;
          auVar117._4_4_ = auVar43._4_4_ * fVar351;
          auVar117._0_4_ = auVar43._0_4_ * fVar261;
          fVar316 = auVar164._8_4_;
          auVar117._8_4_ = auVar43._8_4_ * fVar316;
          fVar176 = auVar164._12_4_;
          auVar117._12_4_ = auVar43._12_4_ * fVar176;
          fVar245 = auVar164._16_4_;
          auVar117._16_4_ = auVar43._16_4_ * fVar245;
          fVar217 = auVar164._20_4_;
          auVar117._20_4_ = auVar43._20_4_ * fVar217;
          fVar177 = auVar164._24_4_;
          auVar117._24_4_ = auVar43._24_4_ * fVar177;
          auVar117._28_4_ = auVar43._28_4_;
          auVar118._4_4_ = fVar352 * auVar42._4_4_;
          auVar118._0_4_ = fVar260 * auVar42._0_4_;
          auVar118._8_4_ = fVar246 * auVar42._8_4_;
          auVar118._12_4_ = fVar175 * auVar42._12_4_;
          auVar118._16_4_ = fVar243 * auVar42._16_4_;
          auVar118._20_4_ = fVar216 * auVar42._20_4_;
          auVar118._24_4_ = fVar248 * auVar42._24_4_;
          auVar118._28_4_ = auVar45._28_4_;
          auVar164 = vsubps_avx(auVar117,auVar118);
          auVar119._4_4_ = auVar302._4_4_ * fVar351;
          auVar119._0_4_ = auVar302._0_4_ * fVar261;
          auVar119._8_4_ = auVar302._8_4_ * fVar316;
          auVar119._12_4_ = auVar302._12_4_ * fVar176;
          auVar119._16_4_ = auVar302._16_4_ * fVar245;
          auVar119._20_4_ = auVar302._20_4_ * fVar217;
          auVar119._24_4_ = auVar302._24_4_ * fVar177;
          auVar119._28_4_ = auVar302._28_4_;
          auVar120._4_4_ = fVar200 * auVar42._4_4_;
          auVar120._0_4_ = fVar258 * auVar42._0_4_;
          auVar120._8_4_ = fVar315 * auVar42._8_4_;
          auVar120._12_4_ = fVar332 * auVar42._12_4_;
          auVar120._16_4_ = fVar241 * auVar42._16_4_;
          auVar120._20_4_ = fVar202 * auVar42._20_4_;
          auVar120._24_4_ = fVar174 * auVar42._24_4_;
          auVar120._28_4_ = auVar42._28_4_;
          auVar42 = vsubps_avx(auVar120,auVar119);
          auVar168._0_4_ = auVar158._0_4_ * 0.0 + auVar42._0_4_ + auVar164._0_4_ * 0.0;
          auVar168._4_4_ = auVar158._4_4_ * 0.0 + auVar42._4_4_ + auVar164._4_4_ * 0.0;
          auVar168._8_4_ = auVar158._8_4_ * 0.0 + auVar42._8_4_ + auVar164._8_4_ * 0.0;
          auVar168._12_4_ = auVar158._12_4_ * 0.0 + auVar42._12_4_ + auVar164._12_4_ * 0.0;
          auVar168._16_4_ = auVar158._16_4_ * 0.0 + auVar42._16_4_ + auVar164._16_4_ * 0.0;
          auVar168._20_4_ = auVar158._20_4_ * 0.0 + auVar42._20_4_ + auVar164._20_4_ * 0.0;
          auVar168._24_4_ = auVar158._24_4_ * 0.0 + auVar42._24_4_ + auVar164._24_4_ * 0.0;
          auVar168._28_4_ = auVar164._28_4_ + auVar42._28_4_ + auVar164._28_4_;
          auVar171 = ZEXT3264(auVar168);
          auVar164 = vmaxps_avx(local_5a0,auVar168);
          auVar164 = vcmpps_avx(auVar164,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar42 = local_6e0 & auVar164;
          if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar42 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar42 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar42 >> 0x7f,0) == '\0') &&
                (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar42 >> 0xbf,0) == '\0') &&
              (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar42[0x1f]) {
LAB_0114ed57:
            auVar234 = ZEXT3264(CONCAT824(uStack_468,
                                          CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
          }
          else {
            auVar42 = vandps_avx(auVar164,local_6e0);
            auVar121._4_4_ = fVar352 * fVar197;
            auVar121._0_4_ = fVar260 * fVar282;
            auVar121._8_4_ = fVar246 * fVar290;
            auVar121._12_4_ = fVar175 * fVar154;
            auVar121._16_4_ = fVar243 * fVar221;
            auVar121._20_4_ = fVar216 * fVar268;
            auVar121._24_4_ = fVar248 * fVar218;
            auVar121._28_4_ = local_6e0._28_4_;
            auVar122._4_4_ = fVar200 * fVar295;
            auVar122._0_4_ = fVar258 * fVar199;
            auVar122._8_4_ = fVar315 * fVar327;
            auVar122._12_4_ = fVar332 * fVar328;
            auVar122._16_4_ = fVar241 * fVar329;
            auVar122._20_4_ = fVar202 * fVar330;
            auVar122._24_4_ = fVar174 * fVar331;
            auVar122._28_4_ = auVar164._28_4_;
            auVar302 = vsubps_avx(auVar122,auVar121);
            auVar123._4_4_ = fVar351 * fVar295;
            auVar123._0_4_ = fVar261 * fVar199;
            auVar123._8_4_ = fVar316 * fVar327;
            auVar123._12_4_ = fVar176 * fVar328;
            auVar123._16_4_ = fVar245 * fVar329;
            auVar123._20_4_ = fVar217 * fVar330;
            auVar123._24_4_ = fVar177 * fVar331;
            auVar123._28_4_ = auVar47._28_4_;
            auVar124._4_4_ = fVar352 * fVar350;
            auVar124._0_4_ = fVar260 * fVar247;
            auVar124._8_4_ = fVar246 * fVar293;
            auVar124._12_4_ = fVar175 * fVar201;
            auVar124._16_4_ = fVar243 * fVar239;
            auVar124._20_4_ = fVar216 * fVar155;
            auVar124._24_4_ = fVar248 * fVar294;
            auVar124._28_4_ = auVar41._28_4_;
            auVar43 = vsubps_avx(auVar124,auVar123);
            auVar125._4_4_ = fVar200 * fVar350;
            auVar125._0_4_ = fVar258 * fVar247;
            auVar125._8_4_ = fVar315 * fVar293;
            auVar125._12_4_ = fVar332 * fVar201;
            auVar125._16_4_ = fVar241 * fVar239;
            auVar125._20_4_ = fVar202 * fVar155;
            auVar125._24_4_ = fVar174 * fVar294;
            auVar125._28_4_ = auVar39._28_4_;
            auVar126._4_4_ = fVar351 * fVar197;
            auVar126._0_4_ = fVar261 * fVar282;
            auVar126._8_4_ = fVar316 * fVar290;
            auVar126._12_4_ = fVar176 * fVar154;
            auVar126._16_4_ = fVar245 * fVar221;
            auVar126._20_4_ = fVar217 * fVar268;
            auVar126._24_4_ = fVar177 * fVar218;
            auVar126._28_4_ = auVar44._28_4_;
            auVar44 = vsubps_avx(auVar126,auVar125);
            auVar314._0_4_ = auVar302._0_4_ * 0.0 + auVar44._0_4_ + auVar43._0_4_ * 0.0;
            auVar314._4_4_ = auVar302._4_4_ * 0.0 + auVar44._4_4_ + auVar43._4_4_ * 0.0;
            auVar314._8_4_ = auVar302._8_4_ * 0.0 + auVar44._8_4_ + auVar43._8_4_ * 0.0;
            auVar314._12_4_ = auVar302._12_4_ * 0.0 + auVar44._12_4_ + auVar43._12_4_ * 0.0;
            auVar314._16_4_ = auVar302._16_4_ * 0.0 + auVar44._16_4_ + auVar43._16_4_ * 0.0;
            auVar314._20_4_ = auVar302._20_4_ * 0.0 + auVar44._20_4_ + auVar43._20_4_ * 0.0;
            auVar314._24_4_ = auVar302._24_4_ * 0.0 + auVar44._24_4_ + auVar43._24_4_ * 0.0;
            auVar314._28_4_ = auVar182._28_4_ + auVar44._28_4_ + auVar39._28_4_;
            auVar164 = vrcpps_avx(auVar314);
            fVar247 = auVar164._0_4_;
            fVar258 = auVar164._4_4_;
            auVar127._4_4_ = auVar314._4_4_ * fVar258;
            auVar127._0_4_ = auVar314._0_4_ * fVar247;
            fVar260 = auVar164._8_4_;
            auVar127._8_4_ = auVar314._8_4_ * fVar260;
            fVar261 = auVar164._12_4_;
            auVar127._12_4_ = auVar314._12_4_ * fVar261;
            fVar197 = auVar164._16_4_;
            auVar127._16_4_ = auVar314._16_4_ * fVar197;
            fVar350 = auVar164._20_4_;
            auVar127._20_4_ = auVar314._20_4_ * fVar350;
            fVar200 = auVar164._24_4_;
            auVar127._24_4_ = auVar314._24_4_ * fVar200;
            auVar127._28_4_ = auVar41._28_4_;
            auVar364._8_4_ = 0x3f800000;
            auVar364._0_8_ = 0x3f8000003f800000;
            auVar364._12_4_ = 0x3f800000;
            auVar364._16_4_ = 0x3f800000;
            auVar364._20_4_ = 0x3f800000;
            auVar364._24_4_ = 0x3f800000;
            auVar364._28_4_ = 0x3f800000;
            auVar164 = vsubps_avx(auVar364,auVar127);
            fVar247 = auVar164._0_4_ * fVar247 + fVar247;
            fVar258 = auVar164._4_4_ * fVar258 + fVar258;
            fVar260 = auVar164._8_4_ * fVar260 + fVar260;
            fVar261 = auVar164._12_4_ * fVar261 + fVar261;
            fVar197 = auVar164._16_4_ * fVar197 + fVar197;
            fVar350 = auVar164._20_4_ * fVar350 + fVar350;
            fVar200 = auVar164._24_4_ * fVar200 + fVar200;
            auVar128._4_4_ =
                 (fVar348 * auVar302._4_4_ + auVar43._4_4_ * fVar349 + fVar178 * auVar44._4_4_) *
                 fVar258;
            auVar128._0_4_ =
                 (fVar219 * auVar302._0_4_ + auVar43._0_4_ * fVar235 + fVar259 * auVar44._0_4_) *
                 fVar247;
            auVar128._8_4_ =
                 (fVar292 * auVar302._8_4_ + auVar43._8_4_ * fVar291 + fVar193 * auVar44._8_4_) *
                 fVar260;
            auVar128._12_4_ =
                 (fVar173 * auVar302._12_4_ + auVar43._12_4_ * fVar172 + fVar194 * auVar44._12_4_) *
                 fVar261;
            auVar128._16_4_ =
                 (fVar237 * auVar302._16_4_ + auVar43._16_4_ * fVar236 + fVar195 * auVar44._16_4_) *
                 fVar197;
            auVar128._20_4_ =
                 (fVar277 * auVar302._20_4_ + auVar43._20_4_ * fVar275 + fVar196 * auVar44._20_4_) *
                 fVar350;
            auVar128._24_4_ =
                 (fVar265 * auVar302._24_4_ + auVar43._24_4_ * fVar266 + fVar198 * auVar44._24_4_) *
                 fVar200;
            auVar128._28_4_ = auVar40._28_4_ + auVar44._28_4_;
            fVar282 = (ray->super_RayK<1>).tfar;
            auVar233._4_4_ = fVar282;
            auVar233._0_4_ = fVar282;
            auVar233._8_4_ = fVar282;
            auVar233._12_4_ = fVar282;
            auVar233._16_4_ = fVar282;
            auVar233._20_4_ = fVar282;
            auVar233._24_4_ = fVar282;
            auVar233._28_4_ = fVar282;
            auVar39 = vcmpps_avx(local_100,auVar128,2);
            auVar164 = vcmpps_avx(auVar128,auVar233,2);
            auVar164 = vandps_avx(auVar39,auVar164);
            auVar40 = auVar42 & auVar164;
            if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar40 >> 0x7f,0) == '\0') &&
                  (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar40 >> 0xbf,0) == '\0') &&
                (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar40[0x1f]) goto LAB_0114ed57;
            auVar164 = vandps_avx(auVar42,auVar164);
            auVar40 = vcmpps_avx(auVar314,ZEXT1232(ZEXT412(0)) << 0x20,4);
            auVar41 = auVar164 & auVar40;
            auVar234 = ZEXT3264(CONCAT824(uStack_468,
                                          CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
            if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar41 >> 0x7f,0) != '\0') ||
                  (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar41 >> 0xbf,0) != '\0') ||
                (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar41[0x1f] < '\0') {
              auVar164 = vandps_avx(auVar40,auVar164);
              auVar234 = ZEXT3264(auVar164);
              auVar129._4_4_ = fVar258 * local_5a0._4_4_;
              auVar129._0_4_ = fVar247 * local_5a0._0_4_;
              auVar129._8_4_ = fVar260 * local_5a0._8_4_;
              auVar129._12_4_ = fVar261 * local_5a0._12_4_;
              auVar129._16_4_ = fVar197 * local_5a0._16_4_;
              auVar129._20_4_ = fVar350 * local_5a0._20_4_;
              auVar129._24_4_ = fVar200 * local_5a0._24_4_;
              auVar129._28_4_ = auVar39._28_4_;
              auVar130._4_4_ = auVar168._4_4_ * fVar258;
              auVar130._0_4_ = auVar168._0_4_ * fVar247;
              auVar130._8_4_ = auVar168._8_4_ * fVar260;
              auVar130._12_4_ = auVar168._12_4_ * fVar261;
              auVar130._16_4_ = auVar168._16_4_ * fVar197;
              auVar130._20_4_ = auVar168._20_4_ * fVar350;
              auVar130._24_4_ = auVar168._24_4_ * fVar200;
              auVar130._28_4_ = auVar168._28_4_;
              auVar289._8_4_ = 0x3f800000;
              auVar289._0_8_ = 0x3f8000003f800000;
              auVar289._12_4_ = 0x3f800000;
              auVar289._16_4_ = 0x3f800000;
              auVar289._20_4_ = 0x3f800000;
              auVar289._24_4_ = 0x3f800000;
              auVar289._28_4_ = 0x3f800000;
              auVar164 = vsubps_avx(auVar289,auVar129);
              _local_e0 = vblendvps_avx(auVar164,auVar129,auVar38);
              auVar164 = vsubps_avx(auVar289,auVar130);
              _local_180 = vblendvps_avx(auVar164,auVar130,auVar38);
              auVar171 = ZEXT3264(_local_180);
              local_3e0 = auVar128;
            }
          }
          auVar164 = auVar234._0_32_;
          auVar192 = ZEXT3264(_local_7c0);
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0x7f,0) != '\0') ||
                (auVar234 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
               SUB321(auVar164 >> 0xbf,0) != '\0') ||
              (auVar234 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
              auVar234[0x1f] < '\0') {
            auVar39 = vsubps_avx(auVar303,_local_7c0);
            local_7c0._0_4_ = (float)local_7c0._0_4_ + auVar39._0_4_ * (float)local_e0._0_4_;
            local_7c0._4_4_ = (float)local_7c0._4_4_ + auVar39._4_4_ * (float)local_e0._4_4_;
            fStack_7b8 = fStack_7b8 + auVar39._8_4_ * fStack_d8;
            fStack_7b4 = fStack_7b4 + auVar39._12_4_ * fStack_d4;
            fStack_7b0 = fStack_7b0 + auVar39._16_4_ * fStack_d0;
            fStack_7ac = fStack_7ac + auVar39._20_4_ * fStack_cc;
            fStack_7a8 = fStack_7a8 + auVar39._24_4_ * fStack_c8;
            fStack_7a4 = fStack_7a4 + auVar39._28_4_;
            fVar282 = local_788->depth_scale;
            auVar192 = ZEXT3264(CONCAT428(fVar282,CONCAT424(fVar282,CONCAT420(fVar282,CONCAT416(
                                                  fVar282,CONCAT412(fVar282,CONCAT48(fVar282,
                                                  CONCAT44(fVar282,fVar282))))))));
            auVar131._4_4_ = ((float)local_7c0._4_4_ + (float)local_7c0._4_4_) * fVar282;
            auVar131._0_4_ = ((float)local_7c0._0_4_ + (float)local_7c0._0_4_) * fVar282;
            auVar131._8_4_ = (fStack_7b8 + fStack_7b8) * fVar282;
            auVar131._12_4_ = (fStack_7b4 + fStack_7b4) * fVar282;
            auVar131._16_4_ = (fStack_7b0 + fStack_7b0) * fVar282;
            auVar131._20_4_ = (fStack_7ac + fStack_7ac) * fVar282;
            auVar131._24_4_ = (fStack_7a8 + fStack_7a8) * fVar282;
            auVar131._28_4_ = fStack_7a4 + fStack_7a4;
            auVar39 = vcmpps_avx(local_3e0,auVar131,6);
            auVar171 = ZEXT3264(auVar39);
            auVar40 = auVar164 & auVar39;
            fVar202 = (float)local_700._0_4_;
            fVar216 = (float)local_700._4_4_;
            fVar217 = fStack_6f8;
            fVar218 = fStack_6f4;
            fVar247 = fStack_6f0;
            fVar258 = fStack_6ec;
            fVar260 = fStack_6e8;
            fVar261 = fStack_6e4;
            if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar40 >> 0x7f,0) == '\0') &&
                  (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar40 >> 0xbf,0) == '\0') &&
                (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar40[0x1f]) goto LAB_0114eabc;
            local_2a0._0_4_ = (float)local_180._0_4_ + (float)local_180._0_4_ + -1.0;
            local_2a0._4_4_ = (float)local_180._4_4_ + (float)local_180._4_4_ + -1.0;
            fStack_298 = fStack_178 + fStack_178 + -1.0;
            fStack_294 = fStack_174 + fStack_174 + -1.0;
            fStack_290 = fStack_170 + fStack_170 + -1.0;
            fStack_28c = fStack_16c + fStack_16c + -1.0;
            fStack_288 = fStack_168 + fStack_168 + -1.0;
            fStack_284 = fStack_164 + fStack_164 + -1.0;
            local_2c0 = _local_e0;
            local_280 = local_3e0;
            local_25c = uVar34;
            local_250 = local_7a0;
            uStack_248 = uStack_798;
            local_240 = local_730;
            uStack_238 = uStack_728;
            local_230 = local_740;
            uStack_228 = uStack_738;
            auVar192 = ZEXT1664(_local_750);
            local_220 = _local_750;
            pGVar150 = (context->scene->geometries).items[local_7d0].ptr;
            _local_180 = _local_2a0;
            if ((pGVar150->mask & (ray->super_RayK<1>).mask) != 0) {
              auVar164 = vandps_avx(auVar39,auVar164);
              local_4c0 = auVar164;
              auVar207._0_4_ = (float)(int)local_260;
              auVar207._4_8_ = SUB128(ZEXT812(0),4);
              auVar207._12_4_ = 0;
              auVar271 = vshufps_avx(auVar207,auVar207,0);
              local_1e0[0] = (auVar271._0_4_ + (float)local_e0._0_4_ + 0.0) * (float)local_120._0_4_
              ;
              local_1e0[1] = (auVar271._4_4_ + (float)local_e0._4_4_ + 1.0) * (float)local_120._4_4_
              ;
              local_1e0[2] = (auVar271._8_4_ + fStack_d8 + 2.0) * fStack_118;
              local_1e0[3] = (auVar271._12_4_ + fStack_d4 + 3.0) * fStack_114;
              fStack_1d0 = (auVar271._0_4_ + fStack_d0 + 4.0) * fStack_110;
              fStack_1cc = (auVar271._4_4_ + fStack_cc + 5.0) * fStack_10c;
              fStack_1c8 = (auVar271._8_4_ + fStack_c8 + 6.0) * fStack_108;
              fStack_1c4 = auVar271._12_4_ + fStack_c4 + 7.0;
              local_1c0 = _local_2a0;
              local_1a0 = local_3e0;
              auVar189._8_4_ = 0x7f800000;
              auVar189._0_8_ = 0x7f8000007f800000;
              auVar189._12_4_ = 0x7f800000;
              auVar189._16_4_ = 0x7f800000;
              auVar189._20_4_ = 0x7f800000;
              auVar189._24_4_ = 0x7f800000;
              auVar189._28_4_ = 0x7f800000;
              auVar39 = vblendvps_avx(auVar189,local_3e0,auVar164);
              auVar40 = vshufps_avx(auVar39,auVar39,0xb1);
              auVar40 = vminps_avx(auVar39,auVar40);
              auVar41 = vshufpd_avx(auVar40,auVar40,5);
              auVar40 = vminps_avx(auVar40,auVar41);
              auVar41 = vperm2f128_avx(auVar40,auVar40,1);
              auVar40 = vminps_avx(auVar40,auVar41);
              auVar39 = vcmpps_avx(auVar39,auVar40,0);
              auVar40 = auVar164 & auVar39;
              if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar40 >> 0x7f,0) != '\0') ||
                    (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar40 >> 0xbf,0) != '\0') ||
                  (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar40[0x1f] < '\0') {
                auVar164 = vandps_avx(auVar39,auVar164);
              }
              uVar144 = vmovmskps_avx(auVar164);
              uVar146 = 0;
              if (uVar144 != 0) {
                for (; (uVar144 >> uVar146 & 1) == 0; uVar146 = uVar146 + 1) {
                }
              }
              uVar145 = (ulong)uVar146;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar150->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                _local_7c0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                local_6e0._0_8_ = pGVar150;
                do {
                  local_684 = local_1e0[uVar145];
                  local_680 = *(undefined4 *)(local_1c0 + uVar145 * 4);
                  (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar145 * 4);
                  local_780.context = context->user;
                  fVar282 = 1.0 - local_684;
                  fVar220 = local_684 * fVar282 * 4.0;
                  auVar271 = ZEXT416((uint)(local_684 * local_684 * 0.5));
                  auVar271 = vshufps_avx(auVar271,auVar271,0);
                  auVar208 = ZEXT416((uint)((fVar282 * fVar282 + fVar220) * 0.5));
                  auVar208 = vshufps_avx(auVar208,auVar208,0);
                  auVar253 = ZEXT416((uint)((-local_684 * local_684 - fVar220) * 0.5));
                  auVar253 = vshufps_avx(auVar253,auVar253,0);
                  auVar223 = ZEXT416((uint)(fVar282 * -fVar282 * 0.5));
                  auVar223 = vshufps_avx(auVar223,auVar223,0);
                  auVar224._0_4_ = auVar223._0_4_ * (float)local_7a0._0_4_;
                  auVar224._4_4_ = auVar223._4_4_ * (float)local_7a0._4_4_;
                  auVar224._8_4_ = auVar223._8_4_ * (float)uStack_798;
                  auVar224._12_4_ = auVar223._12_4_ * uStack_798._4_4_;
                  auVar234 = ZEXT1664(auVar224);
                  auVar210._0_4_ =
                       auVar224._0_4_ +
                       auVar253._0_4_ * (float)local_730._0_4_ +
                       auVar271._0_4_ * (float)local_750._0_4_ +
                       auVar208._0_4_ * (float)local_740._0_4_;
                  auVar210._4_4_ =
                       auVar224._4_4_ +
                       auVar253._4_4_ * (float)local_730._4_4_ +
                       auVar271._4_4_ * (float)local_750._4_4_ +
                       auVar208._4_4_ * (float)local_740._4_4_;
                  auVar210._8_4_ =
                       auVar224._8_4_ +
                       auVar253._8_4_ * (float)uStack_728 +
                       auVar271._8_4_ * (float)uStack_748 + auVar208._8_4_ * (float)uStack_738;
                  auVar210._12_4_ =
                       auVar224._12_4_ +
                       auVar253._12_4_ * uStack_728._4_4_ +
                       auVar271._12_4_ * uStack_748._4_4_ + auVar208._12_4_ * uStack_738._4_4_;
                  local_690 = vmovlps_avx(auVar210);
                  local_688 = vextractps_avx(auVar210,2);
                  local_67c = (int)local_7c8;
                  local_678 = (int)local_7d0;
                  local_674 = (local_780.context)->instID[0];
                  local_670 = (local_780.context)->instPrimID[0];
                  local_7dc = -1;
                  local_780.valid = &local_7dc;
                  local_780.geometryUserPtr = pGVar150->userPtr;
                  local_780.ray = (RTCRayN *)ray;
                  local_780.hit = (RTCHitN *)&local_690;
                  local_780.N = 1;
                  if (pGVar150->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0114ef27:
                    p_Var36 = context->args->filter;
                    if ((p_Var36 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar150->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar234 = ZEXT1664(auVar234._0_16_);
                      (*p_Var36)(&local_780);
                      ray = local_7d8;
                      pGVar150 = (Geometry *)local_6e0._0_8_;
                      if (*local_780.valid == 0) goto LAB_0114efc6;
                    }
                    (((Vec3f *)((long)local_780.ray + 0x30))->field_0).components[0] =
                         *(float *)local_780.hit;
                    (((Vec3f *)((long)local_780.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_780.hit + 4);
                    (((Vec3f *)((long)local_780.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_780.hit + 8);
                    *(float *)((long)local_780.ray + 0x3c) = *(float *)(local_780.hit + 0xc);
                    *(float *)((long)local_780.ray + 0x40) = *(float *)(local_780.hit + 0x10);
                    *(float *)((long)local_780.ray + 0x44) = *(float *)(local_780.hit + 0x14);
                    *(float *)((long)local_780.ray + 0x48) = *(float *)(local_780.hit + 0x18);
                    *(float *)((long)local_780.ray + 0x4c) = *(float *)(local_780.hit + 0x1c);
                    *(float *)((long)local_780.ray + 0x50) = *(float *)(local_780.hit + 0x20);
                  }
                  else {
                    auVar234 = ZEXT1664(auVar224);
                    (*pGVar150->intersectionFilterN)(&local_780);
                    ray = local_7d8;
                    pGVar150 = (Geometry *)local_6e0._0_8_;
                    if (*local_780.valid != 0) goto LAB_0114ef27;
LAB_0114efc6:
                    (local_7d8->super_RayK<1>).tfar = (float)local_7c0._0_4_;
                    ray = local_7d8;
                    pGVar150 = (Geometry *)local_6e0._0_8_;
                  }
                  *(undefined4 *)(local_4c0 + uVar145 * 4) = 0;
                  auVar40 = local_4c0;
                  fVar220 = (ray->super_RayK<1>).tfar;
                  auVar169._4_4_ = fVar220;
                  auVar169._0_4_ = fVar220;
                  auVar169._8_4_ = fVar220;
                  auVar169._12_4_ = fVar220;
                  auVar169._16_4_ = fVar220;
                  auVar169._20_4_ = fVar220;
                  auVar169._24_4_ = fVar220;
                  auVar169._28_4_ = fVar220;
                  auVar39 = vcmpps_avx(local_3e0,auVar169,2);
                  auVar192 = ZEXT3264(auVar39);
                  auVar164 = vandps_avx(auVar39,local_4c0);
                  auVar171 = ZEXT3264(auVar164);
                  local_4c0 = auVar164;
                  auVar40 = auVar40 & auVar39;
                  if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar40 >> 0x7f,0) == '\0') &&
                        (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar40 >> 0xbf,0) == '\0') &&
                      (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar40[0x1f]) goto LAB_0114f061;
                  auVar190._8_4_ = 0x7f800000;
                  auVar190._0_8_ = 0x7f8000007f800000;
                  auVar190._12_4_ = 0x7f800000;
                  auVar190._16_4_ = 0x7f800000;
                  auVar190._20_4_ = 0x7f800000;
                  auVar190._24_4_ = 0x7f800000;
                  auVar190._28_4_ = 0x7f800000;
                  auVar39 = vblendvps_avx(auVar190,local_3e0,auVar164);
                  auVar40 = vshufps_avx(auVar39,auVar39,0xb1);
                  auVar40 = vminps_avx(auVar39,auVar40);
                  auVar41 = vshufpd_avx(auVar40,auVar40,5);
                  auVar40 = vminps_avx(auVar40,auVar41);
                  auVar41 = vperm2f128_avx(auVar40,auVar40,1);
                  auVar40 = vminps_avx(auVar40,auVar41);
                  auVar39 = vcmpps_avx(auVar39,auVar40,0);
                  auVar40 = auVar164 & auVar39;
                  if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar40 >> 0x7f,0) != '\0') ||
                        (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar40 >> 0xbf,0) != '\0') ||
                      (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar40[0x1f] < '\0') {
                    auVar164 = vandps_avx(auVar39,auVar164);
                  }
                  _local_7c0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                  uVar144 = vmovmskps_avx(auVar164);
                  uVar146 = 0;
                  if (uVar144 != 0) {
                    for (; (uVar144 >> uVar146 & 1) == 0; uVar146 = uVar146 + 1) {
                    }
                  }
                  uVar145 = (ulong)uVar146;
                } while( true );
              }
              fVar220 = local_1e0[uVar145];
              auVar171 = ZEXT464((uint)fVar220);
              fVar282 = *(float *)(local_1c0 + uVar145 * 4);
              auVar192 = ZEXT464((uint)fVar282);
              fVar366 = 1.0 - fVar220;
              fVar235 = fVar220 * fVar366 * 4.0;
              auVar271 = ZEXT416((uint)(fVar220 * fVar220 * 0.5));
              auVar271 = vshufps_avx(auVar271,auVar271,0);
              auVar208 = ZEXT416((uint)((fVar366 * fVar366 + fVar235) * 0.5));
              auVar208 = vshufps_avx(auVar208,auVar208,0);
              auVar253 = ZEXT416((uint)((-fVar220 * fVar220 - fVar235) * 0.5));
              auVar253 = vshufps_avx(auVar253,auVar253,0);
              auVar223 = ZEXT416((uint)(fVar366 * -fVar366 * 0.5));
              auVar223 = vshufps_avx(auVar223,auVar223,0);
              auVar209._0_4_ =
                   auVar223._0_4_ * (float)local_7a0._0_4_ +
                   auVar253._0_4_ * (float)local_730._0_4_ +
                   auVar271._0_4_ * (float)local_750._0_4_ + auVar208._0_4_ * (float)local_740._0_4_
              ;
              auVar209._4_4_ =
                   auVar223._4_4_ * (float)local_7a0._4_4_ +
                   auVar253._4_4_ * (float)local_730._4_4_ +
                   auVar271._4_4_ * (float)local_750._4_4_ + auVar208._4_4_ * (float)local_740._4_4_
              ;
              auVar209._8_4_ =
                   auVar223._8_4_ * (float)uStack_798 +
                   auVar253._8_4_ * (float)uStack_728 +
                   auVar271._8_4_ * (float)uStack_748 + auVar208._8_4_ * (float)uStack_738;
              auVar209._12_4_ =
                   auVar223._12_4_ * uStack_798._4_4_ +
                   auVar253._12_4_ * uStack_728._4_4_ +
                   auVar271._12_4_ * uStack_748._4_4_ + auVar208._12_4_ * uStack_738._4_4_;
              auVar234 = ZEXT464((uint)*(float *)(local_1a0 + uVar145 * 4));
              (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar145 * 4);
              uVar12 = vmovlps_avx(auVar209);
              *(undefined8 *)&(ray->Ng).field_0 = uVar12;
              fVar235 = (float)vextractps_avx(auVar209,2);
              (ray->Ng).field_0.field_0.z = fVar235;
              ray->u = fVar220;
              ray->v = fVar282;
              ray->primID = (uint)local_7c8;
              ray->geomID = (uint)local_7d0;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
            }
          }
          goto LAB_0114ea6c;
        }
        goto LAB_0114eabc;
      }
LAB_0114e0fe:
      fVar220 = (ray->super_RayK<1>).tfar;
      auVar165._4_4_ = fVar220;
      auVar165._0_4_ = fVar220;
      auVar165._8_4_ = fVar220;
      auVar165._12_4_ = fVar220;
      auVar165._16_4_ = fVar220;
      auVar165._20_4_ = fVar220;
      auVar165._24_4_ = fVar220;
      auVar165._28_4_ = fVar220;
      auVar164 = vcmpps_avx(local_80,auVar165,2);
      uVar146 = vmovmskps_avx(auVar164);
      uVar142 = uVar142 & uVar142 + 0xff & uVar146;
    } while (uVar142 != 0);
  }
  return;
LAB_0114f061:
LAB_0114ea6c:
  fVar220 = (float)local_5c0._0_4_;
  fVar366 = (float)local_5c0._4_4_;
  fVar238 = fStack_5b8;
  fVar242 = fStack_5b4;
  fVar262 = fStack_5b0;
  fVar263 = fStack_5ac;
  fVar264 = fStack_5a8;
  fVar267 = fStack_5a4;
  fVar274 = (float)local_600._0_4_;
  fVar276 = (float)local_600._4_4_;
  fVar278 = fStack_5f8;
  fVar279 = fStack_5f4;
  fVar280 = fStack_5f0;
  fVar281 = fStack_5ec;
  fVar367 = fStack_5e8;
  fVar368 = (float)local_720._0_4_;
  fVar374 = (float)local_720._4_4_;
  fVar376 = fStack_718;
  fVar378 = fStack_714;
  fVar304 = fStack_710;
  fVar305 = fStack_70c;
  fVar240 = fStack_708;
  fVar244 = fStack_704;
  fVar202 = (float)local_700._0_4_;
  fVar216 = (float)local_700._4_4_;
  fVar217 = fStack_6f8;
  fVar218 = fStack_6f4;
  fVar247 = fStack_6f0;
  fVar258 = fStack_6ec;
  fVar260 = fStack_6e8;
  fVar261 = fStack_6e4;
LAB_0114eabc:
  lVar153 = lVar153 + 8;
  fVar268 = (float)local_6c0._0_4_;
  fVar275 = (float)local_6c0._4_4_;
  fVar277 = fStack_6b8;
  fVar155 = fStack_6b4;
  fVar282 = fStack_6b0;
  fVar235 = fStack_6ac;
  fVar219 = fStack_6a8;
  if ((int)uVar34 <= (int)lVar153) goto LAB_0114e0fe;
  goto LAB_0114e1c7;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }